

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Primitive PVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  __int_type_conflict _Var36;
  RTCFilterFunctionN p_Var37;
  uint uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  bool bVar128;
  bool bVar129;
  bool bVar130;
  bool bVar131;
  bool bVar132;
  bool bVar133;
  bool bVar134;
  bool bVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [28];
  undefined1 auVar150 [28];
  undefined1 auVar151 [24];
  uint uVar152;
  uint uVar153;
  ulong uVar154;
  uint uVar155;
  ulong uVar156;
  long lVar157;
  long lVar158;
  long lVar159;
  Geometry *pGVar160;
  long lVar161;
  undefined1 auVar166 [16];
  float fVar162;
  undefined1 auVar167 [16];
  float fVar165;
  float fVar183;
  float fVar187;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar170 [32];
  float fVar184;
  float fVar185;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar186;
  undefined1 auVar176 [32];
  float fVar193;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  float fVar194;
  undefined8 extraout_XMM1_Qa;
  float fVar216;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar215;
  float fVar217;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar218;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 extraout_var [56];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar219;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  float fVar233;
  undefined1 auVar228 [32];
  float fVar235;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar234;
  undefined1 auVar231 [32];
  float fVar236;
  float fVar256;
  undefined1 auVar238 [16];
  float fVar237;
  float fVar254;
  undefined1 auVar240 [16];
  float fVar252;
  float fVar255;
  float fVar258;
  float fVar259;
  float fVar261;
  float fVar262;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar239 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar257;
  float fVar260;
  float fVar263;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float fVar264;
  float fVar276;
  float fVar279;
  float fVar281;
  undefined1 auVar267 [16];
  float fVar265;
  float fVar266;
  undefined1 auVar270 [16];
  undefined1 auVar289 [16];
  float fVar277;
  undefined1 auVar269 [16];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar286;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar287;
  float fVar297;
  float fVar298;
  undefined1 auVar288 [16];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar290 [32];
  float fVar299;
  float fVar305;
  undefined1 auVar291 [32];
  float fVar304;
  float fVar306;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar313;
  float fVar314;
  undefined1 auVar312 [32];
  undefined1 auVar316 [16];
  float fVar315;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar329 [16];
  float fVar328;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar341;
  float fVar352;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar353;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  float fVar354;
  float fVar356;
  float fVar365;
  float fVar368;
  float fVar370;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar355;
  float fVar366;
  float fVar369;
  float fVar371;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  undefined1 auVar364 [32];
  float fVar372;
  float fVar381;
  float fVar383;
  float fVar385;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar373;
  undefined1 auVar378 [32];
  float fVar382;
  float fVar384;
  float fVar386;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar387 [16];
  float in_register_0000151c;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar397;
  float fVar398;
  float fVar403;
  float fVar405;
  float fVar407;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float fVar404;
  float fVar406;
  float fVar408;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  float fVar409;
  float fVar410;
  float fVar414;
  float fVar416;
  float fVar417;
  float in_register_0000159c;
  undefined1 auVar412 [32];
  float fVar415;
  undefined1 auVar413 [32];
  float fVar418;
  float fVar419;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float in_register_000015dc;
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  Precalculations *local_868;
  undefined1 local_860 [32];
  uint local_840;
  undefined4 uStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined1 auStack_7d0 [8];
  float fStack_7c8;
  float fStack_7c4;
  undefined1 (*local_7a8) [16];
  undefined8 local_7a0;
  undefined1 auStack_798 [8];
  undefined1 auStack_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 auStack_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 auStack_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  LinearSpace3fa *local_5f0;
  Primitive *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 auStack_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  uint local_340;
  uint local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar268 [16];
  undefined1 auVar411 [16];
  undefined1 auVar420 [16];
  
  PVar32 = prim[1];
  uVar154 = (ulong)(byte)PVar32;
  lVar157 = uVar154 * 0x25;
  auVar289 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar289 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar224 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar224 = vinsertps_avx(auVar224,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar289 = vsubps_avx(auVar289,*(undefined1 (*) [16])(prim + lVar157 + 6));
  fVar236 = *(float *)(prim + lVar157 + 0x12);
  auVar195._0_4_ = fVar236 * auVar289._0_4_;
  auVar195._4_4_ = fVar236 * auVar289._4_4_;
  auVar195._8_4_ = fVar236 * auVar289._8_4_;
  auVar195._12_4_ = fVar236 * auVar289._12_4_;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 4 + 6)));
  auVar288._0_4_ = fVar236 * auVar224._0_4_;
  auVar288._4_4_ = fVar236 * auVar224._4_4_;
  auVar288._8_4_ = fVar236 * auVar224._8_4_;
  auVar288._12_4_ = fVar236 * auVar224._12_4_;
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 4 + 10)));
  auVar168._16_16_ = auVar224;
  auVar168._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar168);
  lVar161 = uVar154 * 5;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar161 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar161 + 10)));
  auVar228._16_16_ = auVar224;
  auVar228._0_16_ = auVar289;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 6 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 6 + 10)));
  auVar210 = vcvtdq2ps_avx(auVar228);
  auVar241._16_16_ = auVar224;
  auVar241._0_16_ = auVar289;
  auVar175 = vcvtdq2ps_avx(auVar241);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0xf + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0xf + 10)));
  auVar242._16_16_ = auVar224;
  auVar242._0_16_ = auVar289;
  auVar40 = vcvtdq2ps_avx(auVar242);
  lVar158 = (ulong)(byte)PVar32 * 0x10;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar158 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar158 + 10)));
  auVar308._16_16_ = auVar224;
  auVar308._0_16_ = auVar289;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar158 + uVar154 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar308);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar158 + uVar154 + 10)));
  auVar317._16_16_ = auVar224;
  auVar317._0_16_ = auVar289;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1a + 6)));
  auVar362 = vcvtdq2ps_avx(auVar317);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1a + 10)));
  auVar318._16_16_ = auVar224;
  auVar318._0_16_ = auVar289;
  auVar348 = vcvtdq2ps_avx(auVar318);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1b + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1b + 10)));
  auVar342._16_16_ = auVar224;
  auVar342._0_16_ = auVar289;
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1c + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar154 * 0x1c + 10)));
  auVar42 = vcvtdq2ps_avx(auVar342);
  auVar357._16_16_ = auVar224;
  auVar357._0_16_ = auVar289;
  auVar424 = vcvtdq2ps_avx(auVar357);
  auVar289 = vshufps_avx(auVar288,auVar288,0);
  auVar224 = vshufps_avx(auVar288,auVar288,0x55);
  auVar270 = vshufps_avx(auVar288,auVar288,0xaa);
  fVar236 = auVar270._0_4_;
  fVar254 = auVar270._4_4_;
  fVar252 = auVar270._8_4_;
  fVar286 = auVar270._12_4_;
  fVar235 = auVar224._0_4_;
  fVar261 = auVar224._4_4_;
  fVar256 = auVar224._8_4_;
  fVar302 = auVar224._12_4_;
  fVar258 = auVar289._0_4_;
  fVar259 = auVar289._4_4_;
  fVar262 = auVar289._8_4_;
  fVar264 = auVar289._12_4_;
  auVar388._0_4_ = fVar258 * auVar168._0_4_ + fVar235 * auVar210._0_4_ + fVar236 * auVar175._0_4_;
  auVar388._4_4_ = fVar259 * auVar168._4_4_ + fVar261 * auVar210._4_4_ + fVar254 * auVar175._4_4_;
  auVar388._8_4_ = fVar262 * auVar168._8_4_ + fVar256 * auVar210._8_4_ + fVar252 * auVar175._8_4_;
  auVar388._12_4_ =
       fVar264 * auVar168._12_4_ + fVar302 * auVar210._12_4_ + fVar286 * auVar175._12_4_;
  auVar388._16_4_ =
       fVar258 * auVar168._16_4_ + fVar235 * auVar210._16_4_ + fVar236 * auVar175._16_4_;
  auVar388._20_4_ =
       fVar259 * auVar168._20_4_ + fVar261 * auVar210._20_4_ + fVar254 * auVar175._20_4_;
  auVar388._24_4_ =
       fVar262 * auVar168._24_4_ + fVar256 * auVar210._24_4_ + fVar252 * auVar175._24_4_;
  auVar388._28_4_ = fVar302 + in_register_000015dc + in_register_0000151c;
  auVar374._0_4_ = fVar258 * auVar40._0_4_ + fVar235 * auVar41._0_4_ + auVar362._0_4_ * fVar236;
  auVar374._4_4_ = fVar259 * auVar40._4_4_ + fVar261 * auVar41._4_4_ + auVar362._4_4_ * fVar254;
  auVar374._8_4_ = fVar262 * auVar40._8_4_ + fVar256 * auVar41._8_4_ + auVar362._8_4_ * fVar252;
  auVar374._12_4_ = fVar264 * auVar40._12_4_ + fVar302 * auVar41._12_4_ + auVar362._12_4_ * fVar286;
  auVar374._16_4_ = fVar258 * auVar40._16_4_ + fVar235 * auVar41._16_4_ + auVar362._16_4_ * fVar236;
  auVar374._20_4_ = fVar259 * auVar40._20_4_ + fVar261 * auVar41._20_4_ + auVar362._20_4_ * fVar254;
  auVar374._24_4_ = fVar262 * auVar40._24_4_ + fVar256 * auVar41._24_4_ + auVar362._24_4_ * fVar252;
  auVar374._28_4_ = fVar302 + in_register_000015dc + in_register_0000159c;
  auVar290._0_4_ = fVar258 * auVar348._0_4_ + fVar235 * auVar42._0_4_ + auVar424._0_4_ * fVar236;
  auVar290._4_4_ = fVar259 * auVar348._4_4_ + fVar261 * auVar42._4_4_ + auVar424._4_4_ * fVar254;
  auVar290._8_4_ = fVar262 * auVar348._8_4_ + fVar256 * auVar42._8_4_ + auVar424._8_4_ * fVar252;
  auVar290._12_4_ = fVar264 * auVar348._12_4_ + fVar302 * auVar42._12_4_ + auVar424._12_4_ * fVar286
  ;
  auVar290._16_4_ = fVar258 * auVar348._16_4_ + fVar235 * auVar42._16_4_ + auVar424._16_4_ * fVar236
  ;
  auVar290._20_4_ = fVar259 * auVar348._20_4_ + fVar261 * auVar42._20_4_ + auVar424._20_4_ * fVar254
  ;
  auVar290._24_4_ = fVar262 * auVar348._24_4_ + fVar256 * auVar42._24_4_ + auVar424._24_4_ * fVar252
  ;
  auVar290._28_4_ = fVar264 + fVar302 + fVar286;
  auVar289 = vshufps_avx(auVar195,auVar195,0);
  auVar224 = vshufps_avx(auVar195,auVar195,0x55);
  auVar270 = vshufps_avx(auVar195,auVar195,0xaa);
  fVar236 = auVar270._0_4_;
  fVar254 = auVar270._4_4_;
  fVar252 = auVar270._8_4_;
  fVar286 = auVar270._12_4_;
  fVar259 = auVar224._0_4_;
  fVar262 = auVar224._4_4_;
  fVar264 = auVar224._8_4_;
  fVar276 = auVar224._12_4_;
  fVar235 = auVar210._28_4_ + auVar175._28_4_;
  fVar261 = auVar289._0_4_;
  fVar256 = auVar289._4_4_;
  fVar302 = auVar289._8_4_;
  fVar258 = auVar289._12_4_;
  auVar201._0_4_ = fVar261 * auVar168._0_4_ + fVar259 * auVar210._0_4_ + fVar236 * auVar175._0_4_;
  auVar201._4_4_ = fVar256 * auVar168._4_4_ + fVar262 * auVar210._4_4_ + fVar254 * auVar175._4_4_;
  auVar201._8_4_ = fVar302 * auVar168._8_4_ + fVar264 * auVar210._8_4_ + fVar252 * auVar175._8_4_;
  auVar201._12_4_ =
       fVar258 * auVar168._12_4_ + fVar276 * auVar210._12_4_ + fVar286 * auVar175._12_4_;
  auVar201._16_4_ =
       fVar261 * auVar168._16_4_ + fVar259 * auVar210._16_4_ + fVar236 * auVar175._16_4_;
  auVar201._20_4_ =
       fVar256 * auVar168._20_4_ + fVar262 * auVar210._20_4_ + fVar254 * auVar175._20_4_;
  auVar201._24_4_ =
       fVar302 * auVar168._24_4_ + fVar264 * auVar210._24_4_ + fVar252 * auVar175._24_4_;
  auVar201._28_4_ = auVar168._28_4_ + fVar235;
  auVar169._0_4_ = fVar261 * auVar40._0_4_ + auVar362._0_4_ * fVar236 + fVar259 * auVar41._0_4_;
  auVar169._4_4_ = fVar256 * auVar40._4_4_ + auVar362._4_4_ * fVar254 + fVar262 * auVar41._4_4_;
  auVar169._8_4_ = fVar302 * auVar40._8_4_ + auVar362._8_4_ * fVar252 + fVar264 * auVar41._8_4_;
  auVar169._12_4_ = fVar258 * auVar40._12_4_ + auVar362._12_4_ * fVar286 + fVar276 * auVar41._12_4_;
  auVar169._16_4_ = fVar261 * auVar40._16_4_ + auVar362._16_4_ * fVar236 + fVar259 * auVar41._16_4_;
  auVar169._20_4_ = fVar256 * auVar40._20_4_ + auVar362._20_4_ * fVar254 + fVar262 * auVar41._20_4_;
  auVar169._24_4_ = fVar302 * auVar40._24_4_ + auVar362._24_4_ * fVar252 + fVar264 * auVar41._24_4_;
  auVar169._28_4_ = auVar168._28_4_ + auVar362._28_4_ + auVar175._28_4_;
  auVar330._8_4_ = 0x7fffffff;
  auVar330._0_8_ = 0x7fffffff7fffffff;
  auVar330._12_4_ = 0x7fffffff;
  auVar330._16_4_ = 0x7fffffff;
  auVar330._20_4_ = 0x7fffffff;
  auVar330._24_4_ = 0x7fffffff;
  auVar330._28_4_ = 0x7fffffff;
  auVar243._8_4_ = 0x219392ef;
  auVar243._0_8_ = 0x219392ef219392ef;
  auVar243._12_4_ = 0x219392ef;
  auVar243._16_4_ = 0x219392ef;
  auVar243._20_4_ = 0x219392ef;
  auVar243._24_4_ = 0x219392ef;
  auVar243._28_4_ = 0x219392ef;
  auVar168 = vandps_avx(auVar388,auVar330);
  auVar168 = vcmpps_avx(auVar168,auVar243,1);
  auVar210 = vblendvps_avx(auVar388,auVar243,auVar168);
  auVar168 = vandps_avx(auVar374,auVar330);
  auVar168 = vcmpps_avx(auVar168,auVar243,1);
  auVar175 = vblendvps_avx(auVar374,auVar243,auVar168);
  auVar168 = vandps_avx(auVar330,auVar290);
  auVar168 = vcmpps_avx(auVar168,auVar243,1);
  auVar168 = vblendvps_avx(auVar290,auVar243,auVar168);
  auVar229._0_4_ = fVar261 * auVar348._0_4_ + fVar259 * auVar42._0_4_ + auVar424._0_4_ * fVar236;
  auVar229._4_4_ = fVar256 * auVar348._4_4_ + fVar262 * auVar42._4_4_ + auVar424._4_4_ * fVar254;
  auVar229._8_4_ = fVar302 * auVar348._8_4_ + fVar264 * auVar42._8_4_ + auVar424._8_4_ * fVar252;
  auVar229._12_4_ = fVar258 * auVar348._12_4_ + fVar276 * auVar42._12_4_ + auVar424._12_4_ * fVar286
  ;
  auVar229._16_4_ = fVar261 * auVar348._16_4_ + fVar259 * auVar42._16_4_ + auVar424._16_4_ * fVar236
  ;
  auVar229._20_4_ = fVar256 * auVar348._20_4_ + fVar262 * auVar42._20_4_ + auVar424._20_4_ * fVar254
  ;
  auVar229._24_4_ = fVar302 * auVar348._24_4_ + fVar264 * auVar42._24_4_ + auVar424._24_4_ * fVar252
  ;
  auVar229._28_4_ = fVar235 + auVar41._28_4_ + fVar286;
  auVar40 = vrcpps_avx(auVar210);
  fVar236 = auVar40._0_4_;
  fVar252 = auVar40._4_4_;
  auVar41._4_4_ = auVar210._4_4_ * fVar252;
  auVar41._0_4_ = auVar210._0_4_ * fVar236;
  fVar235 = auVar40._8_4_;
  auVar41._8_4_ = auVar210._8_4_ * fVar235;
  fVar256 = auVar40._12_4_;
  auVar41._12_4_ = auVar210._12_4_ * fVar256;
  fVar258 = auVar40._16_4_;
  auVar41._16_4_ = auVar210._16_4_ * fVar258;
  fVar259 = auVar40._20_4_;
  auVar41._20_4_ = auVar210._20_4_ * fVar259;
  fVar262 = auVar40._24_4_;
  auVar41._24_4_ = auVar210._24_4_ * fVar262;
  auVar41._28_4_ = auVar210._28_4_;
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = &DAT_3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar362 = vsubps_avx(auVar331,auVar41);
  auVar41 = vrcpps_avx(auVar175);
  fVar236 = fVar236 + fVar236 * auVar362._0_4_;
  fVar252 = fVar252 + fVar252 * auVar362._4_4_;
  fVar235 = fVar235 + fVar235 * auVar362._8_4_;
  fVar256 = fVar256 + fVar256 * auVar362._12_4_;
  fVar258 = fVar258 + fVar258 * auVar362._16_4_;
  fVar259 = fVar259 + fVar259 * auVar362._20_4_;
  fVar262 = fVar262 + fVar262 * auVar362._24_4_;
  fVar264 = auVar41._0_4_;
  fVar276 = auVar41._4_4_;
  auVar210._4_4_ = fVar276 * auVar175._4_4_;
  auVar210._0_4_ = fVar264 * auVar175._0_4_;
  fVar279 = auVar41._8_4_;
  auVar210._8_4_ = fVar279 * auVar175._8_4_;
  fVar281 = auVar41._12_4_;
  auVar210._12_4_ = fVar281 * auVar175._12_4_;
  fVar283 = auVar41._16_4_;
  auVar210._16_4_ = fVar283 * auVar175._16_4_;
  fVar284 = auVar41._20_4_;
  auVar210._20_4_ = fVar284 * auVar175._20_4_;
  fVar285 = auVar41._24_4_;
  auVar210._24_4_ = fVar285 * auVar175._24_4_;
  auVar210._28_4_ = auVar362._28_4_;
  auVar175 = vsubps_avx(auVar331,auVar210);
  fVar264 = fVar264 + fVar264 * auVar175._0_4_;
  fVar276 = fVar276 + fVar276 * auVar175._4_4_;
  fVar279 = fVar279 + fVar279 * auVar175._8_4_;
  fVar281 = fVar281 + fVar281 * auVar175._12_4_;
  fVar283 = fVar283 + fVar283 * auVar175._16_4_;
  fVar284 = fVar284 + fVar284 * auVar175._20_4_;
  fVar285 = fVar285 + fVar285 * auVar175._24_4_;
  auVar210 = vrcpps_avx(auVar168);
  fVar287 = auVar210._0_4_;
  fVar297 = auVar210._4_4_;
  auVar348._4_4_ = fVar297 * auVar168._4_4_;
  auVar348._0_4_ = fVar287 * auVar168._0_4_;
  fVar298 = auVar210._8_4_;
  auVar348._8_4_ = fVar298 * auVar168._8_4_;
  fVar299 = auVar210._12_4_;
  auVar348._12_4_ = fVar299 * auVar168._12_4_;
  fVar300 = auVar210._16_4_;
  auVar348._16_4_ = fVar300 * auVar168._16_4_;
  fVar301 = auVar210._20_4_;
  auVar348._20_4_ = fVar301 * auVar168._20_4_;
  fVar303 = auVar210._24_4_;
  auVar348._24_4_ = fVar303 * auVar168._24_4_;
  auVar348._28_4_ = auVar168._28_4_;
  auVar168 = vsubps_avx(auVar331,auVar348);
  fVar287 = fVar287 + fVar287 * auVar168._0_4_;
  fVar297 = fVar297 + fVar297 * auVar168._4_4_;
  fVar298 = fVar298 + fVar298 * auVar168._8_4_;
  fVar299 = fVar299 + fVar299 * auVar168._12_4_;
  fVar300 = fVar300 + fVar300 * auVar168._16_4_;
  fVar301 = fVar301 + fVar301 * auVar168._20_4_;
  fVar303 = fVar303 + fVar303 * auVar168._24_4_;
  auVar289 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar157 + 0x16)) *
                           *(float *)(prim + lVar157 + 0x1a)));
  auVar43 = vshufps_avx(auVar289,auVar289,0);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar154 * 7 + 6);
  auVar289 = vpmovsxwd_avx(auVar289);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar154 * 7 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar224);
  auVar319._16_16_ = auVar224;
  auVar319._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar319);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar154 * 0xb + 6);
  auVar289 = vpmovsxwd_avx(auVar270);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar154 * 0xb + 0xe);
  auVar224 = vpmovsxwd_avx(auVar240);
  auVar332._16_16_ = auVar224;
  auVar332._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar332);
  auVar210 = vsubps_avx(auVar210,auVar168);
  fVar254 = auVar43._0_4_;
  fVar286 = auVar43._4_4_;
  fVar261 = auVar43._8_4_;
  fVar302 = auVar43._12_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar154 * 9 + 6);
  auVar289 = vpmovsxwd_avx(auVar43);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar154 * 9 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar13);
  auVar320._0_4_ = auVar210._0_4_ * fVar254 + auVar168._0_4_;
  auVar320._4_4_ = auVar210._4_4_ * fVar286 + auVar168._4_4_;
  auVar320._8_4_ = auVar210._8_4_ * fVar261 + auVar168._8_4_;
  auVar320._12_4_ = auVar210._12_4_ * fVar302 + auVar168._12_4_;
  auVar320._16_4_ = auVar210._16_4_ * fVar254 + auVar168._16_4_;
  auVar320._20_4_ = auVar210._20_4_ * fVar286 + auVar168._20_4_;
  auVar320._24_4_ = auVar210._24_4_ * fVar261 + auVar168._24_4_;
  auVar320._28_4_ = auVar210._28_4_ + auVar168._28_4_;
  auVar333._16_16_ = auVar224;
  auVar333._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar333);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar154 * 0xd + 6);
  auVar289 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar154 * 0xd + 0xe);
  auVar224 = vpmovsxwd_avx(auVar15);
  auVar343._16_16_ = auVar224;
  auVar343._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar343);
  auVar210 = vsubps_avx(auVar210,auVar168);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar154 * 0x12 + 6);
  auVar289 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar154 * 0x12 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar17);
  auVar334._0_4_ = auVar168._0_4_ + auVar210._0_4_ * fVar254;
  auVar334._4_4_ = auVar168._4_4_ + auVar210._4_4_ * fVar286;
  auVar334._8_4_ = auVar168._8_4_ + auVar210._8_4_ * fVar261;
  auVar334._12_4_ = auVar168._12_4_ + auVar210._12_4_ * fVar302;
  auVar334._16_4_ = auVar168._16_4_ + auVar210._16_4_ * fVar254;
  auVar334._20_4_ = auVar168._20_4_ + auVar210._20_4_ * fVar286;
  auVar334._24_4_ = auVar168._24_4_ + auVar210._24_4_ * fVar261;
  auVar334._28_4_ = auVar168._28_4_ + auVar210._28_4_;
  auVar344._16_16_ = auVar224;
  auVar344._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar344);
  uVar156 = (ulong)(uint)((int)lVar161 << 2);
  lVar157 = uVar154 * 2 + uVar156;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar157 + 6);
  auVar289 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar157 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar19);
  auVar358._16_16_ = auVar224;
  auVar358._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar358);
  auVar210 = vsubps_avx(auVar210,auVar168);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar156 + 6);
  auVar289 = vpmovsxwd_avx(auVar20);
  auVar345._0_4_ = auVar168._0_4_ + auVar210._0_4_ * fVar254;
  auVar345._4_4_ = auVar168._4_4_ + auVar210._4_4_ * fVar286;
  auVar345._8_4_ = auVar168._8_4_ + auVar210._8_4_ * fVar261;
  auVar345._12_4_ = auVar168._12_4_ + auVar210._12_4_ * fVar302;
  auVar345._16_4_ = auVar168._16_4_ + auVar210._16_4_ * fVar254;
  auVar345._20_4_ = auVar168._20_4_ + auVar210._20_4_ * fVar286;
  auVar345._24_4_ = auVar168._24_4_ + auVar210._24_4_ * fVar261;
  auVar345._28_4_ = auVar168._28_4_ + auVar210._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar156 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar21);
  auVar359._16_16_ = auVar224;
  auVar359._0_16_ = auVar289;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar154 * 0x18 + 6);
  auVar289 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar154 * 0x18 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar23);
  auVar168 = vcvtdq2ps_avx(auVar359);
  auVar375._16_16_ = auVar224;
  auVar375._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar375);
  auVar210 = vsubps_avx(auVar210,auVar168);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar154 * 0x1d + 6);
  auVar289 = vpmovsxwd_avx(auVar24);
  auVar360._0_4_ = auVar168._0_4_ + auVar210._0_4_ * fVar254;
  auVar360._4_4_ = auVar168._4_4_ + auVar210._4_4_ * fVar286;
  auVar360._8_4_ = auVar168._8_4_ + auVar210._8_4_ * fVar261;
  auVar360._12_4_ = auVar168._12_4_ + auVar210._12_4_ * fVar302;
  auVar360._16_4_ = auVar168._16_4_ + auVar210._16_4_ * fVar254;
  auVar360._20_4_ = auVar168._20_4_ + auVar210._20_4_ * fVar286;
  auVar360._24_4_ = auVar168._24_4_ + auVar210._24_4_ * fVar261;
  auVar360._28_4_ = auVar168._28_4_ + auVar210._28_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar154 * 0x1d + 0xe);
  auVar224 = vpmovsxwd_avx(auVar25);
  auVar376._16_16_ = auVar224;
  auVar376._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar376);
  lVar157 = uVar154 + (ulong)(byte)PVar32 * 0x20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar157 + 6);
  auVar289 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar157 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar27);
  auVar389._16_16_ = auVar224;
  auVar389._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar389);
  auVar210 = vsubps_avx(auVar210,auVar168);
  auVar377._0_4_ = auVar168._0_4_ + auVar210._0_4_ * fVar254;
  auVar377._4_4_ = auVar168._4_4_ + auVar210._4_4_ * fVar286;
  auVar377._8_4_ = auVar168._8_4_ + auVar210._8_4_ * fVar261;
  auVar377._12_4_ = auVar168._12_4_ + auVar210._12_4_ * fVar302;
  auVar377._16_4_ = auVar168._16_4_ + auVar210._16_4_ * fVar254;
  auVar377._20_4_ = auVar168._20_4_ + auVar210._20_4_ * fVar286;
  auVar377._24_4_ = auVar168._24_4_ + auVar210._24_4_ * fVar261;
  auVar377._28_4_ = auVar168._28_4_ + auVar210._28_4_;
  lVar157 = (ulong)(byte)PVar32 * 0x20 - uVar154;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar157 + 6);
  auVar289 = vpmovsxwd_avx(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar157 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar29);
  auVar390._16_16_ = auVar224;
  auVar390._0_16_ = auVar289;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar154 * 0x23 + 6);
  auVar289 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar154 * 0x23 + 0xe);
  auVar224 = vpmovsxwd_avx(auVar31);
  auVar399._16_16_ = auVar224;
  auVar399._0_16_ = auVar289;
  auVar168 = vcvtdq2ps_avx(auVar390);
  auVar210 = vcvtdq2ps_avx(auVar399);
  auVar210 = vsubps_avx(auVar210,auVar168);
  auVar391._0_4_ = auVar168._0_4_ + auVar210._0_4_ * fVar254;
  auVar391._4_4_ = auVar168._4_4_ + auVar210._4_4_ * fVar286;
  auVar391._8_4_ = auVar168._8_4_ + auVar210._8_4_ * fVar261;
  auVar391._12_4_ = auVar168._12_4_ + auVar210._12_4_ * fVar302;
  auVar391._16_4_ = auVar168._16_4_ + auVar210._16_4_ * fVar254;
  auVar391._20_4_ = auVar168._20_4_ + auVar210._20_4_ * fVar286;
  auVar391._24_4_ = auVar168._24_4_ + auVar210._24_4_ * fVar261;
  auVar391._28_4_ = auVar168._28_4_ + fVar302;
  auVar168 = vsubps_avx(auVar320,auVar201);
  auVar307._0_4_ = fVar236 * auVar168._0_4_;
  auVar307._4_4_ = fVar252 * auVar168._4_4_;
  auVar307._8_4_ = fVar235 * auVar168._8_4_;
  auVar307._12_4_ = fVar256 * auVar168._12_4_;
  auVar42._16_4_ = fVar258 * auVar168._16_4_;
  auVar42._0_16_ = auVar307;
  auVar42._20_4_ = fVar259 * auVar168._20_4_;
  auVar42._24_4_ = fVar262 * auVar168._24_4_;
  auVar42._28_4_ = auVar168._28_4_;
  auVar168 = vsubps_avx(auVar334,auVar201);
  auVar238._0_4_ = fVar236 * auVar168._0_4_;
  auVar238._4_4_ = fVar252 * auVar168._4_4_;
  auVar238._8_4_ = fVar235 * auVar168._8_4_;
  auVar238._12_4_ = fVar256 * auVar168._12_4_;
  auVar424._16_4_ = fVar258 * auVar168._16_4_;
  auVar424._0_16_ = auVar238;
  auVar424._20_4_ = fVar259 * auVar168._20_4_;
  auVar424._24_4_ = fVar262 * auVar168._24_4_;
  auVar424._28_4_ = auVar40._28_4_ + auVar362._28_4_;
  auVar168 = vsubps_avx(auVar345,auVar169);
  auVar196._0_4_ = fVar264 * auVar168._0_4_;
  auVar196._4_4_ = fVar276 * auVar168._4_4_;
  auVar196._8_4_ = fVar279 * auVar168._8_4_;
  auVar196._12_4_ = fVar281 * auVar168._12_4_;
  auVar40._16_4_ = fVar283 * auVar168._16_4_;
  auVar40._0_16_ = auVar196;
  auVar40._20_4_ = fVar284 * auVar168._20_4_;
  auVar40._24_4_ = fVar285 * auVar168._24_4_;
  auVar40._28_4_ = auVar168._28_4_;
  auVar168 = vsubps_avx(auVar360,auVar169);
  auVar267._0_4_ = fVar264 * auVar168._0_4_;
  auVar267._4_4_ = fVar276 * auVar168._4_4_;
  auVar267._8_4_ = fVar279 * auVar168._8_4_;
  auVar267._12_4_ = fVar281 * auVar168._12_4_;
  auVar362._16_4_ = fVar283 * auVar168._16_4_;
  auVar362._0_16_ = auVar267;
  auVar362._20_4_ = fVar284 * auVar168._20_4_;
  auVar362._24_4_ = fVar285 * auVar168._24_4_;
  auVar362._28_4_ = auVar41._28_4_ + auVar175._28_4_;
  auVar168 = vsubps_avx(auVar377,auVar229);
  auVar166._0_4_ = fVar287 * auVar168._0_4_;
  auVar166._4_4_ = fVar297 * auVar168._4_4_;
  auVar166._8_4_ = fVar298 * auVar168._8_4_;
  auVar166._12_4_ = fVar299 * auVar168._12_4_;
  auVar175._16_4_ = fVar300 * auVar168._16_4_;
  auVar175._0_16_ = auVar166;
  auVar175._20_4_ = fVar301 * auVar168._20_4_;
  auVar175._24_4_ = fVar303 * auVar168._24_4_;
  auVar175._28_4_ = auVar168._28_4_;
  auVar168 = vsubps_avx(auVar391,auVar229);
  auVar220._0_4_ = fVar287 * auVar168._0_4_;
  auVar220._4_4_ = fVar297 * auVar168._4_4_;
  auVar220._8_4_ = fVar298 * auVar168._8_4_;
  auVar220._12_4_ = fVar299 * auVar168._12_4_;
  auVar44._16_4_ = fVar300 * auVar168._16_4_;
  auVar44._0_16_ = auVar220;
  auVar44._20_4_ = fVar301 * auVar168._20_4_;
  auVar44._24_4_ = fVar303 * auVar168._24_4_;
  auVar44._28_4_ = auVar168._28_4_;
  auVar289 = vpminsd_avx(auVar42._16_16_,auVar424._16_16_);
  auVar224 = vpminsd_avx(auVar307,auVar238);
  auVar335._16_16_ = auVar289;
  auVar335._0_16_ = auVar224;
  auVar289 = vpminsd_avx(auVar40._16_16_,auVar362._16_16_);
  auVar224 = vpminsd_avx(auVar196,auVar267);
  auVar378._16_16_ = auVar289;
  auVar378._0_16_ = auVar224;
  auVar168 = vmaxps_avx(auVar335,auVar378);
  auVar289 = vpminsd_avx(auVar175._16_16_,auVar44._16_16_);
  auVar224 = vpminsd_avx(auVar166,auVar220);
  auVar400._16_16_ = auVar289;
  auVar400._0_16_ = auVar224;
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar412._4_4_ = uVar12;
  auVar412._0_4_ = uVar12;
  auVar412._8_4_ = uVar12;
  auVar412._12_4_ = uVar12;
  auVar412._16_4_ = uVar12;
  auVar412._20_4_ = uVar12;
  auVar412._24_4_ = uVar12;
  auVar412._28_4_ = uVar12;
  auVar210 = vmaxps_avx(auVar400,auVar412);
  auVar168 = vmaxps_avx(auVar168,auVar210);
  local_80._4_4_ = auVar168._4_4_ * 0.99999964;
  local_80._0_4_ = auVar168._0_4_ * 0.99999964;
  local_80._8_4_ = auVar168._8_4_ * 0.99999964;
  local_80._12_4_ = auVar168._12_4_ * 0.99999964;
  local_80._16_4_ = auVar168._16_4_ * 0.99999964;
  local_80._20_4_ = auVar168._20_4_ * 0.99999964;
  local_80._24_4_ = auVar168._24_4_ * 0.99999964;
  local_80._28_4_ = auVar168._28_4_;
  auVar289 = vpmaxsd_avx(auVar42._16_16_,auVar424._16_16_);
  auVar224 = vpmaxsd_avx(auVar307,auVar238);
  auVar244._16_16_ = auVar289;
  auVar244._0_16_ = auVar224;
  auVar289 = vpmaxsd_avx(auVar40._16_16_,auVar362._16_16_);
  auVar224 = vpmaxsd_avx(auVar196,auVar267);
  auVar202._16_16_ = auVar289;
  auVar202._0_16_ = auVar224;
  auVar168 = vminps_avx(auVar244,auVar202);
  auVar289 = vpmaxsd_avx(auVar175._16_16_,auVar44._16_16_);
  auVar224 = vpmaxsd_avx(auVar166,auVar220);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar230._4_4_ = uVar12;
  auVar230._0_4_ = uVar12;
  auVar230._8_4_ = uVar12;
  auVar230._12_4_ = uVar12;
  auVar230._16_4_ = uVar12;
  auVar230._20_4_ = uVar12;
  auVar230._24_4_ = uVar12;
  auVar230._28_4_ = uVar12;
  auVar170._16_16_ = auVar289;
  auVar170._0_16_ = auVar224;
  auVar210 = vminps_avx(auVar170,auVar230);
  auVar168 = vminps_avx(auVar168,auVar210);
  auVar39._4_4_ = auVar168._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar168._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar168._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar168._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar168._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar168._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar168._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar168._28_4_;
  auVar168 = vcmpps_avx(local_80,auVar39,2);
  auVar289 = vpshufd_avx(ZEXT116((byte)PVar32),0);
  auVar203._16_16_ = auVar289;
  auVar203._0_16_ = auVar289;
  auVar210 = vcvtdq2ps_avx(auVar203);
  auVar210 = vcmpps_avx(_DAT_02020f40,auVar210,1);
  auVar168 = vandps_avx(auVar168,auVar210);
  uVar152 = vmovmskps_avx(auVar168);
  if (uVar152 != 0) {
    uVar152 = uVar152 & 0xff;
    local_5f0 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    local_7a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_868 = pre;
    local_5e8 = prim;
    do {
      lVar157 = 0;
      if (uVar152 != 0) {
        for (; (uVar152 >> lVar157 & 1) == 0; lVar157 = lVar157 + 1) {
        }
      }
      uVar155 = *(uint *)(local_5e8 + 2);
      uVar33 = *(uint *)(local_5e8 + lVar157 * 4 + 6);
      pGVar160 = (context->scene->geometries).items[uVar155].ptr;
      uVar154 = (ulong)*(uint *)(*(long *)&pGVar160->field_0x58 +
                                (ulong)uVar33 *
                                pGVar160[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar236 = (pGVar160->time_range).lower;
      fVar236 = pGVar160->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar236) /
                ((pGVar160->time_range).upper - fVar236));
      auVar289 = vroundss_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),9);
      auVar289 = vminss_avx(auVar289,ZEXT416((uint)(pGVar160->fnumTimeSegments + -1.0)));
      auVar289 = vmaxss_avx(ZEXT816(0) << 0x20,auVar289);
      fVar236 = fVar236 - auVar289._0_4_;
      _Var36 = pGVar160[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar159 = (long)(int)auVar289._0_4_ * 0x38;
      lVar157 = *(long *)(_Var36 + 0x10 + lVar159);
      lVar161 = *(long *)(_Var36 + 0x38 + lVar159);
      lVar158 = *(long *)(_Var36 + 0x48 + lVar159);
      auVar289 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
      pfVar1 = (float *)(lVar161 + uVar154 * lVar158);
      fVar254 = auVar289._0_4_;
      fVar252 = auVar289._4_4_;
      fVar286 = auVar289._8_4_;
      fVar235 = auVar289._12_4_;
      pfVar2 = (float *)(lVar161 + (uVar154 + 1) * lVar158);
      pfVar3 = (float *)(lVar161 + (uVar154 + 2) * lVar158);
      pfVar4 = (float *)(lVar161 + lVar158 * (uVar154 + 3));
      lVar161 = *(long *)(_Var36 + lVar159);
      auVar289 = vshufps_avx(ZEXT416((uint)(1.0 - fVar236)),ZEXT416((uint)(1.0 - fVar236)),0);
      pfVar5 = (float *)(lVar161 + lVar157 * uVar154);
      fVar236 = auVar289._0_4_;
      fVar261 = auVar289._4_4_;
      fVar256 = auVar289._8_4_;
      fVar302 = auVar289._12_4_;
      pfVar6 = (float *)(lVar161 + lVar157 * (uVar154 + 1));
      pfVar7 = (float *)(lVar161 + lVar157 * (uVar154 + 2));
      pfVar8 = (float *)(lVar161 + lVar157 * (uVar154 + 3));
      uVar34 = (uint)pGVar160[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar157 = (long)(int)uVar34 * 0x44;
      fVar265 = fVar254 * *pfVar1 + fVar236 * *pfVar5;
      fVar277 = fVar252 * pfVar1[1] + fVar261 * pfVar5[1];
      auVar268._0_8_ = CONCAT44(fVar277,fVar265);
      auVar268._8_4_ = fVar286 * pfVar1[2] + fVar256 * pfVar5[2];
      auVar268._12_4_ = fVar235 * pfVar1[3] + fVar302 * pfVar5[3];
      fVar409 = fVar236 * *pfVar6 + fVar254 * *pfVar2;
      fVar414 = fVar261 * pfVar6[1] + fVar252 * pfVar2[1];
      auVar411._0_8_ = CONCAT44(fVar414,fVar409);
      auVar411._8_4_ = fVar256 * pfVar6[2] + fVar286 * pfVar2[2];
      auVar411._12_4_ = fVar302 * pfVar6[3] + fVar235 * pfVar2[3];
      fVar418 = fVar236 * *pfVar7 + fVar254 * *pfVar3;
      fVar426 = fVar261 * pfVar7[1] + fVar252 * pfVar3[1];
      auVar420._0_8_ = CONCAT44(fVar426,fVar418);
      auVar420._8_4_ = fVar256 * pfVar7[2] + fVar286 * pfVar3[2];
      auVar420._12_4_ = fVar302 * pfVar7[3] + fVar235 * pfVar3[3];
      local_720 = fVar236 * *pfVar8 + fVar254 * *pfVar4;
      fStack_71c = fVar261 * pfVar8[1] + fVar252 * pfVar4[1];
      auVar387._0_8_ = CONCAT44(fStack_71c,local_720);
      auVar387._8_4_ = fVar256 * pfVar8[2] + fVar286 * pfVar4[2];
      auVar387._12_4_ = fVar302 * pfVar8[3] + fVar235 * pfVar4[3];
      auVar289 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar240 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar270 = vsubps_avx(auVar268,auVar240);
      auVar289 = vshufps_avx(auVar270,auVar270,0);
      auVar224 = vshufps_avx(auVar270,auVar270,0x55);
      auVar270 = vshufps_avx(auVar270,auVar270,0xaa);
      fVar236 = (local_5f0->vx).field_0.m128[0];
      fVar254 = (local_5f0->vx).field_0.m128[1];
      fVar252 = (local_5f0->vx).field_0.m128[2];
      fVar286 = (local_5f0->vx).field_0.m128[3];
      fVar235 = (local_5f0->vy).field_0.m128[0];
      fVar261 = (local_5f0->vy).field_0.m128[1];
      fVar256 = (local_5f0->vy).field_0.m128[2];
      fVar302 = (local_5f0->vy).field_0.m128[3];
      fVar258 = (local_5f0->vz).field_0.m128[0];
      fVar259 = (local_5f0->vz).field_0.m128[1];
      fVar262 = (local_5f0->vz).field_0.m128[2];
      fVar264 = (local_5f0->vz).field_0.m128[3];
      auVar239._0_8_ =
           CONCAT44(auVar289._4_4_ * fVar254 + auVar224._4_4_ * fVar261 + fVar259 * auVar270._4_4_,
                    auVar289._0_4_ * fVar236 + auVar224._0_4_ * fVar235 + fVar258 * auVar270._0_4_);
      auVar239._8_4_ =
           auVar289._8_4_ * fVar252 + auVar224._8_4_ * fVar256 + fVar262 * auVar270._8_4_;
      auVar239._12_4_ =
           auVar289._12_4_ * fVar286 + auVar224._12_4_ * fVar302 + fVar264 * auVar270._12_4_;
      auVar289 = vblendps_avx(auVar239,auVar268,8);
      auVar43 = vsubps_avx(auVar411,auVar240);
      auVar224 = vshufps_avx(auVar43,auVar43,0);
      auVar270 = vshufps_avx(auVar43,auVar43,0x55);
      auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar316._0_4_ = auVar224._0_4_ * fVar236 + auVar270._0_4_ * fVar235 + fVar258 * auVar43._0_4_
      ;
      auVar316._4_4_ = auVar224._4_4_ * fVar254 + auVar270._4_4_ * fVar261 + fVar259 * auVar43._4_4_
      ;
      auVar316._8_4_ = auVar224._8_4_ * fVar252 + auVar270._8_4_ * fVar256 + fVar262 * auVar43._8_4_
      ;
      auVar316._12_4_ =
           auVar224._12_4_ * fVar286 + auVar270._12_4_ * fVar302 + fVar264 * auVar43._12_4_;
      auVar224 = vblendps_avx(auVar316,auVar411,8);
      auVar13 = vsubps_avx(auVar420,auVar240);
      auVar270 = vshufps_avx(auVar13,auVar13,0);
      auVar43 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar329._0_4_ = auVar270._0_4_ * fVar236 + auVar43._0_4_ * fVar235 + auVar13._0_4_ * fVar258;
      auVar329._4_4_ = auVar270._4_4_ * fVar254 + auVar43._4_4_ * fVar261 + auVar13._4_4_ * fVar259;
      auVar329._8_4_ = auVar270._8_4_ * fVar252 + auVar43._8_4_ * fVar256 + auVar13._8_4_ * fVar262;
      auVar329._12_4_ =
           auVar270._12_4_ * fVar286 + auVar43._12_4_ * fVar302 + auVar13._12_4_ * fVar264;
      auVar270 = vblendps_avx(auVar329,auVar420,8);
      auVar13 = vsubps_avx(auVar387,auVar240);
      auVar240 = vshufps_avx(auVar13,auVar13,0);
      auVar43 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar197._0_4_ = auVar240._0_4_ * fVar236 + auVar43._0_4_ * fVar235 + fVar258 * auVar13._0_4_;
      auVar197._4_4_ = auVar240._4_4_ * fVar254 + auVar43._4_4_ * fVar261 + fVar259 * auVar13._4_4_;
      auVar197._8_4_ = auVar240._8_4_ * fVar252 + auVar43._8_4_ * fVar256 + fVar262 * auVar13._8_4_;
      auVar197._12_4_ =
           auVar240._12_4_ * fVar286 + auVar43._12_4_ * fVar302 + fVar264 * auVar13._12_4_;
      auVar240 = vblendps_avx(auVar197,auVar387,8);
      auVar269._8_4_ = 0x7fffffff;
      auVar269._0_8_ = 0x7fffffff7fffffff;
      auVar269._12_4_ = 0x7fffffff;
      auVar289 = vandps_avx(auVar289,auVar269);
      auVar224 = vandps_avx(auVar224,auVar269);
      auVar43 = vmaxps_avx(auVar289,auVar224);
      auVar289 = vandps_avx(auVar270,auVar269);
      auVar224 = vandps_avx(auVar240,auVar269);
      auVar289 = vmaxps_avx(auVar289,auVar224);
      auVar289 = vmaxps_avx(auVar43,auVar289);
      auVar224 = vmovshdup_avx(auVar289);
      auVar224 = vmaxss_avx(auVar224,auVar289);
      auVar289 = vshufpd_avx(auVar289,auVar289,1);
      auVar289 = vmaxss_avx(auVar289,auVar224);
      fVar287 = *(float *)(bspline_basis0 + lVar157 + 0x908);
      fVar297 = *(float *)(bspline_basis0 + lVar157 + 0x90c);
      fVar298 = *(float *)(bspline_basis0 + lVar157 + 0x910);
      fVar299 = *(float *)(bspline_basis0 + lVar157 + 0x914);
      fVar300 = *(float *)(bspline_basis0 + lVar157 + 0x918);
      fVar301 = *(float *)(bspline_basis0 + lVar157 + 0x91c);
      fVar303 = *(float *)(bspline_basis0 + lVar157 + 0x920);
      auVar224 = vshufps_avx(auVar329,auVar329,0);
      register0x00001250 = auVar224;
      _local_4e0 = auVar224;
      auVar270 = vshufps_avx(auVar329,auVar329,0x55);
      register0x00001290 = auVar270;
      _local_760 = auVar270;
      fVar340 = *(float *)(bspline_basis0 + lVar157 + 0xd8c);
      fVar260 = *(float *)(bspline_basis0 + lVar157 + 0xd90);
      fVar304 = *(float *)(bspline_basis0 + lVar157 + 0xd94);
      fVar356 = *(float *)(bspline_basis0 + lVar157 + 0xd98);
      fVar367 = *(float *)(bspline_basis0 + lVar157 + 0xd9c);
      fVar263 = *(float *)(bspline_basis0 + lVar157 + 0xda0);
      fVar164 = *(float *)(bspline_basis0 + lVar157 + 0xda4);
      auVar240 = vshufps_avx(auVar197,auVar197,0);
      register0x00001210 = auVar240;
      _local_500 = auVar240;
      fVar236 = auVar240._0_4_;
      fVar286 = auVar240._4_4_;
      fVar256 = auVar240._8_4_;
      fVar259 = auVar240._12_4_;
      fVar194 = auVar224._0_4_;
      fVar215 = auVar224._4_4_;
      fVar216 = auVar224._8_4_;
      fVar217 = auVar224._12_4_;
      auVar224 = vshufps_avx(auVar197,auVar197,0x55);
      register0x00001550 = auVar224;
      _local_460 = auVar224;
      fVar397 = auVar224._0_4_;
      fVar403 = auVar224._4_4_;
      fVar405 = auVar224._8_4_;
      fVar407 = auVar224._12_4_;
      fVar219 = auVar270._0_4_;
      fVar232 = auVar270._4_4_;
      fVar233 = auVar270._8_4_;
      fVar234 = auVar270._12_4_;
      auVar224 = vshufps_avx(auVar420,auVar420,0xff);
      register0x00001410 = auVar224;
      _local_c0 = auVar224;
      auVar270 = vshufps_avx(auVar387,auVar387,0xff);
      register0x00001390 = auVar270;
      _local_a0 = auVar270;
      fVar254 = auVar270._0_4_;
      fVar252 = auVar270._4_4_;
      fVar235 = auVar270._8_4_;
      fVar261 = auVar270._12_4_;
      fVar328 = auVar224._0_4_;
      fVar337 = auVar224._4_4_;
      fVar338 = auVar224._8_4_;
      auVar270 = vshufps_avx(auVar316,auVar316,0);
      register0x000015d0 = auVar270;
      _local_480 = auVar270;
      pauVar11 = (undefined1 (*) [32])(bspline_basis0 + lVar157 + 0x484);
      fVar302 = *(float *)*pauVar11;
      fVar258 = *(float *)(bspline_basis0 + lVar157 + 0x488);
      fVar262 = *(float *)(bspline_basis0 + lVar157 + 0x48c);
      fVar264 = *(float *)(bspline_basis0 + lVar157 + 0x490);
      fVar276 = *(float *)(bspline_basis0 + lVar157 + 0x494);
      fVar279 = *(float *)(bspline_basis0 + lVar157 + 0x498);
      fVar281 = *(float *)(bspline_basis0 + lVar157 + 0x49c);
      auVar149 = *(undefined1 (*) [28])*pauVar11;
      fVar283 = *(float *)(bspline_basis0 + lVar157 + 0x4a0);
      fVar419 = auVar270._0_4_;
      fVar427 = auVar270._4_4_;
      fVar428 = auVar270._8_4_;
      fVar429 = auVar270._12_4_;
      auVar270 = vshufps_avx(auVar316,auVar316,0x55);
      register0x00001210 = auVar270;
      _local_520 = auVar270;
      fVar162 = auVar270._0_4_;
      fVar183 = auVar270._4_4_;
      fVar187 = auVar270._8_4_;
      fVar190 = auVar270._12_4_;
      auVar270 = vshufps_avx(auVar411,auVar411,0xff);
      register0x00001590 = auVar270;
      _local_e0 = auVar270;
      fVar191 = auVar270._0_4_;
      fVar305 = auVar270._4_4_;
      fVar353 = auVar270._8_4_;
      fVar354 = auVar270._12_4_;
      auVar140._8_4_ = auVar239._8_4_;
      auVar140._0_8_ = auVar239._0_8_;
      auVar140._12_4_ = auVar239._12_4_;
      auVar270 = vshufps_avx(auVar140,auVar140,0);
      register0x00001310 = auVar270;
      _local_6c0 = auVar270;
      pauVar9 = (undefined1 (*) [32])(bspline_basis0 + lVar157);
      fVar284 = *(float *)*pauVar9;
      fVar285 = *(float *)(bspline_basis0 + lVar157 + 4);
      fVar185 = *(float *)(bspline_basis0 + lVar157 + 8);
      fVar189 = *(float *)(bspline_basis0 + lVar157 + 0xc);
      fVar192 = *(float *)(bspline_basis0 + lVar157 + 0x10);
      fVar193 = *(float *)(bspline_basis0 + lVar157 + 0x14);
      fVar218 = *(float *)(bspline_basis0 + lVar157 + 0x18);
      auVar150 = *(undefined1 (*) [28])*pauVar9;
      fVar266 = auVar270._0_4_;
      fVar278 = auVar270._4_4_;
      fVar280 = auVar270._8_4_;
      fVar282 = auVar270._12_4_;
      auVar346._0_4_ = fVar266 * fVar284 + fVar419 * fVar302 + fVar194 * fVar287 + fVar340 * fVar236
      ;
      auVar346._4_4_ = fVar278 * fVar285 + fVar427 * fVar258 + fVar215 * fVar297 + fVar260 * fVar286
      ;
      auVar346._8_4_ = fVar280 * fVar185 + fVar428 * fVar262 + fVar216 * fVar298 + fVar304 * fVar256
      ;
      auVar346._12_4_ =
           fVar282 * fVar189 + fVar429 * fVar264 + fVar217 * fVar299 + fVar356 * fVar259;
      auVar346._16_4_ =
           fVar266 * fVar192 + fVar419 * fVar276 + fVar194 * fVar300 + fVar367 * fVar236;
      auVar346._20_4_ =
           fVar278 * fVar193 + fVar427 * fVar279 + fVar215 * fVar301 + fVar263 * fVar286;
      auVar346._24_4_ =
           fVar280 * fVar218 + fVar428 * fVar281 + fVar216 * fVar303 + fVar164 * fVar256;
      auVar346._28_4_ = fVar283 + fVar217 + fVar259 + 0.0;
      auVar270 = vshufps_avx(auVar140,auVar140,0x55);
      register0x000014d0 = auVar270;
      _local_1a0 = auVar270;
      fVar372 = auVar270._0_4_;
      fVar381 = auVar270._4_4_;
      fVar383 = auVar270._8_4_;
      fVar385 = auVar270._12_4_;
      auVar392._0_4_ = fVar372 * fVar284 + fVar162 * fVar302 + fVar219 * fVar287 + fVar397 * fVar340
      ;
      auVar392._4_4_ = fVar381 * fVar285 + fVar183 * fVar258 + fVar232 * fVar297 + fVar403 * fVar260
      ;
      auVar392._8_4_ = fVar383 * fVar185 + fVar187 * fVar262 + fVar233 * fVar298 + fVar405 * fVar304
      ;
      auVar392._12_4_ =
           fVar385 * fVar189 + fVar190 * fVar264 + fVar234 * fVar299 + fVar407 * fVar356;
      auVar392._16_4_ =
           fVar372 * fVar192 + fVar162 * fVar276 + fVar219 * fVar300 + fVar397 * fVar367;
      auVar392._20_4_ =
           fVar381 * fVar193 + fVar183 * fVar279 + fVar232 * fVar301 + fVar403 * fVar263;
      auVar392._24_4_ =
           fVar383 * fVar218 + fVar187 * fVar281 + fVar233 * fVar303 + fVar405 * fVar164;
      auVar392._28_4_ = fVar190 + fVar234 + 0.0 + 0.0;
      auVar270 = vpermilps_avx(auVar268,0xff);
      register0x00001490 = auVar270;
      _local_100 = auVar270;
      _local_1c0 = *pauVar9;
      auVar41 = _local_1c0;
      fVar163 = auVar270._0_4_;
      fVar184 = auVar270._4_4_;
      fVar188 = auVar270._8_4_;
      local_860._0_4_ =
           fVar163 * fVar284 + fVar191 * fVar302 + fVar328 * fVar287 + fVar340 * fVar254;
      local_860._4_4_ =
           fVar184 * fVar285 + fVar305 * fVar258 + fVar337 * fVar297 + fVar260 * fVar252;
      local_860._8_4_ =
           fVar188 * fVar185 + fVar353 * fVar262 + fVar338 * fVar298 + fVar304 * fVar235;
      local_860._12_4_ =
           auVar270._12_4_ * fVar189 +
           fVar354 * fVar264 + auVar224._12_4_ * fVar299 + fVar356 * fVar261;
      local_860._16_4_ =
           fVar163 * fVar192 + fVar191 * fVar276 + fVar328 * fVar300 + fVar367 * fVar254;
      local_860._20_4_ =
           fVar184 * fVar193 + fVar305 * fVar279 + fVar337 * fVar301 + fVar263 * fVar252;
      local_860._24_4_ =
           fVar188 * fVar218 + fVar353 * fVar281 + fVar338 * fVar303 + fVar164 * fVar235;
      local_860._28_4_ = 0;
      fVar185 = *(float *)(bspline_basis1 + lVar157 + 0x908);
      fVar189 = *(float *)(bspline_basis1 + lVar157 + 0x90c);
      fVar192 = *(float *)(bspline_basis1 + lVar157 + 0x910);
      fVar193 = *(float *)(bspline_basis1 + lVar157 + 0x914);
      fVar218 = *(float *)(bspline_basis1 + lVar157 + 0x918);
      fVar314 = *(float *)(bspline_basis1 + lVar157 + 0x91c);
      fVar237 = *(float *)(bspline_basis1 + lVar157 + 0x920);
      fVar253 = *(float *)(bspline_basis1 + lVar157 + 0xd8c);
      fVar255 = *(float *)(bspline_basis1 + lVar157 + 0xd90);
      fVar257 = *(float *)(bspline_basis1 + lVar157 + 0xd94);
      fVar165 = *(float *)(bspline_basis1 + lVar157 + 0xd98);
      fVar186 = *(float *)(bspline_basis1 + lVar157 + 0xd9c);
      fVar313 = *(float *)(bspline_basis1 + lVar157 + 0xda0);
      fVar306 = *(float *)(bspline_basis1 + lVar157 + 0xda4);
      fVar355 = *(float *)(bspline_basis1 + lVar157 + 0x484);
      fVar366 = *(float *)(bspline_basis1 + lVar157 + 0x488);
      fVar369 = *(float *)(bspline_basis1 + lVar157 + 0x48c);
      fVar371 = *(float *)(bspline_basis1 + lVar157 + 0x490);
      fVar339 = *(float *)(bspline_basis1 + lVar157 + 0x494);
      fVar315 = *(float *)(bspline_basis1 + lVar157 + 0x498);
      fVar322 = *(float *)(bspline_basis1 + lVar157 + 0x49c);
      fVar258 = fVar407 + 0.0;
      fVar323 = *(float *)(bspline_basis1 + lVar157);
      fVar324 = *(float *)(bspline_basis1 + lVar157 + 4);
      fVar325 = *(float *)(bspline_basis1 + lVar157 + 8);
      fVar326 = *(float *)(bspline_basis1 + lVar157 + 0xc);
      fVar327 = *(float *)(bspline_basis1 + lVar157 + 0x10);
      fVar341 = *(float *)(bspline_basis1 + lVar157 + 0x14);
      fVar352 = *(float *)(bspline_basis1 + lVar157 + 0x18);
      auVar271._0_4_ = fVar266 * fVar323 + fVar419 * fVar355 + fVar185 * fVar194 + fVar253 * fVar236
      ;
      auVar271._4_4_ = fVar278 * fVar324 + fVar427 * fVar366 + fVar189 * fVar215 + fVar255 * fVar286
      ;
      auVar271._8_4_ = fVar280 * fVar325 + fVar428 * fVar369 + fVar192 * fVar216 + fVar257 * fVar256
      ;
      auVar271._12_4_ =
           fVar282 * fVar326 + fVar429 * fVar371 + fVar193 * fVar217 + fVar165 * fVar259;
      auVar271._16_4_ =
           fVar266 * fVar327 + fVar419 * fVar339 + fVar218 * fVar194 + fVar186 * fVar236;
      auVar271._20_4_ =
           fVar278 * fVar341 + fVar427 * fVar315 + fVar314 * fVar215 + fVar313 * fVar286;
      auVar271._24_4_ =
           fVar280 * fVar352 + fVar428 * fVar322 + fVar237 * fVar216 + fVar306 * fVar256;
      auVar271._28_4_ = fVar354 + fVar258;
      auVar245._0_4_ = fVar372 * fVar323 + fVar162 * fVar355 + fVar185 * fVar219 + fVar397 * fVar253
      ;
      auVar245._4_4_ = fVar381 * fVar324 + fVar183 * fVar366 + fVar189 * fVar232 + fVar403 * fVar255
      ;
      auVar245._8_4_ = fVar383 * fVar325 + fVar187 * fVar369 + fVar192 * fVar233 + fVar405 * fVar257
      ;
      auVar245._12_4_ =
           fVar385 * fVar326 + fVar190 * fVar371 + fVar193 * fVar234 + fVar407 * fVar165;
      auVar245._16_4_ =
           fVar372 * fVar327 + fVar162 * fVar339 + fVar218 * fVar219 + fVar397 * fVar186;
      auVar245._20_4_ =
           fVar381 * fVar341 + fVar183 * fVar315 + fVar314 * fVar232 + fVar403 * fVar313;
      auVar245._24_4_ =
           fVar383 * fVar352 + fVar187 * fVar322 + fVar237 * fVar233 + fVar405 * fVar306;
      auVar245._28_4_ = fVar258 + fVar407 + fVar283 + 0.0;
      local_780._0_4_ =
           fVar191 * fVar355 + fVar328 * fVar185 + fVar254 * fVar253 + fVar163 * fVar323;
      local_780._4_4_ =
           fVar305 * fVar366 + fVar337 * fVar189 + fVar252 * fVar255 + fVar184 * fVar324;
      fStack_778 = fVar353 * fVar369 + fVar338 * fVar192 + fVar235 * fVar257 + fVar188 * fVar325;
      fStack_774 = fVar354 * fVar371 + auVar224._12_4_ * fVar193 + fVar261 * fVar165 +
                   auVar270._12_4_ * fVar326;
      register0x00001410 =
           fVar191 * fVar339 + fVar328 * fVar218 + fVar254 * fVar186 + fVar163 * fVar327;
      register0x00001414 =
           fVar305 * fVar315 + fVar337 * fVar314 + fVar252 * fVar313 + fVar184 * fVar341;
      register0x00001418 =
           fVar353 * fVar322 + fVar338 * fVar237 + fVar235 * fVar306 + fVar188 * fVar352;
      register0x0000141c = fVar407 + fVar261 + fVar283 + fVar258;
      _local_220 = vsubps_avx(auVar271,auVar346);
      auVar175 = vsubps_avx(auVar245,auVar392);
      _auStack_530 = auVar175._16_16_;
      fVar254 = local_220._0_4_;
      fVar235 = local_220._4_4_;
      auVar45._4_4_ = auVar392._4_4_ * fVar235;
      auVar45._0_4_ = auVar392._0_4_ * fVar254;
      fVar302 = local_220._8_4_;
      auVar45._8_4_ = auVar392._8_4_ * fVar302;
      fVar262 = local_220._12_4_;
      auVar45._12_4_ = auVar392._12_4_ * fVar262;
      fVar276 = local_220._16_4_;
      auVar45._16_4_ = auVar392._16_4_ * fVar276;
      fVar281 = local_220._20_4_;
      auVar45._20_4_ = auVar392._20_4_ * fVar281;
      fVar284 = local_220._24_4_;
      auVar45._24_4_ = auVar392._24_4_ * fVar284;
      auVar45._28_4_ = fVar258;
      fVar252 = auVar175._0_4_;
      fVar261 = auVar175._4_4_;
      auVar46._4_4_ = auVar346._4_4_ * fVar261;
      auVar46._0_4_ = auVar346._0_4_ * fVar252;
      fVar258 = auVar175._8_4_;
      auVar46._8_4_ = auVar346._8_4_ * fVar258;
      fVar264 = auVar175._12_4_;
      auVar46._12_4_ = auVar346._12_4_ * fVar264;
      fVar279 = auVar175._16_4_;
      auVar46._16_4_ = auVar346._16_4_ * fVar279;
      fVar283 = auVar175._20_4_;
      auVar46._20_4_ = auVar346._20_4_ * fVar283;
      fVar285 = auVar175._24_4_;
      auVar46._24_4_ = auVar346._24_4_ * fVar285;
      auVar46._28_4_ = auVar245._28_4_;
      auVar210 = vsubps_avx(auVar45,auVar46);
      auVar168 = vmaxps_avx(local_860,_local_780);
      auVar47._4_4_ = auVar168._4_4_ * auVar168._4_4_ * (fVar235 * fVar235 + fVar261 * fVar261);
      auVar47._0_4_ = auVar168._0_4_ * auVar168._0_4_ * (fVar254 * fVar254 + fVar252 * fVar252);
      auVar47._8_4_ = auVar168._8_4_ * auVar168._8_4_ * (fVar302 * fVar302 + fVar258 * fVar258);
      auVar47._12_4_ = auVar168._12_4_ * auVar168._12_4_ * (fVar262 * fVar262 + fVar264 * fVar264);
      auVar47._16_4_ = auVar168._16_4_ * auVar168._16_4_ * (fVar276 * fVar276 + fVar279 * fVar279);
      auVar47._20_4_ = auVar168._20_4_ * auVar168._20_4_ * (fVar281 * fVar281 + fVar283 * fVar283);
      auVar47._24_4_ = auVar168._24_4_ * auVar168._24_4_ * (fVar284 * fVar284 + fVar285 * fVar285);
      auVar47._28_4_ = auVar175._28_4_ + auVar245._28_4_;
      auVar48._4_4_ = auVar210._4_4_ * auVar210._4_4_;
      auVar48._0_4_ = auVar210._0_4_ * auVar210._0_4_;
      auVar48._8_4_ = auVar210._8_4_ * auVar210._8_4_;
      auVar48._12_4_ = auVar210._12_4_ * auVar210._12_4_;
      auVar48._16_4_ = auVar210._16_4_ * auVar210._16_4_;
      auVar48._20_4_ = auVar210._20_4_ * auVar210._20_4_;
      auVar48._24_4_ = auVar210._24_4_ * auVar210._24_4_;
      auVar48._28_4_ = auVar210._28_4_;
      auVar168 = vcmpps_avx(auVar48,auVar47,2);
      local_4c0 = (float)(int)uVar34;
      fStack_4bc = 0.0;
      fStack_4b8 = 0.0;
      fStack_4b4 = 0.0;
      auVar224 = vshufps_avx(ZEXT416((uint)local_4c0),ZEXT416((uint)local_4c0),0);
      auVar246._16_16_ = auVar224;
      auVar246._0_16_ = auVar224;
      auVar210 = vcmpps_avx(_DAT_02020f40,auVar246,1);
      auVar251 = ZEXT3264(auVar210);
      auVar141._8_4_ = auVar239._8_4_;
      auVar141._0_8_ = auVar239._0_8_;
      auVar141._12_4_ = auVar239._12_4_;
      auVar224 = vpermilps_avx(auVar141,0xaa);
      register0x00001490 = auVar224;
      _local_120 = auVar224;
      auVar270 = vpermilps_avx(auVar316,0xaa);
      register0x00001550 = auVar270;
      _local_180 = auVar270;
      auVar240 = vpermilps_avx(auVar329,0xaa);
      register0x00001590 = auVar240;
      _local_160 = auVar240;
      auVar43 = vpermilps_avx(auVar197,0xaa);
      register0x000014d0 = auVar43;
      _local_640 = auVar43;
      auVar40 = auVar210 & auVar168;
      local_840 = *(uint *)(ray + k * 4 + 0x30);
      uStack_83c = 0;
      fStack_838 = 0.0;
      fStack_834 = 0.0;
      auVar289 = ZEXT416((uint)(auVar289._0_4_ * 4.7683716e-07));
      _local_660 = auVar289;
      uStack_888 = auVar268._8_8_;
      auVar362 = local_5c0;
      auVar348 = local_5a0;
      fVar254 = fVar266;
      fVar252 = fVar278;
      fVar235 = fVar280;
      _local_690 = auVar387;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar40 >> 0x7f,0) != '\0') ||
            (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar40 >> 0xbf,0) != '\0') ||
          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar40[0x1f] < '\0') {
        local_1e0 = vandps_avx(auVar168,auVar210);
        fVar354 = auVar224._0_4_;
        fVar365 = auVar224._4_4_;
        fVar368 = auVar224._8_4_;
        fVar370 = auVar224._12_4_;
        fVar398 = auVar270._0_4_;
        fVar404 = auVar270._4_4_;
        fVar406 = auVar270._8_4_;
        fVar408 = auVar270._12_4_;
        fVar410 = auVar240._0_4_;
        fVar415 = auVar240._4_4_;
        fVar416 = auVar240._8_4_;
        fVar417 = auVar240._12_4_;
        fVar373 = auVar43._0_4_;
        fVar382 = auVar43._4_4_;
        fVar384 = auVar43._8_4_;
        fVar386 = auVar43._12_4_;
        fVar261 = auVar210._28_4_ +
                  *(float *)(bspline_basis1 + lVar157 + 0x924) +
                  *(float *)(bspline_basis1 + lVar157 + 0x4a0);
        local_200._0_4_ =
             fVar354 * fVar323 + fVar398 * fVar355 + fVar410 * fVar185 + fVar373 * fVar253;
        local_200._4_4_ =
             fVar365 * fVar324 + fVar404 * fVar366 + fVar415 * fVar189 + fVar382 * fVar255;
        fStack_1f8 = fVar368 * fVar325 + fVar406 * fVar369 + fVar416 * fVar192 + fVar384 * fVar257;
        fStack_1f4 = fVar370 * fVar326 + fVar408 * fVar371 + fVar417 * fVar193 + fVar386 * fVar165;
        fStack_1f0 = fVar354 * fVar327 + fVar398 * fVar339 + fVar410 * fVar218 + fVar373 * fVar186;
        fStack_1ec = fVar365 * fVar341 + fVar404 * fVar315 + fVar415 * fVar314 + fVar382 * fVar313;
        fStack_1e8 = fVar368 * fVar352 + fVar406 * fVar322 + fVar416 * fVar237 + fVar384 * fVar306;
        fStack_1e4 = local_1e0._28_4_ + fVar261;
        local_1c0._0_4_ = auVar150._0_4_;
        local_1c0._4_4_ = auVar150._4_4_;
        fStack_1b8 = auVar150._8_4_;
        fStack_1b4 = auVar150._12_4_;
        fStack_1b0 = auVar150._16_4_;
        fStack_1ac = auVar150._20_4_;
        fStack_1a8 = auVar150._24_4_;
        local_4a0._0_4_ = auVar149._0_4_;
        local_4a0._4_4_ = auVar149._4_4_;
        fStack_498 = auVar149._8_4_;
        fStack_494 = auVar149._12_4_;
        fStack_490 = auVar149._16_4_;
        fStack_48c = auVar149._20_4_;
        fStack_488 = auVar149._24_4_;
        fVar163 = fVar354 * (float)local_1c0._0_4_ +
                  fVar398 * (float)local_4a0._0_4_ + fVar410 * fVar287 + fVar373 * fVar340;
        fVar184 = fVar365 * (float)local_1c0._4_4_ +
                  fVar404 * (float)local_4a0._4_4_ + fVar415 * fVar297 + fVar382 * fVar260;
        fVar188 = fVar368 * fStack_1b8 +
                  fVar406 * fStack_498 + fVar416 * fVar298 + fVar384 * fVar304;
        fVar191 = fVar370 * fStack_1b4 +
                  fVar408 * fStack_494 + fVar417 * fVar299 + fVar386 * fVar356;
        fStack_710 = fVar354 * fStack_1b0 +
                     fVar398 * fStack_490 + fVar410 * fVar300 + fVar373 * fVar367;
        fStack_70c = fVar365 * fStack_1ac +
                     fVar404 * fStack_48c + fVar415 * fVar301 + fVar382 * fVar263;
        fStack_708 = fVar368 * fStack_1a8 +
                     fVar406 * fStack_488 + fVar416 * fVar303 + fVar384 * fVar164;
        fStack_704 = fStack_1e4 + fVar261 + local_1e0._28_4_ + auVar210._28_4_;
        fVar261 = *(float *)(bspline_basis0 + lVar157 + 0x1210);
        fVar302 = *(float *)(bspline_basis0 + lVar157 + 0x1214);
        fVar258 = *(float *)(bspline_basis0 + lVar157 + 0x1218);
        fVar262 = *(float *)(bspline_basis0 + lVar157 + 0x121c);
        fVar264 = *(float *)(bspline_basis0 + lVar157 + 0x1220);
        fVar276 = *(float *)(bspline_basis0 + lVar157 + 0x1224);
        fVar279 = *(float *)(bspline_basis0 + lVar157 + 0x1228);
        fVar281 = *(float *)(bspline_basis0 + lVar157 + 0x1694);
        fVar283 = *(float *)(bspline_basis0 + lVar157 + 0x1698);
        fVar284 = *(float *)(bspline_basis0 + lVar157 + 0x169c);
        fVar285 = *(float *)(bspline_basis0 + lVar157 + 0x16a0);
        fVar287 = *(float *)(bspline_basis0 + lVar157 + 0x16a4);
        fVar297 = *(float *)(bspline_basis0 + lVar157 + 0x16a8);
        fVar298 = *(float *)(bspline_basis0 + lVar157 + 0x16ac);
        fVar299 = *(float *)(bspline_basis0 + lVar157 + 0x1b18);
        fVar300 = *(float *)(bspline_basis0 + lVar157 + 0x1b1c);
        fVar301 = *(float *)(bspline_basis0 + lVar157 + 0x1b20);
        fVar303 = *(float *)(bspline_basis0 + lVar157 + 0x1b24);
        fVar340 = *(float *)(bspline_basis0 + lVar157 + 0x1b28);
        fVar260 = *(float *)(bspline_basis0 + lVar157 + 0x1b2c);
        fVar304 = *(float *)(bspline_basis0 + lVar157 + 0x1b30);
        fVar356 = *(float *)(bspline_basis0 + lVar157 + 0x1f9c);
        fVar367 = *(float *)(bspline_basis0 + lVar157 + 0x1fa0);
        fVar263 = *(float *)(bspline_basis0 + lVar157 + 0x1fa4);
        fVar164 = *(float *)(bspline_basis0 + lVar157 + 0x1fa8);
        fVar185 = *(float *)(bspline_basis0 + lVar157 + 0x1fac);
        fVar189 = *(float *)(bspline_basis0 + lVar157 + 0x1fb0);
        fVar192 = *(float *)(bspline_basis0 + lVar157 + 0x1fb4);
        fVar305 = *(float *)(bspline_basis1 + lVar157 + 0x4a0) + 0.0;
        fVar193 = *(float *)(bspline_basis0 + lVar157 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar157 + 0x1fb8);
        fVar353 = auVar392._28_4_ + 0.0 + fVar305;
        auVar204._0_4_ =
             fVar219 * fVar299 + fVar397 * fVar356 + fVar162 * fVar281 + fVar372 * fVar261;
        auVar204._4_4_ =
             fVar232 * fVar300 + fVar403 * fVar367 + fVar183 * fVar283 + fVar381 * fVar302;
        auVar204._8_4_ =
             fVar233 * fVar301 + fVar405 * fVar263 + fVar187 * fVar284 + fVar383 * fVar258;
        auVar204._12_4_ =
             fVar234 * fVar303 + fVar407 * fVar164 + fVar190 * fVar285 + fVar385 * fVar262;
        auVar204._16_4_ =
             fVar219 * fVar340 + fVar397 * fVar185 + fVar162 * fVar287 + fVar372 * fVar264;
        auVar204._20_4_ =
             fVar232 * fVar260 + fVar403 * fVar189 + fVar183 * fVar297 + fVar381 * fVar276;
        auVar204._24_4_ =
             fVar233 * fVar304 + fVar405 * fVar192 + fVar187 * fVar298 + fVar383 * fVar279;
        auVar204._28_4_ = fVar353 + fVar193;
        auVar421._0_4_ =
             fVar398 * fVar281 + fVar410 * fVar299 + fVar373 * fVar356 + fVar354 * fVar261;
        auVar421._4_4_ =
             fVar404 * fVar283 + fVar415 * fVar300 + fVar382 * fVar367 + fVar365 * fVar302;
        auVar421._8_4_ =
             fVar406 * fVar284 + fVar416 * fVar301 + fVar384 * fVar263 + fVar368 * fVar258;
        auVar421._12_4_ =
             fVar408 * fVar285 + fVar417 * fVar303 + fVar386 * fVar164 + fVar370 * fVar262;
        auVar421._16_4_ =
             fVar398 * fVar287 + fVar410 * fVar340 + fVar373 * fVar185 + fVar354 * fVar264;
        auVar421._20_4_ =
             fVar404 * fVar297 + fVar415 * fVar260 + fVar382 * fVar189 + fVar365 * fVar276;
        auVar421._24_4_ =
             fVar406 * fVar298 + fVar416 * fVar304 + fVar384 * fVar192 + fVar368 * fVar279;
        auVar421._28_4_ =
             *(float *)(bspline_basis0 + lVar157 + 0x16b0) + fVar193 +
             *(float *)(bspline_basis0 + lVar157 + 0x122c);
        fVar193 = *(float *)(bspline_basis1 + lVar157 + 0x1b18);
        fVar218 = *(float *)(bspline_basis1 + lVar157 + 0x1b1c);
        fVar314 = *(float *)(bspline_basis1 + lVar157 + 0x1b20);
        fVar237 = *(float *)(bspline_basis1 + lVar157 + 0x1b24);
        fVar253 = *(float *)(bspline_basis1 + lVar157 + 0x1b28);
        fVar255 = *(float *)(bspline_basis1 + lVar157 + 0x1b2c);
        fVar257 = *(float *)(bspline_basis1 + lVar157 + 0x1b30);
        fVar165 = *(float *)(bspline_basis1 + lVar157 + 0x1f9c);
        fVar186 = *(float *)(bspline_basis1 + lVar157 + 0x1fa0);
        fVar313 = *(float *)(bspline_basis1 + lVar157 + 0x1fa4);
        fVar306 = *(float *)(bspline_basis1 + lVar157 + 0x1fa8);
        fVar355 = *(float *)(bspline_basis1 + lVar157 + 0x1fac);
        fVar366 = *(float *)(bspline_basis1 + lVar157 + 0x1fb0);
        fVar369 = *(float *)(bspline_basis1 + lVar157 + 0x1fb4);
        fVar371 = *(float *)(bspline_basis1 + lVar157 + 0x1694);
        fVar339 = *(float *)(bspline_basis1 + lVar157 + 0x1698);
        fVar315 = *(float *)(bspline_basis1 + lVar157 + 0x169c);
        fVar322 = *(float *)(bspline_basis1 + lVar157 + 0x16a0);
        fVar323 = *(float *)(bspline_basis1 + lVar157 + 0x16a4);
        fVar324 = *(float *)(bspline_basis1 + lVar157 + 0x16a8);
        fVar325 = *(float *)(bspline_basis1 + lVar157 + 0x16ac);
        fVar326 = *(float *)(bspline_basis1 + lVar157 + 0x1210);
        fVar327 = *(float *)(bspline_basis1 + lVar157 + 0x1214);
        fVar341 = *(float *)(bspline_basis1 + lVar157 + 0x1218);
        fVar352 = *(float *)(bspline_basis1 + lVar157 + 0x121c);
        fVar328 = *(float *)(bspline_basis1 + lVar157 + 0x1220);
        fVar337 = *(float *)(bspline_basis1 + lVar157 + 0x1224);
        fVar338 = *(float *)(bspline_basis1 + lVar157 + 0x1228);
        auVar309._0_4_ =
             fVar266 * fVar326 + fVar419 * fVar371 + fVar194 * fVar193 + fVar236 * fVar165;
        auVar309._4_4_ =
             fVar278 * fVar327 + fVar427 * fVar339 + fVar215 * fVar218 + fVar286 * fVar186;
        auVar309._8_4_ =
             fVar280 * fVar341 + fVar428 * fVar315 + fVar216 * fVar314 + fVar256 * fVar313;
        auVar309._12_4_ =
             fVar282 * fVar352 + fVar429 * fVar322 + fVar217 * fVar237 + fVar259 * fVar306;
        auVar309._16_4_ =
             fVar266 * fVar328 + fVar419 * fVar323 + fVar194 * fVar253 + fVar236 * fVar355;
        auVar309._20_4_ =
             fVar278 * fVar337 + fVar427 * fVar324 + fVar215 * fVar255 + fVar286 * fVar366;
        auVar309._24_4_ =
             fVar280 * fVar338 + fVar428 * fVar325 + fVar216 * fVar257 + fVar256 * fVar369;
        auVar309._28_4_ = fVar370 + fVar370 + fVar353 + fVar259;
        auVar347._0_4_ =
             fVar372 * fVar326 + fVar371 * fVar162 + fVar219 * fVar193 + fVar397 * fVar165;
        auVar347._4_4_ =
             fVar381 * fVar327 + fVar339 * fVar183 + fVar232 * fVar218 + fVar403 * fVar186;
        auVar347._8_4_ =
             fVar383 * fVar341 + fVar315 * fVar187 + fVar233 * fVar314 + fVar405 * fVar313;
        auVar347._12_4_ =
             fVar385 * fVar352 + fVar322 * fVar190 + fVar234 * fVar237 + fVar407 * fVar306;
        auVar347._16_4_ =
             fVar372 * fVar328 + fVar323 * fVar162 + fVar219 * fVar253 + fVar397 * fVar355;
        auVar347._20_4_ =
             fVar381 * fVar337 + fVar324 * fVar183 + fVar232 * fVar255 + fVar403 * fVar366;
        auVar347._24_4_ =
             fVar383 * fVar338 + fVar325 * fVar187 + fVar233 * fVar257 + fVar405 * fVar369;
        auVar347._28_4_ = fVar370 + fVar370 + fVar370 + fVar353;
        auVar231._0_4_ =
             fVar354 * fVar326 + fVar398 * fVar371 + fVar410 * fVar193 + fVar373 * fVar165;
        auVar231._4_4_ =
             fVar365 * fVar327 + fVar404 * fVar339 + fVar415 * fVar218 + fVar382 * fVar186;
        auVar231._8_4_ =
             fVar368 * fVar341 + fVar406 * fVar315 + fVar416 * fVar314 + fVar384 * fVar313;
        auVar231._12_4_ =
             fVar370 * fVar352 + fVar408 * fVar322 + fVar417 * fVar237 + fVar386 * fVar306;
        auVar231._16_4_ =
             fVar354 * fVar328 + fVar398 * fVar323 + fVar410 * fVar253 + fVar373 * fVar355;
        auVar231._20_4_ =
             fVar365 * fVar337 + fVar404 * fVar324 + fVar415 * fVar255 + fVar382 * fVar366;
        auVar231._24_4_ =
             fVar368 * fVar338 + fVar406 * fVar325 + fVar416 * fVar257 + fVar384 * fVar369;
        auVar231._28_4_ =
             *(float *)(bspline_basis1 + lVar157 + 0x122c) +
             *(float *)(bspline_basis1 + lVar157 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar157 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar157 + 0x1fb8);
        auVar272._8_4_ = 0x7fffffff;
        auVar272._0_8_ = 0x7fffffff7fffffff;
        auVar272._12_4_ = 0x7fffffff;
        auVar272._16_4_ = 0x7fffffff;
        auVar272._20_4_ = 0x7fffffff;
        auVar272._24_4_ = 0x7fffffff;
        auVar272._28_4_ = 0x7fffffff;
        auVar144._4_4_ =
             fVar278 * fVar302 + fVar427 * fVar283 + fVar215 * fVar300 + fVar286 * fVar367;
        auVar144._0_4_ =
             fVar266 * fVar261 + fVar419 * fVar281 + fVar194 * fVar299 + fVar236 * fVar356;
        auVar144._8_4_ =
             fVar280 * fVar258 + fVar428 * fVar284 + fVar216 * fVar301 + fVar256 * fVar263;
        auVar144._12_4_ =
             fVar282 * fVar262 + fVar429 * fVar285 + fVar217 * fVar303 + fVar259 * fVar164;
        auVar144._16_4_ =
             fVar266 * fVar264 + fVar419 * fVar287 + fVar194 * fVar340 + fVar236 * fVar185;
        auVar144._20_4_ =
             fVar278 * fVar276 + fVar427 * fVar297 + fVar215 * fVar260 + fVar286 * fVar189;
        auVar144._24_4_ =
             fVar280 * fVar279 + fVar428 * fVar298 + fVar216 * fVar304 + fVar256 * fVar192;
        auVar144._28_4_ =
             *(float *)(bspline_basis0 + lVar157 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar157 + 0x1fb8) + fVar305;
        auVar168 = vandps_avx(auVar144,auVar272);
        auVar210 = vandps_avx(auVar204,auVar272);
        auVar210 = vmaxps_avx(auVar168,auVar210);
        auVar168 = vandps_avx(auVar421,auVar272);
        auVar168 = vmaxps_avx(auVar210,auVar168);
        auVar289 = vpermilps_avx(auVar289,0);
        auVar291._16_16_ = auVar289;
        auVar291._0_16_ = auVar289;
        auVar168 = vcmpps_avx(auVar168,auVar291,1);
        auVar40 = vblendvps_avx(auVar144,_local_220,auVar168);
        auVar362 = vblendvps_avx(auVar204,auVar175,auVar168);
        auVar168 = vandps_avx(auVar309,auVar272);
        auVar210 = vandps_avx(auVar347,auVar272);
        auVar348 = vmaxps_avx(auVar168,auVar210);
        auVar168 = vandps_avx(auVar231,auVar272);
        auVar168 = vmaxps_avx(auVar348,auVar168);
        auVar348 = vcmpps_avx(auVar168,auVar291,1);
        auVar168 = vblendvps_avx(auVar309,_local_220,auVar348);
        auVar175 = vblendvps_avx(auVar347,auVar175,auVar348);
        fVar164 = auVar40._0_4_;
        fVar185 = auVar40._4_4_;
        fVar189 = auVar40._8_4_;
        fVar192 = auVar40._12_4_;
        fVar193 = auVar40._16_4_;
        fVar218 = auVar40._20_4_;
        fVar314 = auVar40._24_4_;
        fVar306 = -auVar40._28_4_;
        fVar237 = auVar168._0_4_;
        fVar253 = auVar168._4_4_;
        fVar255 = auVar168._8_4_;
        fVar257 = auVar168._12_4_;
        fVar165 = auVar168._16_4_;
        fVar186 = auVar168._20_4_;
        fVar313 = auVar168._24_4_;
        fVar236 = auVar362._0_4_;
        fVar302 = auVar362._4_4_;
        fVar264 = auVar362._8_4_;
        fVar283 = auVar362._12_4_;
        fVar297 = auVar362._16_4_;
        fVar301 = auVar362._20_4_;
        fVar304 = auVar362._24_4_;
        auVar171._0_4_ = fVar236 * fVar236 + fVar164 * fVar164;
        auVar171._4_4_ = fVar302 * fVar302 + fVar185 * fVar185;
        auVar171._8_4_ = fVar264 * fVar264 + fVar189 * fVar189;
        auVar171._12_4_ = fVar283 * fVar283 + fVar192 * fVar192;
        auVar171._16_4_ = fVar297 * fVar297 + fVar193 * fVar193;
        auVar171._20_4_ = fVar301 * fVar301 + fVar218 * fVar218;
        auVar171._24_4_ = fVar304 * fVar304 + fVar314 * fVar314;
        auVar171._28_4_ = auVar347._28_4_ + auVar40._28_4_;
        auVar40 = vrsqrtps_avx(auVar171);
        fVar286 = auVar40._0_4_;
        fVar261 = auVar40._4_4_;
        auVar49._4_4_ = fVar261 * 1.5;
        auVar49._0_4_ = fVar286 * 1.5;
        fVar256 = auVar40._8_4_;
        auVar49._8_4_ = fVar256 * 1.5;
        fVar258 = auVar40._12_4_;
        auVar49._12_4_ = fVar258 * 1.5;
        fVar259 = auVar40._16_4_;
        auVar49._16_4_ = fVar259 * 1.5;
        fVar262 = auVar40._20_4_;
        auVar49._20_4_ = fVar262 * 1.5;
        fVar276 = auVar40._24_4_;
        fStack_724 = auVar210._28_4_;
        auVar49._24_4_ = fVar276 * 1.5;
        auVar49._28_4_ = fStack_724;
        auVar50._4_4_ = fVar261 * fVar261 * fVar261 * auVar171._4_4_ * 0.5;
        auVar50._0_4_ = fVar286 * fVar286 * fVar286 * auVar171._0_4_ * 0.5;
        auVar50._8_4_ = fVar256 * fVar256 * fVar256 * auVar171._8_4_ * 0.5;
        auVar50._12_4_ = fVar258 * fVar258 * fVar258 * auVar171._12_4_ * 0.5;
        auVar50._16_4_ = fVar259 * fVar259 * fVar259 * auVar171._16_4_ * 0.5;
        auVar50._20_4_ = fVar262 * fVar262 * fVar262 * auVar171._20_4_ * 0.5;
        auVar50._24_4_ = fVar276 * fVar276 * fVar276 * auVar171._24_4_ * 0.5;
        auVar50._28_4_ = auVar171._28_4_;
        auVar210 = vsubps_avx(auVar49,auVar50);
        fVar286 = auVar210._0_4_;
        fVar258 = auVar210._4_4_;
        fVar276 = auVar210._8_4_;
        fVar284 = auVar210._12_4_;
        fVar298 = auVar210._16_4_;
        fVar303 = auVar210._20_4_;
        fVar356 = auVar210._24_4_;
        fVar261 = auVar175._0_4_;
        fVar259 = auVar175._4_4_;
        fVar279 = auVar175._8_4_;
        fVar285 = auVar175._12_4_;
        fVar299 = auVar175._16_4_;
        fVar340 = auVar175._20_4_;
        fVar367 = auVar175._24_4_;
        auVar172._0_4_ = fVar261 * fVar261 + fVar237 * fVar237;
        auVar172._4_4_ = fVar259 * fVar259 + fVar253 * fVar253;
        auVar172._8_4_ = fVar279 * fVar279 + fVar255 * fVar255;
        auVar172._12_4_ = fVar285 * fVar285 + fVar257 * fVar257;
        auVar172._16_4_ = fVar299 * fVar299 + fVar165 * fVar165;
        auVar172._20_4_ = fVar340 * fVar340 + fVar186 * fVar186;
        auVar172._24_4_ = fVar367 * fVar367 + fVar313 * fVar313;
        auVar172._28_4_ = auVar168._28_4_ + auVar210._28_4_;
        auVar168 = vrsqrtps_avx(auVar172);
        fVar256 = auVar168._0_4_;
        fVar262 = auVar168._4_4_;
        auVar51._4_4_ = fVar262 * 1.5;
        auVar51._0_4_ = fVar256 * 1.5;
        fVar281 = auVar168._8_4_;
        auVar51._8_4_ = fVar281 * 1.5;
        fVar287 = auVar168._12_4_;
        auVar51._12_4_ = fVar287 * 1.5;
        fVar300 = auVar168._16_4_;
        auVar51._16_4_ = fVar300 * 1.5;
        fVar260 = auVar168._20_4_;
        auVar51._20_4_ = fVar260 * 1.5;
        fVar263 = auVar168._24_4_;
        auVar51._24_4_ = fVar263 * 1.5;
        auVar51._28_4_ = fStack_724;
        auVar52._4_4_ = fVar262 * fVar262 * fVar262 * auVar172._4_4_ * 0.5;
        auVar52._0_4_ = fVar256 * fVar256 * fVar256 * auVar172._0_4_ * 0.5;
        auVar52._8_4_ = fVar281 * fVar281 * fVar281 * auVar172._8_4_ * 0.5;
        auVar52._12_4_ = fVar287 * fVar287 * fVar287 * auVar172._12_4_ * 0.5;
        auVar52._16_4_ = fVar300 * fVar300 * fVar300 * auVar172._16_4_ * 0.5;
        auVar52._20_4_ = fVar260 * fVar260 * fVar260 * auVar172._20_4_ * 0.5;
        auVar52._24_4_ = fVar263 * fVar263 * fVar263 * auVar172._24_4_ * 0.5;
        auVar52._28_4_ = auVar172._28_4_;
        auVar168 = vsubps_avx(auVar51,auVar52);
        fVar256 = auVar168._0_4_;
        fVar262 = auVar168._4_4_;
        fVar281 = auVar168._8_4_;
        fVar287 = auVar168._12_4_;
        fVar300 = auVar168._16_4_;
        fVar260 = auVar168._20_4_;
        fVar263 = auVar168._24_4_;
        fVar355 = (float)local_860._0_4_ * fVar236 * fVar286;
        fVar366 = local_860._4_4_ * fVar302 * fVar258;
        auVar53._4_4_ = fVar366;
        auVar53._0_4_ = fVar355;
        fVar369 = local_860._8_4_ * fVar264 * fVar276;
        auVar53._8_4_ = fVar369;
        fVar371 = local_860._12_4_ * fVar283 * fVar284;
        auVar53._12_4_ = fVar371;
        fStack_730 = local_860._16_4_ * fVar297 * fVar298;
        auVar53._16_4_ = fStack_730;
        fStack_72c = local_860._20_4_ * fVar301 * fVar303;
        auVar53._20_4_ = fStack_72c;
        fStack_728 = local_860._24_4_ * fVar304 * fVar356;
        auVar53._24_4_ = fStack_728;
        auVar53._28_4_ = fStack_724;
        fStack_730 = fStack_730 + auVar346._16_4_;
        fStack_72c = fStack_72c + auVar346._20_4_;
        fStack_728 = fStack_728 + auVar346._24_4_;
        fStack_724 = fStack_724 + auVar346._28_4_;
        fVar236 = (float)local_860._0_4_ * fVar286 * -fVar164;
        fVar302 = local_860._4_4_ * fVar258 * -fVar185;
        auVar54._4_4_ = fVar302;
        auVar54._0_4_ = fVar236;
        fVar264 = local_860._8_4_ * fVar276 * -fVar189;
        auVar54._8_4_ = fVar264;
        fVar283 = local_860._12_4_ * fVar284 * -fVar192;
        auVar54._12_4_ = fVar283;
        fVar297 = local_860._16_4_ * fVar298 * -fVar193;
        auVar54._16_4_ = fVar297;
        fVar301 = local_860._20_4_ * fVar303 * -fVar218;
        auVar54._20_4_ = fVar301;
        fVar304 = local_860._24_4_ * fVar356 * -fVar314;
        auVar54._24_4_ = fVar304;
        auVar54._28_4_ = fVar306;
        local_540._4_4_ = auVar392._4_4_ + fVar302;
        local_540._0_4_ = auVar392._0_4_ + fVar236;
        fStack_538 = auVar392._8_4_ + fVar264;
        fStack_534 = auVar392._12_4_ + fVar283;
        auStack_530._0_4_ = auVar392._16_4_ + fVar297;
        auStack_530._4_4_ = auVar392._20_4_ + fVar301;
        fStack_528 = auVar392._24_4_ + fVar304;
        fStack_524 = auVar392._28_4_ + fVar306;
        fVar236 = fVar286 * 0.0 * (float)local_860._0_4_;
        fVar286 = fVar258 * 0.0 * local_860._4_4_;
        auVar55._4_4_ = fVar286;
        auVar55._0_4_ = fVar236;
        fVar302 = fVar276 * 0.0 * local_860._8_4_;
        auVar55._8_4_ = fVar302;
        fVar258 = fVar284 * 0.0 * local_860._12_4_;
        auVar55._12_4_ = fVar258;
        fVar264 = fVar298 * 0.0 * local_860._16_4_;
        auVar55._16_4_ = fVar264;
        fVar276 = fVar303 * 0.0 * local_860._20_4_;
        auVar55._20_4_ = fVar276;
        fVar283 = fVar356 * 0.0 * local_860._24_4_;
        auVar55._24_4_ = fVar283;
        auVar55._28_4_ = fVar408;
        auVar146._4_4_ = fVar184;
        auVar146._0_4_ = fVar163;
        auVar146._8_4_ = fVar188;
        auVar146._12_4_ = fVar191;
        auVar146._16_4_ = fStack_710;
        auVar146._20_4_ = fStack_70c;
        auVar146._24_4_ = fStack_708;
        auVar146._28_4_ = fStack_704;
        auVar310._0_4_ = fVar163 + fVar236;
        auVar310._4_4_ = fVar184 + fVar286;
        auVar310._8_4_ = fVar188 + fVar302;
        auVar310._12_4_ = fVar191 + fVar258;
        auVar310._16_4_ = fStack_710 + fVar264;
        auVar310._20_4_ = fStack_70c + fVar276;
        auVar310._24_4_ = fStack_708 + fVar283;
        auVar310._28_4_ = fStack_704 + fVar408;
        fVar236 = (float)local_780._0_4_ * fVar261 * fVar256;
        fVar286 = (float)local_780._4_4_ * fVar259 * fVar262;
        auVar56._4_4_ = fVar286;
        auVar56._0_4_ = fVar236;
        fVar261 = fStack_778 * fVar279 * fVar281;
        auVar56._8_4_ = fVar261;
        fVar302 = fStack_774 * fVar285 * fVar287;
        auVar56._12_4_ = fVar302;
        fVar258 = register0x00001410 * fVar299 * fVar300;
        auVar56._16_4_ = fVar258;
        fVar259 = register0x00001414 * fVar340 * fVar260;
        auVar56._20_4_ = fVar259;
        fVar264 = register0x00001418 * fVar367 * fVar263;
        auVar56._24_4_ = fVar264;
        auVar56._28_4_ = auVar175._28_4_;
        auVar42 = vsubps_avx(auVar346,auVar53);
        auVar361._0_4_ = auVar271._0_4_ + fVar236;
        auVar361._4_4_ = auVar271._4_4_ + fVar286;
        auVar361._8_4_ = auVar271._8_4_ + fVar261;
        auVar361._12_4_ = auVar271._12_4_ + fVar302;
        auVar361._16_4_ = auVar271._16_4_ + fVar258;
        auVar361._20_4_ = auVar271._20_4_ + fVar259;
        auVar361._24_4_ = auVar271._24_4_ + fVar264;
        auVar361._28_4_ = auVar271._28_4_ + auVar175._28_4_;
        fVar236 = (float)local_780._0_4_ * fVar256 * -fVar237;
        fVar286 = (float)local_780._4_4_ * fVar262 * -fVar253;
        auVar57._4_4_ = fVar286;
        auVar57._0_4_ = fVar236;
        fVar261 = fStack_778 * fVar281 * -fVar255;
        auVar57._8_4_ = fVar261;
        fVar302 = fStack_774 * fVar287 * -fVar257;
        auVar57._12_4_ = fVar302;
        fVar258 = register0x00001410 * fVar300 * -fVar165;
        auVar57._16_4_ = fVar258;
        fVar259 = register0x00001414 * fVar260 * -fVar186;
        auVar57._20_4_ = fVar259;
        fVar264 = register0x00001418 * fVar263 * -fVar313;
        auVar57._24_4_ = fVar264;
        auVar57._28_4_ = fVar417;
        auVar424 = vsubps_avx(auVar392,auVar54);
        auVar379._0_4_ = fVar236 + auVar245._0_4_;
        auVar379._4_4_ = fVar286 + auVar245._4_4_;
        auVar379._8_4_ = fVar261 + auVar245._8_4_;
        auVar379._12_4_ = fVar302 + auVar245._12_4_;
        auVar379._16_4_ = fVar258 + auVar245._16_4_;
        auVar379._20_4_ = fVar259 + auVar245._20_4_;
        auVar379._24_4_ = fVar264 + auVar245._24_4_;
        auVar379._28_4_ = fVar417 + auVar245._28_4_;
        fVar236 = fVar256 * 0.0 * (float)local_780._0_4_;
        fVar286 = fVar262 * 0.0 * (float)local_780._4_4_;
        auVar58._4_4_ = fVar286;
        auVar58._0_4_ = fVar236;
        fVar261 = fVar281 * 0.0 * fStack_778;
        auVar58._8_4_ = fVar261;
        fVar256 = fVar287 * 0.0 * fStack_774;
        auVar58._12_4_ = fVar256;
        fVar302 = fVar300 * 0.0 * register0x00001410;
        auVar58._16_4_ = fVar302;
        fVar258 = fVar260 * 0.0 * register0x00001414;
        auVar58._20_4_ = fVar258;
        fVar259 = fVar263 * 0.0 * register0x00001418;
        auVar58._24_4_ = fVar259;
        auVar58._28_4_ = fVar306;
        auVar44 = vsubps_avx(auVar146,auVar55);
        auVar422._0_4_ = (float)local_200._0_4_ + fVar236;
        auVar422._4_4_ = (float)local_200._4_4_ + fVar286;
        auVar422._8_4_ = fStack_1f8 + fVar261;
        auVar422._12_4_ = fStack_1f4 + fVar256;
        auVar422._16_4_ = fStack_1f0 + fVar302;
        auVar422._20_4_ = fStack_1ec + fVar258;
        auVar422._24_4_ = fStack_1e8 + fVar259;
        auVar422._28_4_ = fStack_1e4 + fVar306;
        auVar168 = vsubps_avx(auVar271,auVar56);
        auVar210 = vsubps_avx(auVar245,auVar57);
        auVar175 = vsubps_avx(_local_200,auVar58);
        auVar40 = vsubps_avx(auVar379,auVar424);
        auVar362 = vsubps_avx(auVar422,auVar44);
        auVar59._4_4_ = auVar44._4_4_ * auVar40._4_4_;
        auVar59._0_4_ = auVar44._0_4_ * auVar40._0_4_;
        auVar59._8_4_ = auVar44._8_4_ * auVar40._8_4_;
        auVar59._12_4_ = auVar44._12_4_ * auVar40._12_4_;
        auVar59._16_4_ = auVar44._16_4_ * auVar40._16_4_;
        auVar59._20_4_ = auVar44._20_4_ * auVar40._20_4_;
        auVar59._24_4_ = auVar44._24_4_ * auVar40._24_4_;
        auVar59._28_4_ = fVar417;
        auVar60._4_4_ = auVar424._4_4_ * auVar362._4_4_;
        auVar60._0_4_ = auVar424._0_4_ * auVar362._0_4_;
        auVar60._8_4_ = auVar424._8_4_ * auVar362._8_4_;
        auVar60._12_4_ = auVar424._12_4_ * auVar362._12_4_;
        auVar60._16_4_ = auVar424._16_4_ * auVar362._16_4_;
        auVar60._20_4_ = auVar424._20_4_ * auVar362._20_4_;
        auVar60._24_4_ = auVar424._24_4_ * auVar362._24_4_;
        auVar60._28_4_ = auVar245._28_4_;
        auVar348 = vsubps_avx(auVar60,auVar59);
        auVar61._4_4_ = auVar42._4_4_ * auVar362._4_4_;
        auVar61._0_4_ = auVar42._0_4_ * auVar362._0_4_;
        auVar61._8_4_ = auVar42._8_4_ * auVar362._8_4_;
        auVar61._12_4_ = auVar42._12_4_ * auVar362._12_4_;
        auVar61._16_4_ = auVar42._16_4_ * auVar362._16_4_;
        auVar61._20_4_ = auVar42._20_4_ * auVar362._20_4_;
        auVar61._24_4_ = auVar42._24_4_ * auVar362._24_4_;
        auVar61._28_4_ = auVar362._28_4_;
        auVar39 = vsubps_avx(auVar361,auVar42);
        auVar62._4_4_ = auVar44._4_4_ * auVar39._4_4_;
        auVar62._0_4_ = auVar44._0_4_ * auVar39._0_4_;
        auVar62._8_4_ = auVar44._8_4_ * auVar39._8_4_;
        auVar62._12_4_ = auVar44._12_4_ * auVar39._12_4_;
        auVar62._16_4_ = auVar44._16_4_ * auVar39._16_4_;
        auVar62._20_4_ = auVar44._20_4_ * auVar39._20_4_;
        auVar62._24_4_ = auVar44._24_4_ * auVar39._24_4_;
        auVar62._28_4_ = auVar271._28_4_;
        auVar169 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar39._4_4_ * auVar424._4_4_;
        auVar63._0_4_ = auVar39._0_4_ * auVar424._0_4_;
        auVar63._8_4_ = auVar39._8_4_ * auVar424._8_4_;
        auVar63._12_4_ = auVar39._12_4_ * auVar424._12_4_;
        auVar63._16_4_ = auVar39._16_4_ * auVar424._16_4_;
        auVar63._20_4_ = auVar39._20_4_ * auVar424._20_4_;
        auVar63._24_4_ = auVar39._24_4_ * auVar424._24_4_;
        auVar63._28_4_ = auVar362._28_4_;
        auVar64._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar64._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar64._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar64._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar64._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar64._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar64._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar64._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar64,auVar63);
        auVar173._0_4_ = auVar348._0_4_ * 0.0 + auVar40._0_4_ + auVar169._0_4_ * 0.0;
        auVar173._4_4_ = auVar348._4_4_ * 0.0 + auVar40._4_4_ + auVar169._4_4_ * 0.0;
        auVar173._8_4_ = auVar348._8_4_ * 0.0 + auVar40._8_4_ + auVar169._8_4_ * 0.0;
        auVar173._12_4_ = auVar348._12_4_ * 0.0 + auVar40._12_4_ + auVar169._12_4_ * 0.0;
        auVar173._16_4_ = auVar348._16_4_ * 0.0 + auVar40._16_4_ + auVar169._16_4_ * 0.0;
        auVar173._20_4_ = auVar348._20_4_ * 0.0 + auVar40._20_4_ + auVar169._20_4_ * 0.0;
        auVar173._24_4_ = auVar348._24_4_ * 0.0 + auVar40._24_4_ + auVar169._24_4_ * 0.0;
        auVar173._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar169._28_4_;
        auVar39 = vcmpps_avx(auVar173,ZEXT432(0) << 0x20,2);
        auVar145._4_4_ = fVar366 + auVar346._4_4_;
        auVar145._0_4_ = fVar355 + auVar346._0_4_;
        auVar145._8_4_ = fVar369 + auVar346._8_4_;
        auVar145._12_4_ = fVar371 + auVar346._12_4_;
        auVar145._16_4_ = fStack_730;
        auVar145._20_4_ = fStack_72c;
        auVar145._24_4_ = fStack_728;
        auVar145._28_4_ = fStack_724;
        auVar168 = vblendvps_avx(auVar168,auVar145,auVar39);
        auVar210 = vblendvps_avx(auVar210,_local_540,auVar39);
        auVar175 = vblendvps_avx(auVar175,auVar310,auVar39);
        auVar40 = vblendvps_avx(auVar42,auVar361,auVar39);
        auVar362 = vblendvps_avx(auVar424,auVar379,auVar39);
        auVar348 = vblendvps_avx(auVar44,auVar422,auVar39);
        auVar42 = vblendvps_avx(auVar361,auVar42,auVar39);
        auVar424 = vblendvps_avx(auVar379,auVar424,auVar39);
        auVar289 = vpackssdw_avx(local_1e0._0_16_,local_1e0._16_16_);
        _auStack_7d0 = auVar346._16_16_;
        auVar44 = vblendvps_avx(auVar422,auVar44,auVar39);
        auVar42 = vsubps_avx(auVar42,auVar168);
        auVar169 = vsubps_avx(auVar424,auVar210);
        auVar44 = vsubps_avx(auVar44,auVar175);
        auVar170 = vsubps_avx(auVar210,auVar362);
        fVar236 = auVar169._0_4_;
        fVar237 = auVar175._0_4_;
        fVar258 = auVar169._4_4_;
        fVar253 = auVar175._4_4_;
        auVar65._4_4_ = fVar253 * fVar258;
        auVar65._0_4_ = fVar237 * fVar236;
        fVar279 = auVar169._8_4_;
        fVar255 = auVar175._8_4_;
        auVar65._8_4_ = fVar255 * fVar279;
        fVar287 = auVar169._12_4_;
        fVar257 = auVar175._12_4_;
        auVar65._12_4_ = fVar257 * fVar287;
        fVar301 = auVar169._16_4_;
        fVar165 = auVar175._16_4_;
        auVar65._16_4_ = fVar165 * fVar301;
        fVar356 = auVar169._20_4_;
        fVar186 = auVar175._20_4_;
        auVar65._20_4_ = fVar186 * fVar356;
        fVar189 = auVar169._24_4_;
        fVar313 = auVar175._24_4_;
        auVar65._24_4_ = fVar313 * fVar189;
        auVar65._28_4_ = auVar424._28_4_;
        fVar286 = auVar210._0_4_;
        fVar322 = auVar44._0_4_;
        fVar259 = auVar210._4_4_;
        fVar323 = auVar44._4_4_;
        auVar66._4_4_ = fVar323 * fVar259;
        auVar66._0_4_ = fVar322 * fVar286;
        fVar281 = auVar210._8_4_;
        fVar324 = auVar44._8_4_;
        auVar66._8_4_ = fVar324 * fVar281;
        fVar297 = auVar210._12_4_;
        fVar325 = auVar44._12_4_;
        auVar66._12_4_ = fVar325 * fVar297;
        fVar303 = auVar210._16_4_;
        fVar326 = auVar44._16_4_;
        auVar66._16_4_ = fVar326 * fVar303;
        fVar367 = auVar210._20_4_;
        fVar327 = auVar44._20_4_;
        auVar66._20_4_ = fVar327 * fVar367;
        fVar192 = auVar210._24_4_;
        fVar341 = auVar44._24_4_;
        auVar66._24_4_ = fVar341 * fVar192;
        auVar66._28_4_ = auVar379._28_4_;
        auVar424 = vsubps_avx(auVar66,auVar65);
        fVar261 = auVar168._0_4_;
        fVar262 = auVar168._4_4_;
        auVar67._4_4_ = fVar323 * fVar262;
        auVar67._0_4_ = fVar322 * fVar261;
        fVar283 = auVar168._8_4_;
        auVar67._8_4_ = fVar324 * fVar283;
        fVar298 = auVar168._12_4_;
        auVar67._12_4_ = fVar325 * fVar298;
        fVar340 = auVar168._16_4_;
        auVar67._16_4_ = fVar326 * fVar340;
        fVar263 = auVar168._20_4_;
        auVar67._20_4_ = fVar327 * fVar263;
        fVar193 = auVar168._24_4_;
        auVar67._24_4_ = fVar341 * fVar193;
        auVar67._28_4_ = auVar379._28_4_;
        fVar256 = auVar42._0_4_;
        auVar413._0_4_ = fVar237 * fVar256;
        fVar264 = auVar42._4_4_;
        auVar413._4_4_ = fVar253 * fVar264;
        fVar284 = auVar42._8_4_;
        auVar413._8_4_ = fVar255 * fVar284;
        fVar299 = auVar42._12_4_;
        auVar413._12_4_ = fVar257 * fVar299;
        fVar260 = auVar42._16_4_;
        auVar413._16_4_ = fVar165 * fVar260;
        fVar164 = auVar42._20_4_;
        auVar413._20_4_ = fVar186 * fVar164;
        fVar218 = auVar42._24_4_;
        auVar413._24_4_ = fVar313 * fVar218;
        auVar413._28_4_ = 0;
        auVar201 = vsubps_avx(auVar413,auVar67);
        auVar68._4_4_ = fVar259 * fVar264;
        auVar68._0_4_ = fVar286 * fVar256;
        auVar68._8_4_ = fVar281 * fVar284;
        auVar68._12_4_ = fVar297 * fVar299;
        auVar68._16_4_ = fVar303 * fVar260;
        auVar68._20_4_ = fVar367 * fVar164;
        auVar68._24_4_ = fVar192 * fVar218;
        auVar68._28_4_ = auVar379._28_4_;
        auVar69._4_4_ = fVar262 * fVar258;
        auVar69._0_4_ = fVar261 * fVar236;
        auVar69._8_4_ = fVar283 * fVar279;
        auVar69._12_4_ = fVar298 * fVar287;
        auVar69._16_4_ = fVar340 * fVar301;
        auVar69._20_4_ = fVar263 * fVar356;
        auVar69._24_4_ = fVar193 * fVar189;
        auVar69._28_4_ = auVar422._28_4_;
        auVar202 = vsubps_avx(auVar69,auVar68);
        auVar203 = vsubps_avx(auVar175,auVar348);
        fVar302 = auVar202._28_4_ + auVar201._28_4_;
        auVar205._0_4_ = auVar202._0_4_ + auVar201._0_4_ * 0.0 + auVar424._0_4_ * 0.0;
        auVar205._4_4_ = auVar202._4_4_ + auVar201._4_4_ * 0.0 + auVar424._4_4_ * 0.0;
        auVar205._8_4_ = auVar202._8_4_ + auVar201._8_4_ * 0.0 + auVar424._8_4_ * 0.0;
        auVar205._12_4_ = auVar202._12_4_ + auVar201._12_4_ * 0.0 + auVar424._12_4_ * 0.0;
        auVar205._16_4_ = auVar202._16_4_ + auVar201._16_4_ * 0.0 + auVar424._16_4_ * 0.0;
        auVar205._20_4_ = auVar202._20_4_ + auVar201._20_4_ * 0.0 + auVar424._20_4_ * 0.0;
        auVar205._24_4_ = auVar202._24_4_ + auVar201._24_4_ * 0.0 + auVar424._24_4_ * 0.0;
        auVar205._28_4_ = fVar302 + auVar424._28_4_;
        fVar306 = auVar170._0_4_;
        fVar355 = auVar170._4_4_;
        auVar70._4_4_ = fVar355 * auVar348._4_4_;
        auVar70._0_4_ = fVar306 * auVar348._0_4_;
        fVar366 = auVar170._8_4_;
        auVar70._8_4_ = fVar366 * auVar348._8_4_;
        fVar369 = auVar170._12_4_;
        auVar70._12_4_ = fVar369 * auVar348._12_4_;
        fVar371 = auVar170._16_4_;
        auVar70._16_4_ = fVar371 * auVar348._16_4_;
        fVar339 = auVar170._20_4_;
        auVar70._20_4_ = fVar339 * auVar348._20_4_;
        fVar315 = auVar170._24_4_;
        auVar70._24_4_ = fVar315 * auVar348._24_4_;
        auVar70._28_4_ = fVar302;
        fVar302 = auVar203._0_4_;
        fVar276 = auVar203._4_4_;
        auVar71._4_4_ = auVar362._4_4_ * fVar276;
        auVar71._0_4_ = auVar362._0_4_ * fVar302;
        fVar285 = auVar203._8_4_;
        auVar71._8_4_ = auVar362._8_4_ * fVar285;
        fVar300 = auVar203._12_4_;
        auVar71._12_4_ = auVar362._12_4_ * fVar300;
        fVar304 = auVar203._16_4_;
        auVar71._16_4_ = auVar362._16_4_ * fVar304;
        fVar185 = auVar203._20_4_;
        auVar71._20_4_ = auVar362._20_4_ * fVar185;
        fVar314 = auVar203._24_4_;
        auVar71._24_4_ = auVar362._24_4_ * fVar314;
        auVar71._28_4_ = auVar202._28_4_;
        auVar170 = vsubps_avx(auVar71,auVar70);
        auVar201 = vsubps_avx(auVar168,auVar40);
        fVar352 = auVar201._0_4_;
        fVar162 = auVar201._4_4_;
        auVar72._4_4_ = fVar162 * auVar348._4_4_;
        auVar72._0_4_ = fVar352 * auVar348._0_4_;
        fVar183 = auVar201._8_4_;
        auVar72._8_4_ = fVar183 * auVar348._8_4_;
        fVar187 = auVar201._12_4_;
        auVar72._12_4_ = fVar187 * auVar348._12_4_;
        fVar190 = auVar201._16_4_;
        auVar72._16_4_ = fVar190 * auVar348._16_4_;
        fVar194 = auVar201._20_4_;
        auVar72._20_4_ = fVar194 * auVar348._20_4_;
        fVar215 = auVar201._24_4_;
        auVar72._24_4_ = fVar215 * auVar348._24_4_;
        auVar72._28_4_ = auVar348._28_4_;
        auVar73._4_4_ = auVar40._4_4_ * fVar276;
        auVar73._0_4_ = auVar40._0_4_ * fVar302;
        auVar73._8_4_ = auVar40._8_4_ * fVar285;
        auVar73._12_4_ = auVar40._12_4_ * fVar300;
        auVar73._16_4_ = auVar40._16_4_ * fVar304;
        auVar73._20_4_ = auVar40._20_4_ * fVar185;
        auVar73._24_4_ = auVar40._24_4_ * fVar314;
        auVar73._28_4_ = auVar424._28_4_;
        auVar424 = vsubps_avx(auVar72,auVar73);
        auVar74._4_4_ = auVar362._4_4_ * fVar162;
        auVar74._0_4_ = auVar362._0_4_ * fVar352;
        auVar74._8_4_ = auVar362._8_4_ * fVar183;
        auVar74._12_4_ = auVar362._12_4_ * fVar187;
        auVar74._16_4_ = auVar362._16_4_ * fVar190;
        auVar74._20_4_ = auVar362._20_4_ * fVar194;
        auVar74._24_4_ = auVar362._24_4_ * fVar215;
        auVar74._28_4_ = auVar348._28_4_;
        auVar75._4_4_ = auVar40._4_4_ * fVar355;
        auVar75._0_4_ = auVar40._0_4_ * fVar306;
        auVar75._8_4_ = auVar40._8_4_ * fVar366;
        auVar75._12_4_ = auVar40._12_4_ * fVar369;
        auVar75._16_4_ = auVar40._16_4_ * fVar371;
        auVar75._20_4_ = auVar40._20_4_ * fVar339;
        auVar75._24_4_ = auVar40._24_4_ * fVar315;
        auVar75._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar75,auVar74);
        auVar214 = ZEXT864(0) << 0x20;
        auVar273._0_4_ = auVar170._0_4_ * 0.0 + auVar40._0_4_ + auVar424._0_4_ * 0.0;
        auVar273._4_4_ = auVar170._4_4_ * 0.0 + auVar40._4_4_ + auVar424._4_4_ * 0.0;
        auVar273._8_4_ = auVar170._8_4_ * 0.0 + auVar40._8_4_ + auVar424._8_4_ * 0.0;
        auVar273._12_4_ = auVar170._12_4_ * 0.0 + auVar40._12_4_ + auVar424._12_4_ * 0.0;
        auVar273._16_4_ = auVar170._16_4_ * 0.0 + auVar40._16_4_ + auVar424._16_4_ * 0.0;
        auVar273._20_4_ = auVar170._20_4_ * 0.0 + auVar40._20_4_ + auVar424._20_4_ * 0.0;
        auVar273._24_4_ = auVar170._24_4_ * 0.0 + auVar40._24_4_ + auVar424._24_4_ * 0.0;
        auVar273._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar424._28_4_;
        auVar40 = vmaxps_avx(auVar205,auVar273);
        auVar40 = vcmpps_avx(auVar40,ZEXT832(0) << 0x20,2);
        auVar224 = vpackssdw_avx(auVar40._0_16_,auVar40._16_16_);
        auVar289 = vpand_avx(auVar224,auVar289);
        auVar224 = vpmovsxwd_avx(auVar289);
        auVar270 = vpunpckhwd_avx(auVar289,auVar289);
        auVar247._16_16_ = auVar270;
        auVar247._0_16_ = auVar224;
        if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar247 >> 0x7f,0) == '\0') &&
              (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar270 >> 0x3f,0) == '\0') &&
            (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar270[0xf]) {
LAB_0122c5be:
          auVar294._8_8_ = uStack_5d8;
          auVar294._0_8_ = local_5e0;
          auVar294._16_8_ = uStack_5d0;
          auVar294._24_8_ = uStack_5c8;
          auVar425 = ZEXT3264(local_5c0);
          auVar182 = ZEXT3264(local_5a0);
          auVar251 = ZEXT3264(auVar247);
        }
        else {
          auVar76._4_4_ = fVar276 * fVar258;
          auVar76._0_4_ = fVar302 * fVar236;
          auVar76._8_4_ = fVar285 * fVar279;
          auVar76._12_4_ = fVar300 * fVar287;
          auVar76._16_4_ = fVar304 * fVar301;
          auVar76._20_4_ = fVar185 * fVar356;
          auVar76._24_4_ = fVar314 * fVar189;
          auVar76._28_4_ = auVar270._12_4_;
          auVar393._0_4_ = fVar306 * fVar322;
          auVar393._4_4_ = fVar355 * fVar323;
          auVar393._8_4_ = fVar366 * fVar324;
          auVar393._12_4_ = fVar369 * fVar325;
          auVar393._16_4_ = fVar371 * fVar326;
          auVar393._20_4_ = fVar339 * fVar327;
          auVar393._24_4_ = fVar315 * fVar341;
          auVar393._28_4_ = 0;
          auVar40 = vsubps_avx(auVar393,auVar76);
          auVar77._4_4_ = fVar162 * fVar323;
          auVar77._0_4_ = fVar352 * fVar322;
          auVar77._8_4_ = fVar183 * fVar324;
          auVar77._12_4_ = fVar187 * fVar325;
          auVar77._16_4_ = fVar190 * fVar326;
          auVar77._20_4_ = fVar194 * fVar327;
          auVar77._24_4_ = fVar215 * fVar341;
          auVar77._28_4_ = auVar44._28_4_;
          auVar78._4_4_ = fVar276 * fVar264;
          auVar78._0_4_ = fVar302 * fVar256;
          auVar78._8_4_ = fVar285 * fVar284;
          auVar78._12_4_ = fVar300 * fVar299;
          auVar78._16_4_ = fVar304 * fVar260;
          auVar78._20_4_ = fVar185 * fVar164;
          auVar78._24_4_ = fVar314 * fVar218;
          auVar78._28_4_ = auVar203._28_4_;
          auVar348 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = fVar355 * fVar264;
          auVar79._0_4_ = fVar306 * fVar256;
          auVar79._8_4_ = fVar366 * fVar284;
          auVar79._12_4_ = fVar369 * fVar299;
          auVar79._16_4_ = fVar371 * fVar260;
          auVar79._20_4_ = fVar339 * fVar164;
          auVar79._24_4_ = fVar315 * fVar218;
          auVar79._28_4_ = auVar205._28_4_;
          auVar80._4_4_ = fVar162 * fVar258;
          auVar80._0_4_ = fVar352 * fVar236;
          auVar80._8_4_ = fVar183 * fVar279;
          auVar80._12_4_ = fVar187 * fVar287;
          auVar80._16_4_ = fVar190 * fVar301;
          auVar80._20_4_ = fVar194 * fVar356;
          auVar80._24_4_ = fVar215 * fVar189;
          auVar80._28_4_ = auVar169._28_4_;
          auVar424 = vsubps_avx(auVar80,auVar79);
          auVar321._0_4_ = auVar40._0_4_ * 0.0 + auVar424._0_4_ + auVar348._0_4_ * 0.0;
          auVar321._4_4_ = auVar40._4_4_ * 0.0 + auVar424._4_4_ + auVar348._4_4_ * 0.0;
          auVar321._8_4_ = auVar40._8_4_ * 0.0 + auVar424._8_4_ + auVar348._8_4_ * 0.0;
          auVar321._12_4_ = auVar40._12_4_ * 0.0 + auVar424._12_4_ + auVar348._12_4_ * 0.0;
          auVar321._16_4_ = auVar40._16_4_ * 0.0 + auVar424._16_4_ + auVar348._16_4_ * 0.0;
          auVar321._20_4_ = auVar40._20_4_ * 0.0 + auVar424._20_4_ + auVar348._20_4_ * 0.0;
          auVar321._24_4_ = auVar40._24_4_ * 0.0 + auVar424._24_4_ + auVar348._24_4_ * 0.0;
          auVar321._28_4_ = auVar169._28_4_ + auVar424._28_4_ + auVar205._28_4_;
          auVar362 = vrcpps_avx(auVar321);
          fVar236 = auVar362._0_4_;
          fVar256 = auVar362._4_4_;
          auVar81._4_4_ = auVar321._4_4_ * fVar256;
          auVar81._0_4_ = auVar321._0_4_ * fVar236;
          fVar302 = auVar362._8_4_;
          auVar81._8_4_ = auVar321._8_4_ * fVar302;
          fVar258 = auVar362._12_4_;
          auVar81._12_4_ = auVar321._12_4_ * fVar258;
          fVar264 = auVar362._16_4_;
          auVar81._16_4_ = auVar321._16_4_ * fVar264;
          fVar276 = auVar362._20_4_;
          auVar81._20_4_ = auVar321._20_4_ * fVar276;
          fVar279 = auVar362._24_4_;
          auVar81._24_4_ = auVar321._24_4_ * fVar279;
          auVar81._28_4_ = auVar203._28_4_;
          auVar394._8_4_ = 0x3f800000;
          auVar394._0_8_ = &DAT_3f8000003f800000;
          auVar394._12_4_ = 0x3f800000;
          auVar394._16_4_ = 0x3f800000;
          auVar394._20_4_ = 0x3f800000;
          auVar394._24_4_ = 0x3f800000;
          auVar394._28_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar394,auVar81);
          fVar236 = auVar44._0_4_ * fVar236 + fVar236;
          fVar256 = auVar44._4_4_ * fVar256 + fVar256;
          fVar302 = auVar44._8_4_ * fVar302 + fVar302;
          fVar258 = auVar44._12_4_ * fVar258 + fVar258;
          fVar264 = auVar44._16_4_ * fVar264 + fVar264;
          fVar276 = auVar44._20_4_ * fVar276 + fVar276;
          fVar279 = auVar44._24_4_ * fVar279 + fVar279;
          auVar82._4_4_ =
               (auVar40._4_4_ * fVar262 + auVar348._4_4_ * fVar259 + auVar424._4_4_ * fVar253) *
               fVar256;
          auVar82._0_4_ =
               (auVar40._0_4_ * fVar261 + auVar348._0_4_ * fVar286 + auVar424._0_4_ * fVar237) *
               fVar236;
          auVar82._8_4_ =
               (auVar40._8_4_ * fVar283 + auVar348._8_4_ * fVar281 + auVar424._8_4_ * fVar255) *
               fVar302;
          auVar82._12_4_ =
               (auVar40._12_4_ * fVar298 + auVar348._12_4_ * fVar297 + auVar424._12_4_ * fVar257) *
               fVar258;
          auVar82._16_4_ =
               (auVar40._16_4_ * fVar340 + auVar348._16_4_ * fVar303 + auVar424._16_4_ * fVar165) *
               fVar264;
          auVar82._20_4_ =
               (auVar40._20_4_ * fVar263 + auVar348._20_4_ * fVar367 + auVar424._20_4_ * fVar186) *
               fVar276;
          auVar82._24_4_ =
               (auVar40._24_4_ * fVar193 + auVar348._24_4_ * fVar192 + auVar424._24_4_ * fVar313) *
               fVar279;
          auVar82._28_4_ = auVar168._28_4_ + auVar42._28_4_ + auVar175._28_4_;
          auVar224 = vpermilps_avx(ZEXT416(local_840),0);
          auVar248._16_16_ = auVar224;
          auVar248._0_16_ = auVar224;
          auVar175 = vcmpps_avx(auVar248,auVar82,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar292._4_4_ = uVar12;
          auVar292._0_4_ = uVar12;
          auVar292._8_4_ = uVar12;
          auVar292._12_4_ = uVar12;
          auVar292._16_4_ = uVar12;
          auVar292._20_4_ = uVar12;
          auVar292._24_4_ = uVar12;
          auVar292._28_4_ = uVar12;
          auVar40 = vcmpps_avx(auVar82,auVar292,2);
          auVar175 = vandps_avx(auVar40,auVar175);
          auVar224 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
          auVar289 = vpand_avx(auVar289,auVar224);
          auVar224 = vpmovsxwd_avx(auVar289);
          auVar270 = vpshufd_avx(auVar289,0xee);
          auVar270 = vpmovsxwd_avx(auVar270);
          auVar247._16_16_ = auVar270;
          auVar247._0_16_ = auVar224;
          auVar182 = ZEXT3264(local_5a0);
          auVar425 = ZEXT3264(local_5c0);
          if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar247 >> 0x7f,0) == '\0') &&
                (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar270 >> 0x3f,0) == '\0') &&
              (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar270[0xf]) goto LAB_0122c5be;
          auVar175 = vcmpps_avx(ZEXT832(0) << 0x20,auVar321,4);
          auVar224 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
          auVar289 = vpand_avx(auVar289,auVar224);
          auVar224 = vpmovsxwd_avx(auVar289);
          auVar289 = vpunpckhwd_avx(auVar289,auVar289);
          auVar251 = ZEXT1664(auVar289);
          auVar311._16_16_ = auVar289;
          auVar311._0_16_ = auVar224;
          auVar294._8_8_ = uStack_5d8;
          auVar294._0_8_ = local_5e0;
          auVar294._16_8_ = uStack_5d0;
          auVar294._24_8_ = uStack_5c8;
          if ((((((((auVar311 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar311 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar311 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar311 >> 0x7f,0) != '\0') ||
                (auVar311 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar289 >> 0x3f,0) != '\0') ||
              (auVar311 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar289[0xf] < '\0') {
            auVar249._0_4_ = auVar205._0_4_ * fVar236;
            auVar249._4_4_ = auVar205._4_4_ * fVar256;
            auVar249._8_4_ = auVar205._8_4_ * fVar302;
            auVar249._12_4_ = auVar205._12_4_ * fVar258;
            auVar249._16_4_ = auVar205._16_4_ * fVar264;
            auVar249._20_4_ = auVar205._20_4_ * fVar276;
            auVar249._24_4_ = auVar205._24_4_ * fVar279;
            auVar249._28_4_ = 0;
            auVar83._4_4_ = auVar273._4_4_ * fVar256;
            auVar83._0_4_ = auVar273._0_4_ * fVar236;
            auVar83._8_4_ = auVar273._8_4_ * fVar302;
            auVar83._12_4_ = auVar273._12_4_ * fVar258;
            auVar83._16_4_ = auVar273._16_4_ * fVar264;
            auVar83._20_4_ = auVar273._20_4_ * fVar276;
            auVar83._24_4_ = auVar273._24_4_ * fVar279;
            auVar83._28_4_ = auVar44._28_4_ + auVar362._28_4_;
            auVar293._8_4_ = 0x3f800000;
            auVar293._0_8_ = &DAT_3f8000003f800000;
            auVar293._12_4_ = 0x3f800000;
            auVar293._16_4_ = 0x3f800000;
            auVar293._20_4_ = 0x3f800000;
            auVar293._24_4_ = 0x3f800000;
            auVar293._28_4_ = 0x3f800000;
            auVar175 = vsubps_avx(auVar293,auVar249);
            auVar175 = vblendvps_avx(auVar175,auVar249,auVar39);
            auVar182 = ZEXT3264(auVar175);
            auVar175 = vsubps_avx(auVar293,auVar83);
            auVar251 = ZEXT3264(auVar175);
            _local_240 = vblendvps_avx(auVar175,auVar83,auVar39);
            auVar425 = ZEXT3264(auVar82);
            auVar294 = auVar311;
          }
        }
        local_5a0 = auVar182._0_32_;
        local_5c0 = auVar425._0_32_;
        auVar362 = local_5c0;
        auVar348 = local_5a0;
        if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar294 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar294 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar294 >> 0x7f,0) != '\0') ||
              (auVar294 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar294 >> 0xbf,0) != '\0') ||
            (auVar294 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar294[0x1f] < '\0') {
          auVar175 = vsubps_avx(_local_780,local_860);
          fVar286 = (float)local_860._0_4_ + auVar182._0_4_ * auVar175._0_4_;
          fVar261 = local_860._4_4_ + auVar182._4_4_ * auVar175._4_4_;
          fVar256 = local_860._8_4_ + auVar182._8_4_ * auVar175._8_4_;
          fVar302 = local_860._12_4_ + auVar182._12_4_ * auVar175._12_4_;
          fVar258 = local_860._16_4_ + auVar182._16_4_ * auVar175._16_4_;
          fVar259 = local_860._20_4_ + auVar182._20_4_ * auVar175._20_4_;
          fVar262 = local_860._24_4_ + auVar182._24_4_ * auVar175._24_4_;
          fVar264 = auVar175._28_4_ + 0.0;
          fVar236 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
          auVar84._4_4_ = (fVar261 + fVar261) * fVar236;
          auVar84._0_4_ = (fVar286 + fVar286) * fVar236;
          auVar84._8_4_ = (fVar256 + fVar256) * fVar236;
          auVar84._12_4_ = (fVar302 + fVar302) * fVar236;
          auVar84._16_4_ = (fVar258 + fVar258) * fVar236;
          auVar84._20_4_ = (fVar259 + fVar259) * fVar236;
          auVar84._24_4_ = (fVar262 + fVar262) * fVar236;
          auVar84._28_4_ = fVar264 + fVar264;
          auVar175 = vcmpps_avx(local_5c0,auVar84,6);
          auVar40 = auVar294 & auVar175;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            local_2e0 = vandps_avx(auVar175,auVar294);
            local_240._0_4_ = (float)local_240._0_4_ + (float)local_240._0_4_ + -1.0;
            local_240._4_4_ = (float)local_240._4_4_ + (float)local_240._4_4_ + -1.0;
            uStack_238._0_4_ = (float)uStack_238 + (float)uStack_238 + -1.0;
            uStack_238._4_4_ = uStack_238._4_4_ + uStack_238._4_4_ + -1.0;
            uStack_230._0_4_ = (float)uStack_230 + (float)uStack_230 + -1.0;
            uStack_230._4_4_ = uStack_230._4_4_ + uStack_230._4_4_ + -1.0;
            uStack_228._0_4_ = (float)uStack_228 + (float)uStack_228 + -1.0;
            uStack_228._4_4_ = uStack_228._4_4_ + uStack_228._4_4_ + -1.0;
            local_3a0 = local_5a0;
            auVar151 = _local_240;
            auVar175 = _local_240;
            local_380 = (float)local_240._0_4_;
            fStack_37c = (float)local_240._4_4_;
            fStack_378 = (float)uStack_238;
            fStack_374 = uStack_238._4_4_;
            fStack_370 = (float)uStack_230;
            fStack_36c = uStack_230._4_4_;
            fStack_368 = (float)uStack_228;
            fStack_364 = uStack_228._4_4_;
            local_360 = local_5c0;
            local_340 = 0;
            local_33c = uVar34;
            local_330 = auVar268._0_8_;
            uStack_328 = uStack_888;
            uStack_668 = auVar411._8_8_;
            local_320 = auVar411._0_8_;
            uStack_318 = uStack_668;
            uStack_678 = auVar420._8_8_;
            local_310 = auVar420._0_8_;
            uStack_308 = uStack_678;
            uStack_688 = auVar387._8_8_;
            local_300._8_8_ = uStack_688;
            local_300._0_8_ = auVar387._0_8_;
            _local_240 = auVar175;
            if ((pGVar160->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar221._0_4_ = 1.0 / local_4c0;
              auVar221._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar289 = vshufps_avx(auVar221,auVar221,0);
              local_2c0[0] = auVar289._0_4_ * (auVar182._0_4_ + 0.0);
              local_2c0[1] = auVar289._4_4_ * (auVar182._4_4_ + 1.0);
              local_2c0[2] = auVar289._8_4_ * (auVar182._8_4_ + 2.0);
              local_2c0[3] = auVar289._12_4_ * (auVar182._12_4_ + 3.0);
              fStack_2b0 = auVar289._0_4_ * (auVar182._16_4_ + 4.0);
              fStack_2ac = auVar289._4_4_ * (auVar182._20_4_ + 5.0);
              fStack_2a8 = auVar289._8_4_ * (auVar182._24_4_ + 6.0);
              fStack_2a4 = auVar182._28_4_ + 7.0;
              uStack_230 = auVar151._16_8_;
              uStack_228 = auVar175._24_8_;
              local_2a0 = local_240;
              uStack_298 = uStack_238;
              uStack_290 = uStack_230;
              uStack_288 = uStack_228;
              local_280 = local_5c0;
              auVar206._8_4_ = 0x7f800000;
              auVar206._0_8_ = 0x7f8000007f800000;
              auVar206._12_4_ = 0x7f800000;
              auVar206._16_4_ = 0x7f800000;
              auVar206._20_4_ = 0x7f800000;
              auVar206._24_4_ = 0x7f800000;
              auVar206._28_4_ = 0x7f800000;
              auVar175 = vblendvps_avx(auVar206,local_5c0,local_2e0);
              auVar40 = vshufps_avx(auVar175,auVar175,0xb1);
              auVar40 = vminps_avx(auVar175,auVar40);
              auVar42 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar42);
              auVar42 = vperm2f128_avx(auVar40,auVar40,1);
              auVar40 = vminps_avx(auVar40,auVar42);
              auVar40 = vcmpps_avx(auVar175,auVar40,0);
              auVar42 = local_2e0 & auVar40;
              auVar175 = local_2e0;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar175 = vandps_avx(auVar40,local_2e0);
              }
              uVar153 = vmovmskps_avx(auVar175);
              uVar38 = 0;
              if (uVar153 != 0) {
                for (; (uVar153 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar154 = (ulong)uVar38;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar160->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar236 = local_2c0[uVar154];
                uVar12 = *(undefined4 *)((long)&local_2a0 + uVar154 * 4);
                fVar261 = 1.0 - fVar236;
                fVar286 = fVar236 * fVar261 * 4.0;
                auVar289 = ZEXT416((uint)(fVar236 * fVar236 * 0.5));
                auVar289 = vshufps_avx(auVar289,auVar289,0);
                auVar224 = ZEXT416((uint)((fVar261 * fVar261 + fVar286) * 0.5));
                auVar224 = vshufps_avx(auVar224,auVar224,0);
                auVar270 = ZEXT416((uint)((-fVar236 * fVar236 - fVar286) * 0.5));
                auVar270 = vshufps_avx(auVar270,auVar270,0);
                auVar240 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar222._0_4_ =
                     auVar240._0_4_ * fVar265 +
                     auVar270._0_4_ * fVar409 +
                     auVar289._0_4_ * local_720 + auVar224._0_4_ * fVar418;
                auVar222._4_4_ =
                     auVar240._4_4_ * fVar277 +
                     auVar270._4_4_ * fVar414 +
                     auVar289._4_4_ * fStack_71c + auVar224._4_4_ * fVar426;
                auVar222._8_4_ =
                     auVar240._8_4_ * auVar268._8_4_ +
                     auVar270._8_4_ * auVar411._8_4_ +
                     auVar289._8_4_ * auVar387._8_4_ + auVar224._8_4_ * auVar420._8_4_;
                auVar222._12_4_ =
                     auVar240._12_4_ * auVar268._12_4_ +
                     auVar270._12_4_ * auVar411._12_4_ +
                     auVar289._12_4_ * auVar387._12_4_ + auVar224._12_4_ * auVar420._12_4_;
                auVar251 = ZEXT464(*(uint *)(local_280 + uVar154 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_280 + uVar154 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar222._0_4_;
                uVar35 = vextractps_avx(auVar222,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar35;
                uVar35 = vextractps_avx(auVar222,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar35;
                *(float *)(ray + k * 4 + 0xf0) = fVar236;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                *(uint *)(ray + k * 4 + 0x110) = uVar33;
                *(uint *)(ray + k * 4 + 0x120) = uVar155;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_7e0 = vshufps_avx(ZEXT416(uVar155),ZEXT416(uVar155),0);
                local_6e0 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                auStack_6d0 = auVar168._16_16_;
                auStack_790 = auVar210._16_16_;
                auStack_798 = (undefined1  [8])uStack_668;
                local_7a0 = (Geometry *)auVar411._0_8_;
                _auStack_6f0 = auVar245._16_16_;
                uStack_6f8 = uStack_678;
                local_700 = (undefined1  [8])auVar420._0_8_;
                local_740 = (float)*(undefined8 *)*local_7a8;
                fStack_73c = (float)((ulong)*(undefined8 *)*local_7a8 >> 0x20);
                fStack_738 = (float)*(undefined8 *)(*local_7a8 + 8);
                fStack_734 = (float)((ulong)*(undefined8 *)(*local_7a8 + 8) >> 0x20);
                fStack_718 = auVar387._8_4_;
                fStack_714 = auVar387._12_4_;
                _local_680 = auVar420;
                _local_670 = auVar411;
                local_620 = local_2e0;
                _local_4a0 = *pauVar11;
                _local_1c0 = auVar41;
                do {
                  local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_400 = local_2c0[uVar154];
                  uVar12 = *(undefined4 *)((long)&local_2a0 + uVar154 * 4);
                  auVar199._4_4_ = uVar12;
                  auVar199._0_4_ = uVar12;
                  auVar199._8_4_ = uVar12;
                  auVar199._12_4_ = uVar12;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar154 * 4);
                  fVar286 = 1.0 - local_400;
                  fVar236 = local_400 * fVar286 * 4.0;
                  auVar289 = ZEXT416((uint)(local_400 * local_400 * 0.5));
                  auVar289 = vshufps_avx(auVar289,auVar289,0);
                  auVar224 = ZEXT416((uint)((fVar286 * fVar286 + fVar236) * 0.5));
                  auVar224 = vshufps_avx(auVar224,auVar224,0);
                  auVar270 = ZEXT416((uint)((-local_400 * local_400 - fVar236) * 0.5));
                  auVar270 = vshufps_avx(auVar270,auVar270,0);
                  local_810.context = context->user;
                  auVar240 = ZEXT416((uint)(fVar286 * -fVar286 * 0.5));
                  auVar240 = vshufps_avx(auVar240,auVar240,0);
                  auVar227._0_4_ =
                       auVar240._0_4_ * fVar265 +
                       auVar270._0_4_ * (float)local_7a0 +
                       auVar289._0_4_ * local_720 + auVar224._0_4_ * (float)local_700._0_4_;
                  auVar227._4_4_ =
                       auVar240._4_4_ * fVar277 +
                       auVar270._4_4_ * local_7a0._4_4_ +
                       auVar289._4_4_ * fStack_71c + auVar224._4_4_ * (float)local_700._4_4_;
                  auVar227._8_4_ =
                       auVar240._8_4_ * auVar268._8_4_ +
                       auVar270._8_4_ * (float)auStack_798._0_4_ +
                       auVar289._8_4_ * fStack_718 + auVar224._8_4_ * (float)uStack_6f8;
                  auVar227._12_4_ =
                       auVar240._12_4_ * auVar268._12_4_ +
                       auVar270._12_4_ * (float)auStack_798._4_4_ +
                       auVar289._12_4_ * fStack_714 + auVar224._12_4_ * uStack_6f8._4_4_;
                  auVar289 = vshufps_avx(auVar227,auVar227,0);
                  local_430[0] = (RTCHitN)auVar289[0];
                  local_430[1] = (RTCHitN)auVar289[1];
                  local_430[2] = (RTCHitN)auVar289[2];
                  local_430[3] = (RTCHitN)auVar289[3];
                  local_430[4] = (RTCHitN)auVar289[4];
                  local_430[5] = (RTCHitN)auVar289[5];
                  local_430[6] = (RTCHitN)auVar289[6];
                  local_430[7] = (RTCHitN)auVar289[7];
                  local_430[8] = (RTCHitN)auVar289[8];
                  local_430[9] = (RTCHitN)auVar289[9];
                  local_430[10] = (RTCHitN)auVar289[10];
                  local_430[0xb] = (RTCHitN)auVar289[0xb];
                  local_430[0xc] = (RTCHitN)auVar289[0xc];
                  local_430[0xd] = (RTCHitN)auVar289[0xd];
                  local_430[0xe] = (RTCHitN)auVar289[0xe];
                  local_430[0xf] = (RTCHitN)auVar289[0xf];
                  local_420 = vshufps_avx(auVar227,auVar227,0x55);
                  auVar251 = ZEXT1664(local_420);
                  local_410 = vshufps_avx(auVar227,auVar227,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  local_3f0 = auVar199;
                  local_3e0 = local_6e0._0_8_;
                  uStack_3d8 = local_6e0._8_8_;
                  local_3d0 = local_7e0;
                  uStack_3c8 = uStack_7d8;
                  vcmpps_avx(auVar214._0_32_,auVar214._0_32_,0xf);
                  uStack_3bc = (local_810.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_810.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_880 = CONCAT44(fStack_73c,local_740);
                  uStack_878 = CONCAT44(fStack_734,fStack_738);
                  local_810.valid = (int *)&local_880;
                  local_810.geometryUserPtr = pGVar160->userPtr;
                  local_810.hit = local_430;
                  local_810.N = 4;
                  local_860._0_8_ = uVar154;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar160->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar251 = ZEXT1664(local_420);
                    (*pGVar160->intersectionFilterN)(&local_810);
                    auVar214._8_56_ = extraout_var;
                    auVar214._0_8_ = extraout_XMM1_Qa;
                    auVar199 = auVar214._0_16_;
                    auVar425 = ZEXT3264(local_5c0);
                    auVar182 = ZEXT3264(local_5a0);
                    auVar214 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar154 = local_860._0_8_;
                    fVar266 = (float)local_6c0._0_4_;
                    fVar278 = (float)local_6c0._4_4_;
                    fVar280 = fStack_6b8;
                    fVar282 = fStack_6b4;
                    fVar254 = fStack_6b0;
                    fVar252 = fStack_6ac;
                    fVar235 = fStack_6a8;
                  }
                  auVar289 = auVar251._0_16_;
                  auVar138._8_8_ = uStack_878;
                  auVar138._0_8_ = local_880;
                  if (auVar138 == (undefined1  [16])0x0) {
                    auVar289 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar224 = vpcmpeqd_avx(auVar199,auVar199);
                    auVar289 = auVar289 ^ auVar224;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar160->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var37)(&local_810);
                      auVar425 = ZEXT3264(local_5c0);
                      auVar182 = ZEXT3264(local_5a0);
                      auVar214 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar154 = local_860._0_8_;
                      fVar266 = (float)local_6c0._0_4_;
                      fVar278 = (float)local_6c0._4_4_;
                      fVar280 = fStack_6b8;
                      fVar282 = fStack_6b4;
                      fVar254 = fStack_6b0;
                      fVar252 = fStack_6ac;
                      fVar235 = fStack_6a8;
                    }
                    auVar139._8_8_ = uStack_878;
                    auVar139._0_8_ = local_880;
                    auVar224 = vpcmpeqd_avx(auVar139,_DAT_01feba10);
                    auVar270 = vpcmpeqd_avx(auVar289,auVar289);
                    auVar251 = ZEXT1664(auVar270);
                    auVar289 = auVar224 ^ auVar270;
                    if (auVar139 != (undefined1  [16])0x0) {
                      auVar224 = auVar224 ^ auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])local_810.hit);
                      *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x10));
                      *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x20));
                      *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x30));
                      *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x40));
                      *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar270;
                      auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar270;
                      auVar224 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar224;
                    }
                  }
                  auVar362 = auVar425._0_32_;
                  auVar200._8_8_ = 0x100000001;
                  auVar200._0_8_ = 0x100000001;
                  if ((auVar200 & auVar289) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_780._0_4_;
                  }
                  *(undefined4 *)(local_620 + uVar154 * 4) = 0;
                  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar181._4_4_ = uVar12;
                  auVar181._0_4_ = uVar12;
                  auVar181._8_4_ = uVar12;
                  auVar181._12_4_ = uVar12;
                  auVar181._16_4_ = uVar12;
                  auVar181._20_4_ = uVar12;
                  auVar181._24_4_ = uVar12;
                  auVar181._28_4_ = uVar12;
                  auVar210 = vcmpps_avx(auVar362,auVar181,2);
                  auVar168 = vandps_avx(auVar210,local_620);
                  local_620 = local_620 & auVar210;
                  bVar134 = (local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar135 = (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar133 = (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar132 = SUB321(local_620 >> 0x7f,0) != '\0';
                  bVar131 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar130 = SUB321(local_620 >> 0xbf,0) != '\0';
                  bVar129 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar128 = local_620[0x1f] < '\0';
                  if (((((((bVar134 || bVar135) || bVar133) || bVar132) || bVar131) || bVar130) ||
                      bVar129) || bVar128) {
                    auVar213._8_4_ = 0x7f800000;
                    auVar213._0_8_ = 0x7f8000007f800000;
                    auVar213._12_4_ = 0x7f800000;
                    auVar213._16_4_ = 0x7f800000;
                    auVar213._20_4_ = 0x7f800000;
                    auVar213._24_4_ = 0x7f800000;
                    auVar213._28_4_ = 0x7f800000;
                    auVar210 = vblendvps_avx(auVar213,auVar362,auVar168);
                    auVar175 = vshufps_avx(auVar210,auVar210,0xb1);
                    auVar175 = vminps_avx(auVar210,auVar175);
                    auVar40 = vshufpd_avx(auVar175,auVar175,5);
                    auVar175 = vminps_avx(auVar175,auVar40);
                    auVar40 = vperm2f128_avx(auVar175,auVar175,1);
                    auVar251 = ZEXT3264(auVar40);
                    auVar175 = vminps_avx(auVar175,auVar40);
                    auVar175 = vcmpps_avx(auVar210,auVar175,0);
                    auVar40 = auVar168 & auVar175;
                    auVar210 = auVar168;
                    if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar40 >> 0x7f,0) != '\0') ||
                          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0xbf,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar40[0x1f] < '\0') {
                      auVar210 = vandps_avx(auVar175,auVar168);
                    }
                    uVar153 = vmovmskps_avx(auVar210);
                    uVar38 = 0;
                    if (uVar153 != 0) {
                      for (; (uVar153 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar154 = (ulong)uVar38;
                  }
                  auVar348 = auVar182._0_32_;
                  auVar420 = _local_680;
                  auVar411 = _local_670;
                  local_620 = auVar168;
                } while (((((((bVar134 || bVar135) || bVar133) || bVar132) || bVar131) || bVar130)
                         || bVar129) || bVar128);
              }
            }
          }
        }
      }
      _local_670 = auVar411;
      _local_680 = auVar420;
      auVar214 = ZEXT1664(_local_660);
      local_5c0 = auVar362;
      local_5a0 = auVar348;
      if (8 < (int)uVar34) {
        _local_540 = vpshufd_avx(ZEXT416(uVar34),0);
        auVar289 = vshufps_avx(_local_660,_local_660,0);
        local_1e0._16_16_ = auVar289;
        local_1e0._0_16_ = auVar289;
        auVar142._4_4_ = uStack_83c;
        auVar142._0_4_ = local_840;
        auVar142._8_4_ = fStack_838;
        auVar142._12_4_ = fStack_834;
        auVar289 = vpermilps_avx(auVar142,0);
        register0x00001210 = auVar289;
        _local_200 = auVar289;
        auVar167._0_4_ = 1.0 / local_4c0;
        auVar167._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar289 = vshufps_avx(auVar167,auVar167,0);
        register0x00001210 = auVar289;
        _local_220 = auVar289;
        local_130 = vshufps_avx(ZEXT416(uVar155),ZEXT416(uVar155),0);
        local_140 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        auVar182 = ZEXT1664(local_140);
        lVar161 = 8;
        do {
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar161 * 4 + lVar157);
          fVar236 = *(float *)*pauVar10;
          fVar286 = *(float *)(*pauVar10 + 4);
          fVar261 = *(float *)(*pauVar10 + 8);
          fVar256 = *(float *)(*pauVar10 + 0xc);
          fVar302 = *(float *)(*pauVar10 + 0x10);
          fVar258 = *(float *)(*pauVar10 + 0x14);
          fVar259 = *(float *)(*pauVar10 + 0x18);
          auVar150 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar157 + 0x222bfac + lVar161 * 4);
          fVar262 = *(float *)*pauVar10;
          fVar264 = *(float *)(*pauVar10 + 4);
          fVar276 = *(float *)(*pauVar10 + 8);
          fVar279 = *(float *)(*pauVar10 + 0xc);
          fVar281 = *(float *)(*pauVar10 + 0x10);
          fVar283 = *(float *)(*pauVar10 + 0x14);
          fVar284 = *(float *)(*pauVar10 + 0x18);
          auVar149 = *pauVar10;
          pfVar1 = (float *)(lVar157 + 0x222c430 + lVar161 * 4);
          fVar285 = *pfVar1;
          fVar287 = pfVar1[1];
          fVar297 = pfVar1[2];
          fVar298 = pfVar1[3];
          fVar299 = pfVar1[4];
          fVar300 = pfVar1[5];
          fVar301 = pfVar1[6];
          pfVar1 = (float *)(lVar157 + 0x222c8b4 + lVar161 * 4);
          local_740 = *pfVar1;
          fStack_73c = pfVar1[1];
          fStack_738 = pfVar1[2];
          fStack_734 = pfVar1[3];
          fStack_730 = pfVar1[4];
          fStack_72c = pfVar1[5];
          fStack_728 = pfVar1[6];
          fStack_724 = pfVar1[7];
          fVar303 = auVar251._28_4_;
          fStack_824 = fVar303 + fVar303 + auVar182._28_4_;
          fVar313 = fVar303 + fVar303 + auVar214._28_4_;
          local_660._0_4_ =
               fVar266 * fVar236 +
               fVar262 * (float)local_480._0_4_ +
               fVar285 * (float)local_4e0._0_4_ + (float)local_500._0_4_ * local_740;
          local_660._4_4_ =
               fVar278 * fVar286 +
               fVar264 * (float)local_480._4_4_ +
               fVar287 * (float)local_4e0._4_4_ + (float)local_500._4_4_ * fStack_73c;
          fStack_658 = fVar280 * fVar261 +
                       fVar276 * fStack_478 + fVar297 * fStack_4d8 + fStack_4f8 * fStack_738;
          fStack_654 = fVar282 * fVar256 +
                       fVar279 * fStack_474 + fVar298 * fStack_4d4 + fStack_4f4 * fStack_734;
          register0x00001550 =
               fVar254 * fVar302 +
               fVar281 * fStack_470 + fVar299 * fStack_4d0 + fStack_4f0 * fStack_730;
          register0x00001554 =
               fVar252 * fVar258 +
               fVar283 * fStack_46c + fVar300 * fStack_4cc + fStack_4ec * fStack_72c;
          register0x00001558 =
               fVar235 * fVar259 +
               fVar284 * fStack_468 + fVar301 * fStack_4c8 + fStack_4e8 * fStack_728;
          register0x0000155c = fVar303 + fStack_724 + fStack_824;
          auVar250._0_4_ =
               fVar236 * (float)local_1a0._0_4_ +
               (float)local_520._0_4_ * fVar262 +
               (float)local_760._0_4_ * fVar285 + (float)local_460._0_4_ * local_740;
          auVar250._4_4_ =
               fVar286 * (float)local_1a0._4_4_ +
               (float)local_520._4_4_ * fVar264 +
               (float)local_760._4_4_ * fVar287 + (float)local_460._4_4_ * fStack_73c;
          auVar250._8_4_ =
               fVar261 * fStack_198 +
               fStack_518 * fVar276 + fStack_758 * fVar297 + fStack_458 * fStack_738;
          auVar250._12_4_ =
               fVar256 * fStack_194 +
               fStack_514 * fVar279 + fStack_754 * fVar298 + fStack_454 * fStack_734;
          auVar250._16_4_ =
               fVar302 * fStack_190 +
               fStack_510 * fVar281 + fStack_750 * fVar299 + fStack_450 * fStack_730;
          auVar250._20_4_ =
               fVar258 * fStack_18c +
               fStack_50c * fVar283 + fStack_74c * fVar300 + fStack_44c * fStack_72c;
          auVar250._24_4_ =
               fVar259 * fStack_188 +
               fStack_508 * fVar284 + fStack_748 * fVar301 + fStack_448 * fStack_728;
          auVar250._28_4_ = fStack_824 + fVar313;
          fVar165 = fVar262 * (float)local_e0._0_4_ +
                    fVar285 * (float)local_c0._0_4_ + (float)local_a0._0_4_ * local_740 +
                    fVar236 * (float)local_100._0_4_;
          fVar186 = fVar264 * (float)local_e0._4_4_ +
                    fVar287 * (float)local_c0._4_4_ + (float)local_a0._4_4_ * fStack_73c +
                    fVar286 * (float)local_100._4_4_;
          fStack_838 = fVar276 * fStack_d8 + fVar297 * fStack_b8 + fStack_98 * fStack_738 +
                       fVar261 * fStack_f8;
          fStack_834 = fVar279 * fStack_d4 + fVar298 * fStack_b4 + fStack_94 * fStack_734 +
                       fVar256 * fStack_f4;
          fStack_830 = fVar281 * fStack_d0 + fVar299 * fStack_b0 + fStack_90 * fStack_730 +
                       fVar302 * fStack_f0;
          fStack_82c = fVar283 * fStack_cc + fVar300 * fStack_ac + fStack_8c * fStack_72c +
                       fVar258 * fStack_ec;
          fStack_828 = fVar284 * fStack_c8 + fVar301 * fStack_a8 + fStack_88 * fStack_728 +
                       fVar259 * fStack_e8;
          fStack_824 = fVar303 + fVar303 + fStack_724 + fStack_824;
          pfVar1 = (float *)(bspline_basis1 + lVar161 * 4 + lVar157);
          fVar302 = *pfVar1;
          fVar258 = pfVar1[1];
          fVar259 = pfVar1[2];
          fVar262 = pfVar1[3];
          fVar264 = pfVar1[4];
          fVar276 = pfVar1[5];
          fVar279 = pfVar1[6];
          pfVar1 = (float *)(lVar157 + 0x222e3cc + lVar161 * 4);
          fVar281 = *pfVar1;
          fVar283 = pfVar1[1];
          fVar284 = pfVar1[2];
          fVar303 = pfVar1[3];
          fVar340 = pfVar1[4];
          fVar260 = pfVar1[5];
          fVar304 = pfVar1[6];
          pfVar1 = (float *)(lVar157 + 0x222e850 + lVar161 * 4);
          fVar356 = *pfVar1;
          fVar367 = pfVar1[1];
          fVar263 = pfVar1[2];
          fVar164 = pfVar1[3];
          fVar185 = pfVar1[4];
          fVar189 = pfVar1[5];
          fVar192 = pfVar1[6];
          fVar236 = pfVar1[7];
          pfVar1 = (float *)(lVar157 + 0x222ecd4 + lVar161 * 4);
          fVar193 = *pfVar1;
          fVar218 = pfVar1[1];
          fVar314 = pfVar1[2];
          fVar237 = pfVar1[3];
          fVar253 = pfVar1[4];
          fVar255 = pfVar1[5];
          fVar257 = pfVar1[6];
          fVar313 = fVar236 + fVar313;
          fVar286 = fStack_4e4 + fVar236 + fVar236;
          auVar176._0_4_ =
               fVar266 * fVar302 +
               (float)local_500._0_4_ * fVar193 + (float)local_4e0._0_4_ * fVar356 +
               fVar281 * (float)local_480._0_4_;
          auVar176._4_4_ =
               fVar278 * fVar258 +
               (float)local_500._4_4_ * fVar218 + (float)local_4e0._4_4_ * fVar367 +
               fVar283 * (float)local_480._4_4_;
          auVar176._8_4_ =
               fVar280 * fVar259 +
               fStack_4f8 * fVar314 + fStack_4d8 * fVar263 + fVar284 * fStack_478;
          auVar176._12_4_ =
               fVar282 * fVar262 +
               fStack_4f4 * fVar237 + fStack_4d4 * fVar164 + fVar303 * fStack_474;
          auVar176._16_4_ =
               fVar254 * fVar264 +
               fStack_4f0 * fVar253 + fStack_4d0 * fVar185 + fVar340 * fStack_470;
          auVar176._20_4_ =
               fVar252 * fVar276 +
               fStack_4ec * fVar255 + fStack_4cc * fVar189 + fVar260 * fStack_46c;
          auVar176._24_4_ =
               fVar235 * fVar279 +
               fStack_4e8 * fVar257 + fStack_4c8 * fVar192 + fVar304 * fStack_468;
          auVar176._28_4_ = fVar313 + fVar286;
          auVar295._0_4_ =
               fVar302 * (float)local_1a0._0_4_ +
               fVar281 * (float)local_520._0_4_ +
               fVar356 * (float)local_760._0_4_ + fVar193 * (float)local_460._0_4_;
          auVar295._4_4_ =
               fVar258 * (float)local_1a0._4_4_ +
               fVar283 * (float)local_520._4_4_ +
               fVar367 * (float)local_760._4_4_ + fVar218 * (float)local_460._4_4_;
          auVar295._8_4_ =
               fVar259 * fStack_198 +
               fVar284 * fStack_518 + fVar263 * fStack_758 + fVar314 * fStack_458;
          auVar295._12_4_ =
               fVar262 * fStack_194 +
               fVar303 * fStack_514 + fVar164 * fStack_754 + fVar237 * fStack_454;
          auVar295._16_4_ =
               fVar264 * fStack_190 +
               fVar340 * fStack_510 + fVar185 * fStack_750 + fVar253 * fStack_450;
          auVar295._20_4_ =
               fVar276 * fStack_18c +
               fVar260 * fStack_50c + fVar189 * fStack_74c + fVar255 * fStack_44c;
          auVar295._24_4_ =
               fVar279 * fStack_188 +
               fVar304 * fStack_508 + fVar192 * fStack_748 + fVar257 * fStack_448;
          auVar295._28_4_ = fVar286 + fVar236 + fVar236 + fStack_444;
          local_4a0._0_4_ =
               fVar281 * (float)local_e0._0_4_ +
               fVar356 * (float)local_c0._0_4_ + (float)local_a0._0_4_ * fVar193 +
               fVar302 * (float)local_100._0_4_;
          local_4a0._4_4_ =
               fVar283 * (float)local_e0._4_4_ +
               fVar367 * (float)local_c0._4_4_ + (float)local_a0._4_4_ * fVar218 +
               fVar258 * (float)local_100._4_4_;
          fStack_498 = fVar284 * fStack_d8 + fVar263 * fStack_b8 + fStack_98 * fVar314 +
                       fVar259 * fStack_f8;
          fStack_494 = fVar303 * fStack_d4 + fVar164 * fStack_b4 + fStack_94 * fVar237 +
                       fVar262 * fStack_f4;
          fStack_490 = fVar340 * fStack_d0 + fVar185 * fStack_b0 + fStack_90 * fVar253 +
                       fVar264 * fStack_f0;
          fStack_48c = fVar260 * fStack_cc + fVar189 * fStack_ac + fStack_8c * fVar255 +
                       fVar276 * fStack_ec;
          fStack_488 = fVar304 * fStack_c8 + fVar192 * fStack_a8 + fStack_88 * fVar257 +
                       fVar279 * fStack_e8;
          register0x000013dc = fVar236 + fVar313 + fVar286;
          auVar210 = vsubps_avx(auVar176,_local_660);
          auVar175 = vsubps_avx(auVar295,auVar250);
          fVar306 = auVar210._0_4_;
          fVar355 = auVar210._4_4_;
          auVar85._4_4_ = fVar355 * auVar250._4_4_;
          auVar85._0_4_ = fVar306 * auVar250._0_4_;
          fVar366 = auVar210._8_4_;
          auVar85._8_4_ = fVar366 * auVar250._8_4_;
          fVar369 = auVar210._12_4_;
          auVar85._12_4_ = fVar369 * auVar250._12_4_;
          fVar371 = auVar210._16_4_;
          auVar85._16_4_ = fVar371 * auVar250._16_4_;
          fVar339 = auVar210._20_4_;
          auVar85._20_4_ = fVar339 * auVar250._20_4_;
          fVar315 = auVar210._24_4_;
          auVar85._24_4_ = fVar315 * auVar250._24_4_;
          auVar85._28_4_ = fVar286;
          fVar236 = auVar175._0_4_;
          fVar254 = auVar175._4_4_;
          auVar86._4_4_ = (float)local_660._4_4_ * fVar254;
          auVar86._0_4_ = (float)local_660._0_4_ * fVar236;
          fVar252 = auVar175._8_4_;
          auVar86._8_4_ = fStack_658 * fVar252;
          fVar286 = auVar175._12_4_;
          auVar86._12_4_ = fStack_654 * fVar286;
          fVar235 = auVar175._16_4_;
          auVar86._16_4_ = register0x00001550 * fVar235;
          fVar261 = auVar175._20_4_;
          auVar86._20_4_ = register0x00001554 * fVar261;
          fVar256 = auVar175._24_4_;
          auVar86._24_4_ = register0x00001558 * fVar256;
          auVar86._28_4_ = auVar295._28_4_;
          auVar40 = vsubps_avx(auVar85,auVar86);
          auVar143._4_4_ = fVar186;
          auVar143._0_4_ = fVar165;
          auVar143._8_4_ = fStack_838;
          auVar143._12_4_ = fStack_834;
          auVar143._16_4_ = fStack_830;
          auVar143._20_4_ = fStack_82c;
          auVar143._24_4_ = fStack_828;
          auVar143._28_4_ = fStack_824;
          auVar182 = ZEXT3264(auVar143);
          auVar168 = vmaxps_avx(auVar143,_local_4a0);
          auVar87._4_4_ = auVar168._4_4_ * auVar168._4_4_ * (fVar355 * fVar355 + fVar254 * fVar254);
          auVar87._0_4_ = auVar168._0_4_ * auVar168._0_4_ * (fVar306 * fVar306 + fVar236 * fVar236);
          auVar87._8_4_ = auVar168._8_4_ * auVar168._8_4_ * (fVar366 * fVar366 + fVar252 * fVar252);
          auVar87._12_4_ =
               auVar168._12_4_ * auVar168._12_4_ * (fVar369 * fVar369 + fVar286 * fVar286);
          auVar87._16_4_ =
               auVar168._16_4_ * auVar168._16_4_ * (fVar371 * fVar371 + fVar235 * fVar235);
          auVar87._20_4_ =
               auVar168._20_4_ * auVar168._20_4_ * (fVar339 * fVar339 + fVar261 * fVar261);
          auVar87._24_4_ =
               auVar168._24_4_ * auVar168._24_4_ * (fVar315 * fVar315 + fVar256 * fVar256);
          auVar87._28_4_ = fVar313 + auVar295._28_4_;
          auVar88._4_4_ = auVar40._4_4_ * auVar40._4_4_;
          auVar88._0_4_ = auVar40._0_4_ * auVar40._0_4_;
          auVar88._8_4_ = auVar40._8_4_ * auVar40._8_4_;
          auVar88._12_4_ = auVar40._12_4_ * auVar40._12_4_;
          auVar88._16_4_ = auVar40._16_4_ * auVar40._16_4_;
          auVar88._20_4_ = auVar40._20_4_ * auVar40._20_4_;
          auVar88._24_4_ = auVar40._24_4_ * auVar40._24_4_;
          auVar88._28_4_ = auVar40._28_4_;
          auVar168 = vcmpps_avx(auVar88,auVar87,2);
          auVar214 = ZEXT3264(auVar168);
          local_340 = (uint)lVar161;
          auVar224 = vpshufd_avx(ZEXT416(local_340),0);
          auVar289 = vpor_avx(auVar224,_DAT_01ff0cf0);
          auVar224 = vpor_avx(auVar224,_DAT_02020ea0);
          auVar289 = vpcmpgtd_avx(_local_540,auVar289);
          auVar224 = vpcmpgtd_avx(_local_540,auVar224);
          register0x000012d0 = auVar224;
          _local_1c0 = auVar289;
          auVar251 = ZEXT3264(_local_1c0);
          auVar40 = _local_1c0 & auVar168;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            local_4c0 = fVar302 * (float)local_120._0_4_ +
                        fVar281 * (float)local_180._0_4_ +
                        fVar356 * (float)local_160._0_4_ + fVar193 * (float)local_640._0_4_;
            fStack_4bc = fVar258 * (float)local_120._4_4_ +
                         fVar283 * (float)local_180._4_4_ +
                         fVar367 * (float)local_160._4_4_ + fVar218 * (float)local_640._4_4_;
            fStack_4b8 = fVar259 * fStack_118 +
                         fVar284 * fStack_178 + fVar263 * fStack_158 + fVar314 * fStack_638;
            fStack_4b4 = fVar262 * fStack_114 +
                         fVar303 * fStack_174 + fVar164 * fStack_154 + fVar237 * fStack_634;
            fStack_4b0 = fVar264 * fStack_110 +
                         fVar340 * fStack_170 + fVar185 * fStack_150 + fVar253 * fStack_630;
            fStack_4ac = fVar276 * fStack_10c +
                         fVar260 * fStack_16c + fVar189 * fStack_14c + fVar255 * fStack_62c;
            fStack_4a8 = fVar279 * fStack_108 +
                         fVar304 * fStack_168 + fVar192 * fStack_148 + fVar257 * fStack_628;
            fStack_4a4 = fStack_4c4 + fStack_104 + auVar168._28_4_ + 0.0;
            local_700._0_4_ = auVar149._0_4_;
            local_700._4_4_ = auVar149._4_4_;
            uStack_6f8._0_4_ = auVar149._8_4_;
            uStack_6f8._4_4_ = auVar149._12_4_;
            auStack_6f0._0_4_ = auVar149._16_4_;
            auStack_6f0._4_4_ = auVar149._20_4_;
            fStack_6e8 = auVar149._24_4_;
            pfVar2 = (float *)(lVar157 + 0x222d640 + lVar161 * 4);
            fVar236 = *pfVar2;
            fVar254 = pfVar2[1];
            fVar252 = pfVar2[2];
            fVar286 = pfVar2[3];
            fVar235 = pfVar2[4];
            fVar261 = pfVar2[5];
            fVar256 = pfVar2[6];
            pfVar3 = (float *)(lVar157 + 0x222dac4 + lVar161 * 4);
            fVar302 = *pfVar3;
            fVar258 = pfVar3[1];
            fVar259 = pfVar3[2];
            fVar262 = pfVar3[3];
            fVar264 = pfVar3[4];
            fVar276 = pfVar3[5];
            fVar279 = pfVar3[6];
            fVar314 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar157 + 0x222d1bc + lVar161 * 4);
            fVar281 = *pfVar4;
            fVar283 = pfVar4[1];
            fVar284 = pfVar4[2];
            fVar303 = pfVar4[3];
            fVar340 = pfVar4[4];
            fVar260 = pfVar4[5];
            fVar304 = pfVar4[6];
            fVar193 = pfVar2[7] + pfVar3[7];
            fVar218 = pfVar3[7] + fVar314;
            fVar314 = pfVar1[7] + register0x0000155c + fVar314;
            pfVar1 = (float *)(lVar157 + 0x222cd38 + lVar161 * 4);
            fVar356 = *pfVar1;
            fVar367 = pfVar1[1];
            fVar263 = pfVar1[2];
            fVar164 = pfVar1[3];
            fVar185 = pfVar1[4];
            fVar189 = pfVar1[5];
            fVar192 = pfVar1[6];
            local_720 = (float)local_6c0._0_4_ * fVar356 +
                        fVar281 * (float)local_480._0_4_ +
                        (float)local_4e0._0_4_ * fVar236 + (float)local_500._0_4_ * fVar302;
            fStack_71c = (float)local_6c0._4_4_ * fVar367 +
                         fVar283 * (float)local_480._4_4_ +
                         (float)local_4e0._4_4_ * fVar254 + (float)local_500._4_4_ * fVar258;
            fStack_718 = fStack_6b8 * fVar263 +
                         fVar284 * fStack_478 + fStack_4d8 * fVar252 + fStack_4f8 * fVar259;
            fStack_714 = fStack_6b4 * fVar164 +
                         fVar303 * fStack_474 + fStack_4d4 * fVar286 + fStack_4f4 * fVar262;
            fStack_710 = fStack_6b0 * fVar185 +
                         fVar340 * fStack_470 + fStack_4d0 * fVar235 + fStack_4f0 * fVar264;
            fStack_70c = fStack_6ac * fVar189 +
                         fVar260 * fStack_46c + fStack_4cc * fVar261 + fStack_4ec * fVar276;
            fStack_708 = fStack_6a8 * fVar192 +
                         fVar304 * fStack_468 + fStack_4c8 * fVar256 + fStack_4e8 * fVar279;
            fStack_704 = fVar193 + fVar218;
            auVar207._0_4_ =
                 fVar356 * (float)local_1a0._0_4_ +
                 fVar236 * (float)local_760._0_4_ + (float)local_460._0_4_ * fVar302 +
                 fVar281 * (float)local_520._0_4_;
            auVar207._4_4_ =
                 fVar367 * (float)local_1a0._4_4_ +
                 fVar254 * (float)local_760._4_4_ + (float)local_460._4_4_ * fVar258 +
                 fVar283 * (float)local_520._4_4_;
            auVar207._8_4_ =
                 fVar263 * fStack_198 +
                 fVar252 * fStack_758 + fStack_458 * fVar259 + fVar284 * fStack_518;
            auVar207._12_4_ =
                 fVar164 * fStack_194 +
                 fVar286 * fStack_754 + fStack_454 * fVar262 + fVar303 * fStack_514;
            auVar207._16_4_ =
                 fVar185 * fStack_190 +
                 fVar235 * fStack_750 + fStack_450 * fVar264 + fVar340 * fStack_510;
            auVar207._20_4_ =
                 fVar189 * fStack_18c +
                 fVar261 * fStack_74c + fStack_44c * fVar276 + fVar260 * fStack_50c;
            auVar207._24_4_ =
                 fVar192 * fStack_188 +
                 fVar256 * fStack_748 + fStack_448 * fVar279 + fVar304 * fStack_508;
            auVar207._28_4_ = fVar218 + fVar314;
            auVar401._0_4_ =
                 fVar281 * (float)local_180._0_4_ +
                 (float)local_160._0_4_ * fVar236 + (float)local_640._0_4_ * fVar302 +
                 (float)local_120._0_4_ * fVar356;
            auVar401._4_4_ =
                 fVar283 * (float)local_180._4_4_ +
                 (float)local_160._4_4_ * fVar254 + (float)local_640._4_4_ * fVar258 +
                 (float)local_120._4_4_ * fVar367;
            auVar401._8_4_ =
                 fVar284 * fStack_178 + fStack_158 * fVar252 + fStack_638 * fVar259 +
                 fStack_118 * fVar263;
            auVar401._12_4_ =
                 fVar303 * fStack_174 + fStack_154 * fVar286 + fStack_634 * fVar262 +
                 fStack_114 * fVar164;
            auVar401._16_4_ =
                 fVar340 * fStack_170 + fStack_150 * fVar235 + fStack_630 * fVar264 +
                 fStack_110 * fVar185;
            auVar401._20_4_ =
                 fVar260 * fStack_16c + fStack_14c * fVar261 + fStack_62c * fVar276 +
                 fStack_10c * fVar189;
            auVar401._24_4_ =
                 fVar304 * fStack_168 + fStack_148 * fVar256 + fStack_628 * fVar279 +
                 fStack_108 * fVar192;
            auVar401._28_4_ = pfVar4[7] + fVar193 + fVar314;
            pfVar1 = (float *)(lVar157 + 0x222fa60 + lVar161 * 4);
            fVar236 = *pfVar1;
            fVar254 = pfVar1[1];
            fVar252 = pfVar1[2];
            fVar286 = pfVar1[3];
            fVar235 = pfVar1[4];
            fVar261 = pfVar1[5];
            fVar256 = pfVar1[6];
            pfVar2 = (float *)(lVar157 + 0x222fee4 + lVar161 * 4);
            fVar302 = *pfVar2;
            fVar258 = pfVar2[1];
            fVar259 = pfVar2[2];
            fVar262 = pfVar2[3];
            fVar264 = pfVar2[4];
            fVar276 = pfVar2[5];
            fVar279 = pfVar2[6];
            pfVar3 = (float *)(lVar157 + 0x222f5dc + lVar161 * 4);
            fVar281 = *pfVar3;
            fVar283 = pfVar3[1];
            fVar284 = pfVar3[2];
            fVar303 = pfVar3[3];
            fVar340 = pfVar3[4];
            fVar260 = pfVar3[5];
            fVar304 = pfVar3[6];
            pfVar4 = (float *)(lVar157 + 0x222f158 + lVar161 * 4);
            fVar356 = *pfVar4;
            fVar367 = pfVar4[1];
            fVar263 = pfVar4[2];
            fVar164 = pfVar4[3];
            fVar185 = pfVar4[4];
            fVar189 = pfVar4[5];
            fVar192 = pfVar4[6];
            auVar349._0_4_ =
                 (float)local_6c0._0_4_ * fVar356 +
                 fVar281 * (float)local_480._0_4_ +
                 fVar236 * (float)local_4e0._0_4_ + (float)local_500._0_4_ * fVar302;
            auVar349._4_4_ =
                 (float)local_6c0._4_4_ * fVar367 +
                 fVar283 * (float)local_480._4_4_ +
                 fVar254 * (float)local_4e0._4_4_ + (float)local_500._4_4_ * fVar258;
            auVar349._8_4_ =
                 fStack_6b8 * fVar263 +
                 fVar284 * fStack_478 + fVar252 * fStack_4d8 + fStack_4f8 * fVar259;
            auVar349._12_4_ =
                 fStack_6b4 * fVar164 +
                 fVar303 * fStack_474 + fVar286 * fStack_4d4 + fStack_4f4 * fVar262;
            auVar349._16_4_ =
                 fStack_6b0 * fVar185 +
                 fVar340 * fStack_470 + fVar235 * fStack_4d0 + fStack_4f0 * fVar264;
            auVar349._20_4_ =
                 fStack_6ac * fVar189 +
                 fVar260 * fStack_46c + fVar261 * fStack_4cc + fStack_4ec * fVar276;
            auVar349._24_4_ =
                 fStack_6a8 * fVar192 +
                 fVar304 * fStack_468 + fVar256 * fStack_4c8 + fStack_4e8 * fVar279;
            auVar349._28_4_ = fStack_104 + fStack_104 + fStack_4e4 + fStack_104;
            auVar395._0_4_ =
                 fVar356 * (float)local_1a0._0_4_ +
                 fVar281 * (float)local_520._0_4_ +
                 fVar236 * (float)local_760._0_4_ + (float)local_460._0_4_ * fVar302;
            auVar395._4_4_ =
                 fVar367 * (float)local_1a0._4_4_ +
                 fVar283 * (float)local_520._4_4_ +
                 fVar254 * (float)local_760._4_4_ + (float)local_460._4_4_ * fVar258;
            auVar395._8_4_ =
                 fVar263 * fStack_198 +
                 fVar284 * fStack_518 + fVar252 * fStack_758 + fStack_458 * fVar259;
            auVar395._12_4_ =
                 fVar164 * fStack_194 +
                 fVar303 * fStack_514 + fVar286 * fStack_754 + fStack_454 * fVar262;
            auVar395._16_4_ =
                 fVar185 * fStack_190 +
                 fVar340 * fStack_510 + fVar235 * fStack_750 + fStack_450 * fVar264;
            auVar395._20_4_ =
                 fVar189 * fStack_18c +
                 fVar260 * fStack_50c + fVar261 * fStack_74c + fStack_44c * fVar276;
            auVar395._24_4_ =
                 fVar192 * fStack_188 +
                 fVar304 * fStack_508 + fVar256 * fStack_748 + fStack_448 * fVar279;
            auVar395._28_4_ = fStack_104 + fStack_104 + fStack_444 + fStack_104;
            auVar296._8_4_ = 0x7fffffff;
            auVar296._0_8_ = 0x7fffffff7fffffff;
            auVar296._12_4_ = 0x7fffffff;
            auVar296._16_4_ = 0x7fffffff;
            auVar296._20_4_ = 0x7fffffff;
            auVar296._24_4_ = 0x7fffffff;
            auVar296._28_4_ = 0x7fffffff;
            auVar147._4_4_ = fStack_71c;
            auVar147._0_4_ = local_720;
            auVar147._8_4_ = fStack_718;
            auVar147._12_4_ = fStack_714;
            auVar147._16_4_ = fStack_710;
            auVar147._20_4_ = fStack_70c;
            auVar147._24_4_ = fStack_708;
            auVar147._28_4_ = fStack_704;
            auVar40 = vandps_avx(auVar147,auVar296);
            auVar41 = vandps_avx(auVar207,auVar296);
            auVar41 = vmaxps_avx(auVar40,auVar41);
            auVar40 = vandps_avx(auVar401,auVar296);
            auVar41 = vmaxps_avx(auVar41,auVar40);
            auVar41 = vcmpps_avx(auVar41,local_1e0,1);
            auVar362 = vblendvps_avx(auVar147,auVar210,auVar41);
            auVar177._0_4_ =
                 fVar356 * (float)local_120._0_4_ +
                 fVar281 * (float)local_180._0_4_ +
                 fVar302 * (float)local_640._0_4_ + (float)local_160._0_4_ * fVar236;
            auVar177._4_4_ =
                 fVar367 * (float)local_120._4_4_ +
                 fVar283 * (float)local_180._4_4_ +
                 fVar258 * (float)local_640._4_4_ + (float)local_160._4_4_ * fVar254;
            auVar177._8_4_ =
                 fVar263 * fStack_118 +
                 fVar284 * fStack_178 + fVar259 * fStack_638 + fStack_158 * fVar252;
            auVar177._12_4_ =
                 fVar164 * fStack_114 +
                 fVar303 * fStack_174 + fVar262 * fStack_634 + fStack_154 * fVar286;
            auVar177._16_4_ =
                 fVar185 * fStack_110 +
                 fVar340 * fStack_170 + fVar264 * fStack_630 + fStack_150 * fVar235;
            auVar177._20_4_ =
                 fVar189 * fStack_10c +
                 fVar260 * fStack_16c + fVar276 * fStack_62c + fStack_14c * fVar261;
            auVar177._24_4_ =
                 fVar192 * fStack_108 +
                 fVar304 * fStack_168 + fVar279 * fStack_628 + fStack_148 * fVar256;
            auVar177._28_4_ = auVar40._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar348 = vblendvps_avx(auVar207,auVar175,auVar41);
            auVar40 = vandps_avx(auVar349,auVar296);
            auVar41 = vandps_avx(auVar395,auVar296);
            auVar42 = vmaxps_avx(auVar40,auVar41);
            auVar40 = vandps_avx(auVar177,auVar296);
            auVar40 = vmaxps_avx(auVar42,auVar40);
            local_7e0._0_4_ = auVar150._0_4_;
            local_7e0._4_4_ = auVar150._4_4_;
            uStack_7d8._0_4_ = auVar150._8_4_;
            uStack_7d8._4_4_ = auVar150._12_4_;
            auStack_7d0._0_4_ = auVar150._16_4_;
            auStack_7d0._4_4_ = auVar150._20_4_;
            fStack_7c8 = auVar150._24_4_;
            auVar41 = vcmpps_avx(auVar40,local_1e0,1);
            auVar40 = vblendvps_avx(auVar349,auVar210,auVar41);
            auVar178._0_4_ =
                 (float)local_120._0_4_ * (float)local_7e0._0_4_ +
                 (float)local_180._0_4_ * (float)local_700._0_4_ +
                 (float)local_160._0_4_ * fVar285 + (float)local_640._0_4_ * local_740;
            auVar178._4_4_ =
                 (float)local_120._4_4_ * (float)local_7e0._4_4_ +
                 (float)local_180._4_4_ * (float)local_700._4_4_ +
                 (float)local_160._4_4_ * fVar287 + (float)local_640._4_4_ * fStack_73c;
            auVar178._8_4_ =
                 fStack_118 * (float)uStack_7d8 +
                 fStack_178 * (float)uStack_6f8 + fStack_158 * fVar297 + fStack_638 * fStack_738;
            auVar178._12_4_ =
                 fStack_114 * uStack_7d8._4_4_ +
                 fStack_174 * uStack_6f8._4_4_ + fStack_154 * fVar298 + fStack_634 * fStack_734;
            auVar178._16_4_ =
                 fStack_110 * (float)auStack_7d0._0_4_ +
                 fStack_170 * (float)auStack_6f0._0_4_ +
                 fStack_150 * fVar299 + fStack_630 * fStack_730;
            auVar178._20_4_ =
                 fStack_10c * (float)auStack_7d0._4_4_ +
                 fStack_16c * (float)auStack_6f0._4_4_ +
                 fStack_14c * fVar300 + fStack_62c * fStack_72c;
            auVar178._24_4_ =
                 fStack_108 * fStack_7c8 +
                 fStack_168 * fStack_6e8 + fStack_148 * fVar301 + fStack_628 * fStack_728;
            auVar178._28_4_ = auVar42._28_4_ + fStack_4a4 + auVar168._28_4_ + 0.0;
            auVar41 = vblendvps_avx(auVar395,auVar175,auVar41);
            fVar193 = auVar362._0_4_;
            fVar218 = auVar362._4_4_;
            fVar314 = auVar362._8_4_;
            fVar237 = auVar362._12_4_;
            fVar253 = auVar362._16_4_;
            fVar255 = auVar362._20_4_;
            fVar257 = auVar362._24_4_;
            fVar313 = auVar362._28_4_;
            fVar281 = auVar40._0_4_;
            fVar284 = auVar40._4_4_;
            fVar287 = auVar40._8_4_;
            fVar298 = auVar40._12_4_;
            fVar300 = auVar40._16_4_;
            fVar303 = auVar40._20_4_;
            fVar260 = auVar40._24_4_;
            fVar236 = auVar348._0_4_;
            fVar252 = auVar348._4_4_;
            fVar235 = auVar348._8_4_;
            fVar256 = auVar348._12_4_;
            fVar258 = auVar348._16_4_;
            fVar262 = auVar348._20_4_;
            fVar276 = auVar348._24_4_;
            auVar363._0_4_ = fVar236 * fVar236 + fVar193 * fVar193;
            auVar363._4_4_ = fVar252 * fVar252 + fVar218 * fVar218;
            auVar363._8_4_ = fVar235 * fVar235 + fVar314 * fVar314;
            auVar363._12_4_ = fVar256 * fVar256 + fVar237 * fVar237;
            auVar363._16_4_ = fVar258 * fVar258 + fVar253 * fVar253;
            auVar363._20_4_ = fVar262 * fVar262 + fVar255 * fVar255;
            auVar363._24_4_ = fVar276 * fVar276 + fVar257 * fVar257;
            auVar363._28_4_ = auVar210._28_4_ + auVar175._28_4_;
            auVar210 = vrsqrtps_avx(auVar363);
            fVar254 = auVar210._0_4_;
            fVar286 = auVar210._4_4_;
            auVar89._4_4_ = fVar286 * 1.5;
            auVar89._0_4_ = fVar254 * 1.5;
            fVar261 = auVar210._8_4_;
            auVar89._8_4_ = fVar261 * 1.5;
            fVar302 = auVar210._12_4_;
            auVar89._12_4_ = fVar302 * 1.5;
            fVar259 = auVar210._16_4_;
            auVar89._16_4_ = fVar259 * 1.5;
            fVar264 = auVar210._20_4_;
            auVar89._20_4_ = fVar264 * 1.5;
            fVar279 = auVar210._24_4_;
            auVar89._24_4_ = fVar279 * 1.5;
            auVar89._28_4_ = auVar395._28_4_;
            auVar90._4_4_ = fVar286 * fVar286 * fVar286 * auVar363._4_4_ * 0.5;
            auVar90._0_4_ = fVar254 * fVar254 * fVar254 * auVar363._0_4_ * 0.5;
            auVar90._8_4_ = fVar261 * fVar261 * fVar261 * auVar363._8_4_ * 0.5;
            auVar90._12_4_ = fVar302 * fVar302 * fVar302 * auVar363._12_4_ * 0.5;
            auVar90._16_4_ = fVar259 * fVar259 * fVar259 * auVar363._16_4_ * 0.5;
            auVar90._20_4_ = fVar264 * fVar264 * fVar264 * auVar363._20_4_ * 0.5;
            auVar90._24_4_ = fVar279 * fVar279 * fVar279 * auVar363._24_4_ * 0.5;
            auVar90._28_4_ = auVar363._28_4_;
            auVar175 = vsubps_avx(auVar89,auVar90);
            fVar356 = auVar175._0_4_;
            fVar367 = auVar175._4_4_;
            fVar263 = auVar175._8_4_;
            fVar164 = auVar175._12_4_;
            fVar185 = auVar175._16_4_;
            fVar189 = auVar175._20_4_;
            fVar192 = auVar175._24_4_;
            fVar254 = auVar41._0_4_;
            fVar286 = auVar41._4_4_;
            fVar261 = auVar41._8_4_;
            fVar302 = auVar41._12_4_;
            fVar259 = auVar41._16_4_;
            fVar264 = auVar41._20_4_;
            fVar279 = auVar41._24_4_;
            auVar336._0_4_ = fVar254 * fVar254 + fVar281 * fVar281;
            auVar336._4_4_ = fVar286 * fVar286 + fVar284 * fVar284;
            auVar336._8_4_ = fVar261 * fVar261 + fVar287 * fVar287;
            auVar336._12_4_ = fVar302 * fVar302 + fVar298 * fVar298;
            auVar336._16_4_ = fVar259 * fVar259 + fVar300 * fVar300;
            auVar336._20_4_ = fVar264 * fVar264 + fVar303 * fVar303;
            auVar336._24_4_ = fVar279 * fVar279 + fVar260 * fVar260;
            auVar336._28_4_ = auVar210._28_4_ + auVar40._28_4_;
            auVar210 = vrsqrtps_avx(auVar336);
            fVar283 = auVar210._0_4_;
            fVar285 = auVar210._4_4_;
            auVar91._4_4_ = fVar285 * 1.5;
            auVar91._0_4_ = fVar283 * 1.5;
            fVar297 = auVar210._8_4_;
            auVar91._8_4_ = fVar297 * 1.5;
            fVar299 = auVar210._12_4_;
            auVar91._12_4_ = fVar299 * 1.5;
            fVar301 = auVar210._16_4_;
            auVar91._16_4_ = fVar301 * 1.5;
            fVar340 = auVar210._20_4_;
            auVar91._20_4_ = fVar340 * 1.5;
            fVar304 = auVar210._24_4_;
            auVar91._24_4_ = fVar304 * 1.5;
            auVar91._28_4_ = auVar395._28_4_;
            auVar92._4_4_ = fVar285 * fVar285 * fVar285 * auVar336._4_4_ * 0.5;
            auVar92._0_4_ = fVar283 * fVar283 * fVar283 * auVar336._0_4_ * 0.5;
            auVar92._8_4_ = fVar297 * fVar297 * fVar297 * auVar336._8_4_ * 0.5;
            auVar92._12_4_ = fVar299 * fVar299 * fVar299 * auVar336._12_4_ * 0.5;
            auVar92._16_4_ = fVar301 * fVar301 * fVar301 * auVar336._16_4_ * 0.5;
            auVar92._20_4_ = fVar340 * fVar340 * fVar340 * auVar336._20_4_ * 0.5;
            auVar92._24_4_ = fVar304 * fVar304 * fVar304 * auVar336._24_4_ * 0.5;
            auVar92._28_4_ = auVar336._28_4_;
            auVar175 = vsubps_avx(auVar91,auVar92);
            fVar283 = auVar175._0_4_;
            fVar285 = auVar175._4_4_;
            fVar297 = auVar175._8_4_;
            fVar299 = auVar175._12_4_;
            fVar301 = auVar175._16_4_;
            fVar340 = auVar175._20_4_;
            fVar304 = auVar175._24_4_;
            fVar236 = fVar165 * fVar356 * fVar236;
            fVar252 = fVar186 * fVar367 * fVar252;
            auVar93._4_4_ = fVar252;
            auVar93._0_4_ = fVar236;
            fVar235 = fStack_838 * fVar263 * fVar235;
            auVar93._8_4_ = fVar235;
            fVar256 = fStack_834 * fVar164 * fVar256;
            auVar93._12_4_ = fVar256;
            fVar258 = fStack_830 * fVar185 * fVar258;
            auVar93._16_4_ = fVar258;
            fVar262 = fStack_82c * fVar189 * fVar262;
            auVar93._20_4_ = fVar262;
            fVar276 = fStack_828 * fVar192 * fVar276;
            auVar93._24_4_ = fVar276;
            auVar93._28_4_ = auVar210._28_4_;
            local_7e0._4_4_ = fVar252 + (float)local_660._4_4_;
            local_7e0._0_4_ = fVar236 + (float)local_660._0_4_;
            uStack_7d8._0_4_ = fVar235 + fStack_658;
            uStack_7d8._4_4_ = fVar256 + fStack_654;
            auStack_7d0._0_4_ = fVar258 + register0x00001550;
            auStack_7d0._4_4_ = fVar262 + register0x00001554;
            fStack_7c8 = fVar276 + register0x00001558;
            fStack_7c4 = auVar210._28_4_ + register0x0000155c;
            fVar236 = fVar165 * fVar356 * -fVar193;
            fVar252 = fVar186 * fVar367 * -fVar218;
            auVar94._4_4_ = fVar252;
            auVar94._0_4_ = fVar236;
            fVar235 = fStack_838 * fVar263 * -fVar314;
            auVar94._8_4_ = fVar235;
            fVar256 = fStack_834 * fVar164 * -fVar237;
            auVar94._12_4_ = fVar256;
            fVar258 = fStack_830 * fVar185 * -fVar253;
            auVar94._16_4_ = fVar258;
            fVar262 = fStack_82c * fVar189 * -fVar255;
            auVar94._20_4_ = fVar262;
            fVar276 = fStack_828 * fVar192 * -fVar257;
            auVar94._24_4_ = fVar276;
            auVar94._28_4_ = -fVar313;
            local_700._4_4_ = auVar250._4_4_ + fVar252;
            local_700._0_4_ = auVar250._0_4_ + fVar236;
            uStack_6f8._0_4_ = auVar250._8_4_ + fVar235;
            uStack_6f8._4_4_ = auVar250._12_4_ + fVar256;
            auStack_6f0._0_4_ = auVar250._16_4_ + fVar258;
            auStack_6f0._4_4_ = auVar250._20_4_ + fVar262;
            fStack_6e8 = auVar250._24_4_ + fVar276;
            fStack_6e4 = auVar250._28_4_ + -fVar313;
            fVar236 = fVar356 * 0.0 * fVar165;
            fVar252 = fVar367 * 0.0 * fVar186;
            auVar95._4_4_ = fVar252;
            auVar95._0_4_ = fVar236;
            fVar235 = fVar263 * 0.0 * fStack_838;
            auVar95._8_4_ = fVar235;
            fVar256 = fVar164 * 0.0 * fStack_834;
            auVar95._12_4_ = fVar256;
            fVar258 = fVar185 * 0.0 * fStack_830;
            auVar95._16_4_ = fVar258;
            fVar262 = fVar189 * 0.0 * fStack_82c;
            auVar95._20_4_ = fVar262;
            fVar276 = fVar192 * 0.0 * fStack_828;
            auVar95._24_4_ = fVar276;
            auVar95._28_4_ = fVar313;
            auVar42 = vsubps_avx(_local_660,auVar93);
            auVar423._0_4_ = fVar236 + auVar178._0_4_;
            auVar423._4_4_ = fVar252 + auVar178._4_4_;
            auVar423._8_4_ = fVar235 + auVar178._8_4_;
            auVar423._12_4_ = fVar256 + auVar178._12_4_;
            auVar423._16_4_ = fVar258 + auVar178._16_4_;
            auVar423._20_4_ = fVar262 + auVar178._20_4_;
            auVar423._24_4_ = fVar276 + auVar178._24_4_;
            auVar423._28_4_ = fVar313 + auVar178._28_4_;
            fVar236 = (float)local_4a0._0_4_ * fVar283 * fVar254;
            fVar254 = (float)local_4a0._4_4_ * fVar285 * fVar286;
            auVar96._4_4_ = fVar254;
            auVar96._0_4_ = fVar236;
            fVar252 = fStack_498 * fVar297 * fVar261;
            auVar96._8_4_ = fVar252;
            fVar286 = fStack_494 * fVar299 * fVar302;
            auVar96._12_4_ = fVar286;
            fVar235 = fStack_490 * fVar301 * fVar259;
            auVar96._16_4_ = fVar235;
            fVar261 = fStack_48c * fVar340 * fVar264;
            auVar96._20_4_ = fVar261;
            fVar256 = fStack_488 * fVar304 * fVar279;
            auVar96._24_4_ = fVar256;
            auVar96._28_4_ = fStack_824;
            auVar169 = vsubps_avx(auVar250,auVar94);
            auVar402._0_4_ = auVar176._0_4_ + fVar236;
            auVar402._4_4_ = auVar176._4_4_ + fVar254;
            auVar402._8_4_ = auVar176._8_4_ + fVar252;
            auVar402._12_4_ = auVar176._12_4_ + fVar286;
            auVar402._16_4_ = auVar176._16_4_ + fVar235;
            auVar402._20_4_ = auVar176._20_4_ + fVar261;
            auVar402._24_4_ = auVar176._24_4_ + fVar256;
            auVar402._28_4_ = auVar176._28_4_ + fStack_824;
            fVar236 = fVar283 * -fVar281 * (float)local_4a0._0_4_;
            fVar254 = fVar285 * -fVar284 * (float)local_4a0._4_4_;
            auVar97._4_4_ = fVar254;
            auVar97._0_4_ = fVar236;
            fVar252 = fVar297 * -fVar287 * fStack_498;
            auVar97._8_4_ = fVar252;
            fVar286 = fVar299 * -fVar298 * fStack_494;
            auVar97._12_4_ = fVar286;
            fVar235 = fVar301 * -fVar300 * fStack_490;
            auVar97._16_4_ = fVar235;
            fVar261 = fVar340 * -fVar303 * fStack_48c;
            auVar97._20_4_ = fVar261;
            fVar256 = fVar304 * -fVar260 * fStack_488;
            auVar97._24_4_ = fVar256;
            auVar97._28_4_ = register0x0000155c;
            auVar170 = vsubps_avx(auVar178,auVar95);
            auVar274._0_4_ = auVar295._0_4_ + fVar236;
            auVar274._4_4_ = auVar295._4_4_ + fVar254;
            auVar274._8_4_ = auVar295._8_4_ + fVar252;
            auVar274._12_4_ = auVar295._12_4_ + fVar286;
            auVar274._16_4_ = auVar295._16_4_ + fVar235;
            auVar274._20_4_ = auVar295._20_4_ + fVar261;
            auVar274._24_4_ = auVar295._24_4_ + fVar256;
            auVar274._28_4_ = auVar295._28_4_ + register0x0000155c;
            fVar236 = fVar283 * 0.0 * (float)local_4a0._0_4_;
            fVar254 = fVar285 * 0.0 * (float)local_4a0._4_4_;
            auVar98._4_4_ = fVar254;
            auVar98._0_4_ = fVar236;
            fVar252 = fVar297 * 0.0 * fStack_498;
            auVar98._8_4_ = fVar252;
            fVar286 = fVar299 * 0.0 * fStack_494;
            auVar98._12_4_ = fVar286;
            fVar235 = fVar301 * 0.0 * fStack_490;
            auVar98._16_4_ = fVar235;
            fVar261 = fVar340 * 0.0 * fStack_48c;
            auVar98._20_4_ = fVar261;
            fVar256 = fVar304 * 0.0 * fStack_488;
            auVar98._24_4_ = fVar256;
            auVar98._28_4_ = auVar178._28_4_;
            auVar210 = vsubps_avx(auVar176,auVar96);
            auVar148._4_4_ = fStack_4bc;
            auVar148._0_4_ = local_4c0;
            auVar148._8_4_ = fStack_4b8;
            auVar148._12_4_ = fStack_4b4;
            auVar148._16_4_ = fStack_4b0;
            auVar148._20_4_ = fStack_4ac;
            auVar148._24_4_ = fStack_4a8;
            auVar148._28_4_ = fStack_4a4;
            auVar350._0_4_ = local_4c0 + fVar236;
            auVar350._4_4_ = fStack_4bc + fVar254;
            auVar350._8_4_ = fStack_4b8 + fVar252;
            auVar350._12_4_ = fStack_4b4 + fVar286;
            auVar350._16_4_ = fStack_4b0 + fVar235;
            auVar350._20_4_ = fStack_4ac + fVar261;
            auVar350._24_4_ = fStack_4a8 + fVar256;
            auVar350._28_4_ = fStack_4a4 + auVar178._28_4_;
            auVar40 = vsubps_avx(auVar295,auVar97);
            auVar41 = vsubps_avx(auVar148,auVar98);
            auVar362 = vsubps_avx(auVar274,auVar169);
            auVar348 = vsubps_avx(auVar350,auVar170);
            auVar99._4_4_ = auVar170._4_4_ * auVar362._4_4_;
            auVar99._0_4_ = auVar170._0_4_ * auVar362._0_4_;
            auVar99._8_4_ = auVar170._8_4_ * auVar362._8_4_;
            auVar99._12_4_ = auVar170._12_4_ * auVar362._12_4_;
            auVar99._16_4_ = auVar170._16_4_ * auVar362._16_4_;
            auVar99._20_4_ = auVar170._20_4_ * auVar362._20_4_;
            auVar99._24_4_ = auVar170._24_4_ * auVar362._24_4_;
            auVar99._28_4_ = auVar395._28_4_;
            auVar100._4_4_ = auVar169._4_4_ * auVar348._4_4_;
            auVar100._0_4_ = auVar169._0_4_ * auVar348._0_4_;
            auVar100._8_4_ = auVar169._8_4_ * auVar348._8_4_;
            auVar100._12_4_ = auVar169._12_4_ * auVar348._12_4_;
            auVar100._16_4_ = auVar169._16_4_ * auVar348._16_4_;
            auVar100._20_4_ = auVar169._20_4_ * auVar348._20_4_;
            auVar100._24_4_ = auVar169._24_4_ * auVar348._24_4_;
            auVar100._28_4_ = auVar295._28_4_;
            auVar424 = vsubps_avx(auVar100,auVar99);
            auVar101._4_4_ = auVar42._4_4_ * auVar348._4_4_;
            auVar101._0_4_ = auVar42._0_4_ * auVar348._0_4_;
            auVar101._8_4_ = auVar42._8_4_ * auVar348._8_4_;
            auVar101._12_4_ = auVar42._12_4_ * auVar348._12_4_;
            auVar101._16_4_ = auVar42._16_4_ * auVar348._16_4_;
            auVar101._20_4_ = auVar42._20_4_ * auVar348._20_4_;
            auVar101._24_4_ = auVar42._24_4_ * auVar348._24_4_;
            auVar101._28_4_ = auVar348._28_4_;
            auVar348 = vsubps_avx(auVar402,auVar42);
            auVar102._4_4_ = auVar170._4_4_ * auVar348._4_4_;
            auVar102._0_4_ = auVar170._0_4_ * auVar348._0_4_;
            auVar102._8_4_ = auVar170._8_4_ * auVar348._8_4_;
            auVar102._12_4_ = auVar170._12_4_ * auVar348._12_4_;
            auVar102._16_4_ = auVar170._16_4_ * auVar348._16_4_;
            auVar102._20_4_ = auVar170._20_4_ * auVar348._20_4_;
            auVar102._24_4_ = auVar170._24_4_ * auVar348._24_4_;
            auVar102._28_4_ = auVar175._28_4_;
            auVar44 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = auVar169._4_4_ * auVar348._4_4_;
            auVar103._0_4_ = auVar169._0_4_ * auVar348._0_4_;
            auVar103._8_4_ = auVar169._8_4_ * auVar348._8_4_;
            auVar103._12_4_ = auVar169._12_4_ * auVar348._12_4_;
            auVar103._16_4_ = auVar169._16_4_ * auVar348._16_4_;
            auVar103._20_4_ = auVar169._20_4_ * auVar348._20_4_;
            auVar103._24_4_ = auVar169._24_4_ * auVar348._24_4_;
            auVar103._28_4_ = auVar175._28_4_;
            auVar104._4_4_ = auVar42._4_4_ * auVar362._4_4_;
            auVar104._0_4_ = auVar42._0_4_ * auVar362._0_4_;
            auVar104._8_4_ = auVar42._8_4_ * auVar362._8_4_;
            auVar104._12_4_ = auVar42._12_4_ * auVar362._12_4_;
            auVar104._16_4_ = auVar42._16_4_ * auVar362._16_4_;
            auVar104._20_4_ = auVar42._20_4_ * auVar362._20_4_;
            auVar104._24_4_ = auVar42._24_4_ * auVar362._24_4_;
            auVar104._28_4_ = auVar362._28_4_;
            auVar175 = vsubps_avx(auVar104,auVar103);
            auVar208._0_4_ = auVar424._0_4_ * 0.0 + auVar175._0_4_ + auVar44._0_4_ * 0.0;
            auVar208._4_4_ = auVar424._4_4_ * 0.0 + auVar175._4_4_ + auVar44._4_4_ * 0.0;
            auVar208._8_4_ = auVar424._8_4_ * 0.0 + auVar175._8_4_ + auVar44._8_4_ * 0.0;
            auVar208._12_4_ = auVar424._12_4_ * 0.0 + auVar175._12_4_ + auVar44._12_4_ * 0.0;
            auVar208._16_4_ = auVar424._16_4_ * 0.0 + auVar175._16_4_ + auVar44._16_4_ * 0.0;
            auVar208._20_4_ = auVar424._20_4_ * 0.0 + auVar175._20_4_ + auVar44._20_4_ * 0.0;
            auVar208._24_4_ = auVar424._24_4_ * 0.0 + auVar175._24_4_ + auVar44._24_4_ * 0.0;
            auVar208._28_4_ = auVar424._28_4_ + auVar175._28_4_ + auVar44._28_4_;
            auVar39 = vcmpps_avx(auVar208,ZEXT832(0) << 0x20,2);
            auVar210 = vblendvps_avx(auVar210,_local_7e0,auVar39);
            auVar251 = ZEXT3264(auVar210);
            auVar175 = vblendvps_avx(auVar40,_local_700,auVar39);
            auVar40 = vblendvps_avx(auVar41,auVar423,auVar39);
            auVar41 = vblendvps_avx(auVar42,auVar402,auVar39);
            auVar362 = vblendvps_avx(auVar169,auVar274,auVar39);
            auVar348 = vblendvps_avx(auVar170,auVar350,auVar39);
            auVar42 = vblendvps_avx(auVar402,auVar42,auVar39);
            auVar424 = vblendvps_avx(auVar274,auVar169,auVar39);
            auVar44 = vblendvps_avx(auVar350,auVar170,auVar39);
            local_860 = vandps_avx(auVar168,_local_1c0);
            auVar42 = vsubps_avx(auVar42,auVar210);
            auVar201 = vsubps_avx(auVar424,auVar175);
            auVar44 = vsubps_avx(auVar44,auVar40);
            auVar202 = vsubps_avx(auVar175,auVar362);
            fVar236 = auVar201._0_4_;
            fVar315 = auVar40._0_4_;
            fVar302 = auVar201._4_4_;
            fVar322 = auVar40._4_4_;
            auVar105._4_4_ = fVar322 * fVar302;
            auVar105._0_4_ = fVar315 * fVar236;
            fVar281 = auVar201._8_4_;
            fVar323 = auVar40._8_4_;
            auVar105._8_4_ = fVar323 * fVar281;
            fVar299 = auVar201._12_4_;
            fVar324 = auVar40._12_4_;
            auVar105._12_4_ = fVar324 * fVar299;
            fVar356 = auVar201._16_4_;
            fVar325 = auVar40._16_4_;
            auVar105._16_4_ = fVar325 * fVar356;
            fVar193 = auVar201._20_4_;
            fVar326 = auVar40._20_4_;
            auVar105._20_4_ = fVar326 * fVar193;
            fVar313 = auVar201._24_4_;
            fVar327 = auVar40._24_4_;
            auVar105._24_4_ = fVar327 * fVar313;
            auVar105._28_4_ = auVar424._28_4_;
            fVar254 = auVar175._0_4_;
            fVar341 = auVar44._0_4_;
            fVar258 = auVar175._4_4_;
            fVar352 = auVar44._4_4_;
            auVar106._4_4_ = fVar352 * fVar258;
            auVar106._0_4_ = fVar341 * fVar254;
            fVar283 = auVar175._8_4_;
            fVar266 = auVar44._8_4_;
            auVar106._8_4_ = fVar266 * fVar283;
            fVar300 = auVar175._12_4_;
            fVar278 = auVar44._12_4_;
            auVar106._12_4_ = fVar278 * fVar300;
            fVar367 = auVar175._16_4_;
            fVar280 = auVar44._16_4_;
            auVar106._16_4_ = fVar280 * fVar367;
            fVar218 = auVar175._20_4_;
            fVar282 = auVar44._20_4_;
            auVar106._20_4_ = fVar282 * fVar218;
            fVar306 = auVar175._24_4_;
            fVar162 = auVar44._24_4_;
            uVar12 = auVar169._28_4_;
            auVar106._24_4_ = fVar162 * fVar306;
            auVar106._28_4_ = uVar12;
            auVar424 = vsubps_avx(auVar106,auVar105);
            fVar252 = auVar210._0_4_;
            fVar259 = auVar210._4_4_;
            auVar107._4_4_ = fVar352 * fVar259;
            auVar107._0_4_ = fVar341 * fVar252;
            fVar284 = auVar210._8_4_;
            auVar107._8_4_ = fVar266 * fVar284;
            fVar301 = auVar210._12_4_;
            auVar107._12_4_ = fVar278 * fVar301;
            fVar263 = auVar210._16_4_;
            auVar107._16_4_ = fVar280 * fVar263;
            fVar314 = auVar210._20_4_;
            auVar107._20_4_ = fVar282 * fVar314;
            fVar355 = auVar210._24_4_;
            auVar107._24_4_ = fVar162 * fVar355;
            auVar107._28_4_ = uVar12;
            fVar286 = auVar42._0_4_;
            fVar262 = auVar42._4_4_;
            auVar108._4_4_ = fVar322 * fVar262;
            auVar108._0_4_ = fVar315 * fVar286;
            fVar285 = auVar42._8_4_;
            auVar108._8_4_ = fVar323 * fVar285;
            fVar303 = auVar42._12_4_;
            auVar108._12_4_ = fVar324 * fVar303;
            fVar164 = auVar42._16_4_;
            auVar108._16_4_ = fVar325 * fVar164;
            fVar237 = auVar42._20_4_;
            auVar108._20_4_ = fVar326 * fVar237;
            fVar366 = auVar42._24_4_;
            auVar108._24_4_ = fVar327 * fVar366;
            auVar108._28_4_ = auVar402._28_4_;
            auVar169 = vsubps_avx(auVar108,auVar107);
            auVar109._4_4_ = fVar258 * fVar262;
            auVar109._0_4_ = fVar254 * fVar286;
            auVar109._8_4_ = fVar283 * fVar285;
            auVar109._12_4_ = fVar300 * fVar303;
            auVar109._16_4_ = fVar367 * fVar164;
            auVar109._20_4_ = fVar218 * fVar237;
            auVar109._24_4_ = fVar306 * fVar366;
            auVar109._28_4_ = uVar12;
            auVar110._4_4_ = fVar259 * fVar302;
            auVar110._0_4_ = fVar252 * fVar236;
            auVar110._8_4_ = fVar284 * fVar281;
            auVar110._12_4_ = fVar301 * fVar299;
            auVar110._16_4_ = fVar263 * fVar356;
            auVar110._20_4_ = fVar314 * fVar193;
            auVar110._24_4_ = fVar355 * fVar313;
            auVar110._28_4_ = auVar170._28_4_;
            auVar170 = vsubps_avx(auVar110,auVar109);
            auVar203 = vsubps_avx(auVar40,auVar348);
            fVar261 = auVar170._28_4_ + auVar169._28_4_;
            auVar364._0_4_ = auVar170._0_4_ + auVar169._0_4_ * 0.0 + auVar424._0_4_ * 0.0;
            auVar364._4_4_ = auVar170._4_4_ + auVar169._4_4_ * 0.0 + auVar424._4_4_ * 0.0;
            auVar364._8_4_ = auVar170._8_4_ + auVar169._8_4_ * 0.0 + auVar424._8_4_ * 0.0;
            auVar364._12_4_ = auVar170._12_4_ + auVar169._12_4_ * 0.0 + auVar424._12_4_ * 0.0;
            auVar364._16_4_ = auVar170._16_4_ + auVar169._16_4_ * 0.0 + auVar424._16_4_ * 0.0;
            auVar364._20_4_ = auVar170._20_4_ + auVar169._20_4_ * 0.0 + auVar424._20_4_ * 0.0;
            auVar364._24_4_ = auVar170._24_4_ + auVar169._24_4_ * 0.0 + auVar424._24_4_ * 0.0;
            auVar364._28_4_ = fVar261 + auVar424._28_4_;
            fVar235 = auVar202._0_4_;
            fVar264 = auVar202._4_4_;
            auVar111._4_4_ = auVar348._4_4_ * fVar264;
            auVar111._0_4_ = auVar348._0_4_ * fVar235;
            fVar287 = auVar202._8_4_;
            auVar111._8_4_ = auVar348._8_4_ * fVar287;
            fVar340 = auVar202._12_4_;
            auVar111._12_4_ = auVar348._12_4_ * fVar340;
            fVar185 = auVar202._16_4_;
            auVar111._16_4_ = auVar348._16_4_ * fVar185;
            fVar253 = auVar202._20_4_;
            auVar111._20_4_ = auVar348._20_4_ * fVar253;
            fVar369 = auVar202._24_4_;
            auVar111._24_4_ = auVar348._24_4_ * fVar369;
            auVar111._28_4_ = fVar261;
            fVar261 = auVar203._0_4_;
            fVar276 = auVar203._4_4_;
            auVar112._4_4_ = auVar362._4_4_ * fVar276;
            auVar112._0_4_ = auVar362._0_4_ * fVar261;
            fVar297 = auVar203._8_4_;
            auVar112._8_4_ = auVar362._8_4_ * fVar297;
            fVar260 = auVar203._12_4_;
            auVar112._12_4_ = auVar362._12_4_ * fVar260;
            fVar189 = auVar203._16_4_;
            auVar112._16_4_ = auVar362._16_4_ * fVar189;
            fVar255 = auVar203._20_4_;
            auVar112._20_4_ = auVar362._20_4_ * fVar255;
            fVar371 = auVar203._24_4_;
            auVar112._24_4_ = auVar362._24_4_ * fVar371;
            auVar112._28_4_ = auVar170._28_4_;
            auVar169 = vsubps_avx(auVar112,auVar111);
            auVar170 = vsubps_avx(auVar210,auVar41);
            fVar256 = auVar170._0_4_;
            fVar279 = auVar170._4_4_;
            auVar113._4_4_ = auVar348._4_4_ * fVar279;
            auVar113._0_4_ = auVar348._0_4_ * fVar256;
            fVar298 = auVar170._8_4_;
            auVar113._8_4_ = auVar348._8_4_ * fVar298;
            fVar304 = auVar170._12_4_;
            auVar113._12_4_ = auVar348._12_4_ * fVar304;
            fVar192 = auVar170._16_4_;
            auVar113._16_4_ = auVar348._16_4_ * fVar192;
            fVar257 = auVar170._20_4_;
            auVar113._20_4_ = auVar348._20_4_ * fVar257;
            fVar339 = auVar170._24_4_;
            auVar113._24_4_ = auVar348._24_4_ * fVar339;
            auVar113._28_4_ = auVar348._28_4_;
            auVar114._4_4_ = fVar276 * auVar41._4_4_;
            auVar114._0_4_ = fVar261 * auVar41._0_4_;
            auVar114._8_4_ = fVar297 * auVar41._8_4_;
            auVar114._12_4_ = fVar260 * auVar41._12_4_;
            auVar114._16_4_ = fVar189 * auVar41._16_4_;
            auVar114._20_4_ = fVar255 * auVar41._20_4_;
            auVar114._24_4_ = fVar371 * auVar41._24_4_;
            auVar114._28_4_ = auVar424._28_4_;
            auVar348 = vsubps_avx(auVar113,auVar114);
            auVar425 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar115._4_4_ = auVar362._4_4_ * fVar279;
            auVar115._0_4_ = auVar362._0_4_ * fVar256;
            auVar115._8_4_ = auVar362._8_4_ * fVar298;
            auVar115._12_4_ = auVar362._12_4_ * fVar304;
            auVar115._16_4_ = auVar362._16_4_ * fVar192;
            auVar115._20_4_ = auVar362._20_4_ * fVar257;
            auVar115._24_4_ = auVar362._24_4_ * fVar339;
            auVar115._28_4_ = auVar362._28_4_;
            auVar116._4_4_ = fVar264 * auVar41._4_4_;
            auVar116._0_4_ = fVar235 * auVar41._0_4_;
            auVar116._8_4_ = fVar287 * auVar41._8_4_;
            auVar116._12_4_ = fVar340 * auVar41._12_4_;
            auVar116._16_4_ = fVar185 * auVar41._16_4_;
            auVar116._20_4_ = fVar253 * auVar41._20_4_;
            auVar116._24_4_ = fVar369 * auVar41._24_4_;
            auVar116._28_4_ = auVar41._28_4_;
            auVar41 = vsubps_avx(auVar116,auVar115);
            auVar424 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar179._0_4_ = auVar169._0_4_ * 0.0 + auVar41._0_4_ + auVar348._0_4_ * 0.0;
            auVar179._4_4_ = auVar169._4_4_ * 0.0 + auVar41._4_4_ + auVar348._4_4_ * 0.0;
            auVar179._8_4_ = auVar169._8_4_ * 0.0 + auVar41._8_4_ + auVar348._8_4_ * 0.0;
            auVar179._12_4_ = auVar169._12_4_ * 0.0 + auVar41._12_4_ + auVar348._12_4_ * 0.0;
            auVar179._16_4_ = auVar169._16_4_ * 0.0 + auVar41._16_4_ + auVar348._16_4_ * 0.0;
            auVar179._20_4_ = auVar169._20_4_ * 0.0 + auVar41._20_4_ + auVar348._20_4_ * 0.0;
            auVar179._24_4_ = auVar169._24_4_ * 0.0 + auVar41._24_4_ + auVar348._24_4_ * 0.0;
            auVar179._28_4_ = auVar348._28_4_ + auVar41._28_4_ + auVar348._28_4_;
            auVar182 = ZEXT3264(auVar179);
            auVar41 = vmaxps_avx(auVar364,auVar179);
            auVar41 = vcmpps_avx(auVar41,auVar424,2);
            auVar362 = local_860 & auVar41;
            if ((((((((auVar362 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar362 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar362 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar362 >> 0x7f,0) == '\0') &&
                  (auVar362 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar362 >> 0xbf,0) == '\0') &&
                (auVar362 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar362[0x1f]) {
LAB_0122c121:
              auVar214 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              auVar351 = ZEXT3264(local_560);
              auVar380._4_4_ = fVar186;
              auVar380._0_4_ = fVar165;
              auVar380._8_4_ = fStack_838;
              auVar380._12_4_ = fStack_834;
              auVar380._16_4_ = fStack_830;
              auVar380._20_4_ = fStack_82c;
              auVar380._24_4_ = fStack_828;
              auVar380._28_4_ = fStack_824;
            }
            else {
              auVar362 = vandps_avx(auVar41,local_860);
              auVar117._4_4_ = fVar276 * fVar302;
              auVar117._0_4_ = fVar261 * fVar236;
              auVar117._8_4_ = fVar297 * fVar281;
              auVar117._12_4_ = fVar260 * fVar299;
              auVar117._16_4_ = fVar189 * fVar356;
              auVar117._20_4_ = fVar255 * fVar193;
              auVar117._24_4_ = fVar371 * fVar313;
              auVar117._28_4_ = local_860._28_4_;
              auVar118._4_4_ = fVar264 * fVar352;
              auVar118._0_4_ = fVar235 * fVar341;
              auVar118._8_4_ = fVar287 * fVar266;
              auVar118._12_4_ = fVar340 * fVar278;
              auVar118._16_4_ = fVar185 * fVar280;
              auVar118._20_4_ = fVar253 * fVar282;
              auVar118._24_4_ = fVar369 * fVar162;
              auVar118._28_4_ = auVar41._28_4_;
              auVar348 = vsubps_avx(auVar118,auVar117);
              auVar119._4_4_ = fVar279 * fVar352;
              auVar119._0_4_ = fVar256 * fVar341;
              auVar119._8_4_ = fVar298 * fVar266;
              auVar119._12_4_ = fVar304 * fVar278;
              auVar119._16_4_ = fVar192 * fVar280;
              auVar119._20_4_ = fVar257 * fVar282;
              auVar119._24_4_ = fVar339 * fVar162;
              auVar119._28_4_ = auVar44._28_4_;
              auVar120._4_4_ = fVar276 * fVar262;
              auVar120._0_4_ = fVar261 * fVar286;
              auVar120._8_4_ = fVar297 * fVar285;
              auVar120._12_4_ = fVar260 * fVar303;
              auVar120._16_4_ = fVar189 * fVar164;
              auVar120._20_4_ = fVar255 * fVar237;
              auVar120._24_4_ = fVar371 * fVar366;
              auVar120._28_4_ = auVar203._28_4_;
              auVar44 = vsubps_avx(auVar120,auVar119);
              auVar121._4_4_ = fVar264 * fVar262;
              auVar121._0_4_ = fVar235 * fVar286;
              auVar121._8_4_ = fVar287 * fVar285;
              auVar121._12_4_ = fVar340 * fVar303;
              auVar121._16_4_ = fVar185 * fVar164;
              auVar121._20_4_ = fVar253 * fVar237;
              auVar121._24_4_ = fVar369 * fVar366;
              auVar121._28_4_ = auVar42._28_4_;
              auVar122._4_4_ = fVar279 * fVar302;
              auVar122._0_4_ = fVar256 * fVar236;
              auVar122._8_4_ = fVar298 * fVar281;
              auVar122._12_4_ = fVar304 * fVar299;
              auVar122._16_4_ = fVar192 * fVar356;
              auVar122._20_4_ = fVar257 * fVar193;
              auVar122._24_4_ = fVar339 * fVar313;
              auVar122._28_4_ = auVar201._28_4_;
              auVar169 = vsubps_avx(auVar122,auVar121);
              auVar209._0_4_ = auVar348._0_4_ * 0.0 + auVar169._0_4_ + auVar44._0_4_ * 0.0;
              auVar209._4_4_ = auVar348._4_4_ * 0.0 + auVar169._4_4_ + auVar44._4_4_ * 0.0;
              auVar209._8_4_ = auVar348._8_4_ * 0.0 + auVar169._8_4_ + auVar44._8_4_ * 0.0;
              auVar209._12_4_ = auVar348._12_4_ * 0.0 + auVar169._12_4_ + auVar44._12_4_ * 0.0;
              auVar209._16_4_ = auVar348._16_4_ * 0.0 + auVar169._16_4_ + auVar44._16_4_ * 0.0;
              auVar209._20_4_ = auVar348._20_4_ * 0.0 + auVar169._20_4_ + auVar44._20_4_ * 0.0;
              auVar209._24_4_ = auVar348._24_4_ * 0.0 + auVar169._24_4_ + auVar44._24_4_ * 0.0;
              auVar209._28_4_ = auVar201._28_4_ + auVar169._28_4_ + auVar42._28_4_;
              auVar41 = vrcpps_avx(auVar209);
              fVar236 = auVar41._0_4_;
              fVar286 = auVar41._4_4_;
              auVar123._4_4_ = auVar209._4_4_ * fVar286;
              auVar123._0_4_ = auVar209._0_4_ * fVar236;
              fVar235 = auVar41._8_4_;
              auVar123._8_4_ = auVar209._8_4_ * fVar235;
              fVar261 = auVar41._12_4_;
              auVar123._12_4_ = auVar209._12_4_ * fVar261;
              fVar256 = auVar41._16_4_;
              auVar123._16_4_ = auVar209._16_4_ * fVar256;
              fVar302 = auVar41._20_4_;
              auVar123._20_4_ = auVar209._20_4_ * fVar302;
              fVar262 = auVar41._24_4_;
              auVar123._24_4_ = auVar209._24_4_ * fVar262;
              auVar123._28_4_ = auVar203._28_4_;
              auVar396._8_4_ = 0x3f800000;
              auVar396._0_8_ = &DAT_3f8000003f800000;
              auVar396._12_4_ = 0x3f800000;
              auVar396._16_4_ = 0x3f800000;
              auVar396._20_4_ = 0x3f800000;
              auVar396._24_4_ = 0x3f800000;
              auVar396._28_4_ = 0x3f800000;
              auVar41 = vsubps_avx(auVar396,auVar123);
              fVar236 = auVar41._0_4_ * fVar236 + fVar236;
              fVar286 = auVar41._4_4_ * fVar286 + fVar286;
              fVar235 = auVar41._8_4_ * fVar235 + fVar235;
              fVar261 = auVar41._12_4_ * fVar261 + fVar261;
              fVar256 = auVar41._16_4_ * fVar256 + fVar256;
              fVar302 = auVar41._20_4_ * fVar302 + fVar302;
              fVar262 = auVar41._24_4_ * fVar262 + fVar262;
              auVar124._4_4_ =
                   (fVar259 * auVar348._4_4_ + auVar44._4_4_ * fVar258 + auVar169._4_4_ * fVar322) *
                   fVar286;
              auVar124._0_4_ =
                   (fVar252 * auVar348._0_4_ + auVar44._0_4_ * fVar254 + auVar169._0_4_ * fVar315) *
                   fVar236;
              auVar124._8_4_ =
                   (fVar284 * auVar348._8_4_ + auVar44._8_4_ * fVar283 + auVar169._8_4_ * fVar323) *
                   fVar235;
              auVar124._12_4_ =
                   (fVar301 * auVar348._12_4_ + auVar44._12_4_ * fVar300 + auVar169._12_4_ * fVar324
                   ) * fVar261;
              auVar124._16_4_ =
                   (fVar263 * auVar348._16_4_ + auVar44._16_4_ * fVar367 + auVar169._16_4_ * fVar325
                   ) * fVar256;
              auVar124._20_4_ =
                   (fVar314 * auVar348._20_4_ + auVar44._20_4_ * fVar218 + auVar169._20_4_ * fVar326
                   ) * fVar302;
              auVar124._24_4_ =
                   (fVar355 * auVar348._24_4_ + auVar44._24_4_ * fVar306 + auVar169._24_4_ * fVar327
                   ) * fVar262;
              auVar124._28_4_ = auVar210._28_4_ + auVar175._28_4_ + auVar40._28_4_;
              auVar251 = ZEXT3264(auVar124);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar275._4_4_ = uVar12;
              auVar275._0_4_ = uVar12;
              auVar275._8_4_ = uVar12;
              auVar275._12_4_ = uVar12;
              auVar275._16_4_ = uVar12;
              auVar275._20_4_ = uVar12;
              auVar275._24_4_ = uVar12;
              auVar275._28_4_ = uVar12;
              auVar210 = vcmpps_avx(_local_200,auVar124,2);
              auVar175 = vcmpps_avx(auVar124,auVar275,2);
              auVar210 = vandps_avx(auVar210,auVar175);
              auVar175 = auVar362 & auVar210;
              if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar175 >> 0x7f,0) == '\0') &&
                    (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar175 >> 0xbf,0) == '\0') &&
                  (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar175[0x1f]) goto LAB_0122c121;
              auVar210 = vandps_avx(auVar362,auVar210);
              auVar175 = vcmpps_avx(auVar424,auVar209,4);
              auVar40 = auVar210 & auVar175;
              auVar214 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              auVar351 = ZEXT3264(local_560);
              auVar380._4_4_ = fVar186;
              auVar380._0_4_ = fVar165;
              auVar380._8_4_ = fStack_838;
              auVar380._12_4_ = fStack_834;
              auVar380._16_4_ = fStack_830;
              auVar380._20_4_ = fStack_82c;
              auVar380._24_4_ = fStack_828;
              auVar380._28_4_ = fStack_824;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar210 = vandps_avx(auVar175,auVar210);
                auVar214 = ZEXT3264(auVar210);
                auVar125._4_4_ = auVar364._4_4_ * fVar286;
                auVar125._0_4_ = auVar364._0_4_ * fVar236;
                auVar125._8_4_ = auVar364._8_4_ * fVar235;
                auVar125._12_4_ = auVar364._12_4_ * fVar261;
                auVar125._16_4_ = auVar364._16_4_ * fVar256;
                auVar125._20_4_ = auVar364._20_4_ * fVar302;
                auVar125._24_4_ = auVar364._24_4_ * fVar262;
                auVar125._28_4_ = local_580._28_4_;
                auVar126._4_4_ = auVar179._4_4_ * fVar286;
                auVar126._0_4_ = auVar179._0_4_ * fVar236;
                auVar126._8_4_ = auVar179._8_4_ * fVar235;
                auVar126._12_4_ = auVar179._12_4_ * fVar261;
                auVar126._16_4_ = auVar179._16_4_ * fVar256;
                auVar126._20_4_ = auVar179._20_4_ * fVar302;
                auVar126._24_4_ = auVar179._24_4_ * fVar262;
                auVar126._28_4_ = auVar179._28_4_;
                auVar182 = ZEXT3264(auVar126);
                auVar312._8_4_ = 0x3f800000;
                auVar312._0_8_ = &DAT_3f8000003f800000;
                auVar312._12_4_ = 0x3f800000;
                auVar312._16_4_ = 0x3f800000;
                auVar312._20_4_ = 0x3f800000;
                auVar312._24_4_ = 0x3f800000;
                auVar312._28_4_ = 0x3f800000;
                auVar210 = vsubps_avx(auVar312,auVar125);
                local_260 = vblendvps_avx(auVar210,auVar125,auVar39);
                auVar210 = vsubps_avx(auVar312,auVar126);
                _local_580 = vblendvps_avx(auVar210,auVar126,auVar39);
                auVar351 = ZEXT3264(auVar124);
              }
            }
            auVar210 = auVar214._0_32_;
            local_560 = auVar351._0_32_;
            if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar210 >> 0x7f,0) != '\0') ||
                  (auVar214 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar210 >> 0xbf,0) != '\0') ||
                (auVar214 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar214[0x1f] < '\0') {
              auVar175 = vsubps_avx(_local_4a0,auVar380);
              fVar254 = auVar380._0_4_ + local_260._0_4_ * auVar175._0_4_;
              fVar252 = auVar380._4_4_ + local_260._4_4_ * auVar175._4_4_;
              fVar286 = auVar380._8_4_ + local_260._8_4_ * auVar175._8_4_;
              fVar235 = auVar380._12_4_ + local_260._12_4_ * auVar175._12_4_;
              fVar261 = auVar380._16_4_ + local_260._16_4_ * auVar175._16_4_;
              fVar256 = auVar380._20_4_ + local_260._20_4_ * auVar175._20_4_;
              fVar302 = auVar380._24_4_ + local_260._24_4_ * auVar175._24_4_;
              fVar258 = auVar380._28_4_ + auVar175._28_4_;
              fVar236 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
              auVar127._4_4_ = (fVar252 + fVar252) * fVar236;
              auVar127._0_4_ = (fVar254 + fVar254) * fVar236;
              auVar127._8_4_ = (fVar286 + fVar286) * fVar236;
              auVar127._12_4_ = (fVar235 + fVar235) * fVar236;
              auVar127._16_4_ = (fVar261 + fVar261) * fVar236;
              auVar127._20_4_ = (fVar256 + fVar256) * fVar236;
              auVar127._24_4_ = (fVar302 + fVar302) * fVar236;
              auVar127._28_4_ = fVar258 + fVar258;
              auVar175 = vcmpps_avx(local_560,auVar127,6);
              auVar182 = ZEXT3264(auVar175);
              auVar40 = auVar210 & auVar175;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                local_2e0 = vandps_avx(auVar175,auVar210);
                auVar182 = ZEXT3264(local_2e0);
                local_380 = local_580._0_4_ + local_580._0_4_ + -1.0;
                fStack_37c = local_580._4_4_ + local_580._4_4_ + -1.0;
                fStack_378 = local_580._8_4_ + local_580._8_4_ + -1.0;
                fStack_374 = local_580._12_4_ + local_580._12_4_ + -1.0;
                fStack_370 = local_580._16_4_ + local_580._16_4_ + -1.0;
                fStack_36c = local_580._20_4_ + local_580._20_4_ + -1.0;
                fStack_368 = local_580._24_4_ + local_580._24_4_ + -1.0;
                fStack_364 = local_580._28_4_ + local_580._28_4_ + -1.0;
                local_3a0 = local_260;
                local_360 = local_560;
                local_33c = uVar34;
                local_330 = auVar268._0_8_;
                uStack_328 = uStack_888;
                local_320 = local_670;
                uStack_318 = uStack_668;
                local_310 = local_680;
                uStack_308 = uStack_678;
                auVar214 = ZEXT1664(_local_690);
                local_300 = _local_690;
                pGVar160 = (context->scene->geometries).items[uVar155].ptr;
                local_580._4_4_ = fStack_37c;
                local_580._0_4_ = local_380;
                fStack_578 = fStack_378;
                fStack_574 = fStack_374;
                fStack_570 = fStack_370;
                fStack_56c = fStack_36c;
                fStack_568 = fStack_368;
                fStack_564 = fStack_364;
                if ((pGVar160->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar223._0_4_ = (float)(int)local_340;
                  auVar223._4_8_ = SUB128(ZEXT812(0),4);
                  auVar223._12_4_ = 0;
                  auVar289 = vshufps_avx(auVar223,auVar223,0);
                  local_2c0[0] = (auVar289._0_4_ + local_260._0_4_ + 0.0) * (float)local_220._0_4_;
                  local_2c0[1] = (auVar289._4_4_ + local_260._4_4_ + 1.0) * (float)local_220._4_4_;
                  local_2c0[2] = (auVar289._8_4_ + local_260._8_4_ + 2.0) * fStack_218;
                  local_2c0[3] = (auVar289._12_4_ + local_260._12_4_ + 3.0) * fStack_214;
                  fStack_2b0 = (auVar289._0_4_ + local_260._16_4_ + 4.0) * fStack_210;
                  fStack_2ac = (auVar289._4_4_ + local_260._20_4_ + 5.0) * fStack_20c;
                  fStack_2a8 = (auVar289._8_4_ + local_260._24_4_ + 6.0) * fStack_208;
                  fStack_2a4 = auVar289._12_4_ + local_260._28_4_ + 7.0;
                  local_2a0 = CONCAT44(fStack_37c,local_380);
                  uStack_298 = CONCAT44(fStack_374,fStack_378);
                  uStack_290 = CONCAT44(fStack_36c,fStack_370);
                  uStack_288 = CONCAT44(fStack_364,fStack_368);
                  local_280 = local_560;
                  auVar211._8_4_ = 0x7f800000;
                  auVar211._0_8_ = 0x7f8000007f800000;
                  auVar211._12_4_ = 0x7f800000;
                  auVar211._16_4_ = 0x7f800000;
                  auVar211._20_4_ = 0x7f800000;
                  auVar211._24_4_ = 0x7f800000;
                  auVar211._28_4_ = 0x7f800000;
                  auVar210 = vblendvps_avx(auVar211,local_560,local_2e0);
                  auVar175 = vshufps_avx(auVar210,auVar210,0xb1);
                  auVar175 = vminps_avx(auVar210,auVar175);
                  auVar40 = vshufpd_avx(auVar175,auVar175,5);
                  auVar175 = vminps_avx(auVar175,auVar40);
                  auVar40 = vperm2f128_avx(auVar175,auVar175,1);
                  auVar175 = vminps_avx(auVar175,auVar40);
                  auVar175 = vcmpps_avx(auVar210,auVar175,0);
                  auVar40 = local_2e0 & auVar175;
                  auVar210 = local_2e0;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar210 = vandps_avx(auVar175,local_2e0);
                  }
                  uVar153 = vmovmskps_avx(auVar210);
                  uVar38 = 0;
                  if (uVar153 != 0) {
                    for (; (uVar153 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  uVar154 = (ulong)uVar38;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar160->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar236 = local_2c0[uVar154];
                    auVar182 = ZEXT464((uint)fVar236);
                    uVar38 = *(uint *)((long)&local_2a0 + uVar154 * 4);
                    auVar214 = ZEXT464(uVar38);
                    fVar252 = 1.0 - fVar236;
                    fVar254 = fVar236 * fVar252 * 4.0;
                    auVar289 = ZEXT416((uint)(fVar236 * fVar236 * 0.5));
                    auVar289 = vshufps_avx(auVar289,auVar289,0);
                    auVar224 = ZEXT416((uint)((fVar252 * fVar252 + fVar254) * 0.5));
                    auVar224 = vshufps_avx(auVar224,auVar224,0);
                    auVar270 = ZEXT416((uint)((-fVar236 * fVar236 - fVar254) * 0.5));
                    auVar270 = vshufps_avx(auVar270,auVar270,0);
                    auVar240 = ZEXT416((uint)(fVar252 * -fVar252 * 0.5));
                    auVar240 = vshufps_avx(auVar240,auVar240,0);
                    auVar225._0_4_ =
                         auVar240._0_4_ * fVar265 +
                         auVar270._0_4_ * (float)local_670._0_4_ +
                         auVar289._0_4_ * (float)local_690._0_4_ +
                         auVar224._0_4_ * (float)local_680._0_4_;
                    auVar225._4_4_ =
                         auVar240._4_4_ * fVar277 +
                         auVar270._4_4_ * (float)local_670._4_4_ +
                         auVar289._4_4_ * (float)local_690._4_4_ +
                         auVar224._4_4_ * (float)local_680._4_4_;
                    auVar225._8_4_ =
                         auVar240._8_4_ * auVar268._8_4_ +
                         auVar270._8_4_ * (float)uStack_668 +
                         auVar289._8_4_ * (float)uStack_688 + auVar224._8_4_ * (float)uStack_678;
                    auVar225._12_4_ =
                         auVar240._12_4_ * auVar268._12_4_ +
                         auVar270._12_4_ * uStack_668._4_4_ +
                         auVar289._12_4_ * uStack_688._4_4_ + auVar224._12_4_ * uStack_678._4_4_;
                    auVar251 = ZEXT464(*(uint *)(local_280 + uVar154 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_280 + uVar154 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar225._0_4_;
                    uVar12 = vextractps_avx(auVar225,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                    uVar12 = vextractps_avx(auVar225,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                    *(float *)(ray + k * 4 + 0xf0) = fVar236;
                    *(uint *)(ray + k * 4 + 0x100) = uVar38;
                    *(uint *)(ray + k * 4 + 0x110) = uVar33;
                    *(uint *)(ray + k * 4 + 0x120) = uVar155;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    _local_660 = _local_670;
                    auStack_770 = auVar295._16_16_;
                    _local_780 = _local_680;
                    _local_7e0 = _local_690;
                    auStack_6d0 = auVar168._16_16_;
                    local_6e0 = *local_7a8;
                    _auStack_798 = auVar176._8_24_;
                    local_7a0 = pGVar160;
                    local_620 = local_2e0;
                    do {
                      local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_400 = local_2c0[uVar154];
                      local_3f0._4_4_ = *(undefined4 *)((long)&local_2a0 + uVar154 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar154 * 4)
                      ;
                      fVar254 = 1.0 - local_400;
                      fVar236 = local_400 * fVar254 * 4.0;
                      auVar289 = ZEXT416((uint)(local_400 * local_400 * 0.5));
                      auVar289 = vshufps_avx(auVar289,auVar289,0);
                      auVar224 = ZEXT416((uint)((fVar254 * fVar254 + fVar236) * 0.5));
                      auVar224 = vshufps_avx(auVar224,auVar224,0);
                      auVar270 = ZEXT416((uint)((-local_400 * local_400 - fVar236) * 0.5));
                      auVar270 = vshufps_avx(auVar270,auVar270,0);
                      local_810.context = context->user;
                      auVar240 = ZEXT416((uint)(fVar254 * -fVar254 * 0.5));
                      auVar240 = vshufps_avx(auVar240,auVar240,0);
                      auVar226._0_4_ =
                           auVar240._0_4_ * fVar265 +
                           auVar270._0_4_ * (float)local_660._0_4_ +
                           auVar289._0_4_ * (float)local_7e0._0_4_ +
                           auVar224._0_4_ * (float)local_780._0_4_;
                      auVar226._4_4_ =
                           auVar240._4_4_ * fVar277 +
                           auVar270._4_4_ * (float)local_660._4_4_ +
                           auVar289._4_4_ * (float)local_7e0._4_4_ +
                           auVar224._4_4_ * (float)local_780._4_4_;
                      auVar226._8_4_ =
                           auVar240._8_4_ * auVar268._8_4_ +
                           auVar270._8_4_ * fStack_658 +
                           auVar289._8_4_ * (float)uStack_7d8 + auVar224._8_4_ * fStack_778;
                      auVar226._12_4_ =
                           auVar240._12_4_ * auVar268._12_4_ +
                           auVar270._12_4_ * fStack_654 +
                           auVar289._12_4_ * uStack_7d8._4_4_ + auVar224._12_4_ * fStack_774;
                      auVar289 = vshufps_avx(auVar226,auVar226,0);
                      local_430[0] = (RTCHitN)auVar289[0];
                      local_430[1] = (RTCHitN)auVar289[1];
                      local_430[2] = (RTCHitN)auVar289[2];
                      local_430[3] = (RTCHitN)auVar289[3];
                      local_430[4] = (RTCHitN)auVar289[4];
                      local_430[5] = (RTCHitN)auVar289[5];
                      local_430[6] = (RTCHitN)auVar289[6];
                      local_430[7] = (RTCHitN)auVar289[7];
                      local_430[8] = (RTCHitN)auVar289[8];
                      local_430[9] = (RTCHitN)auVar289[9];
                      local_430[10] = (RTCHitN)auVar289[10];
                      local_430[0xb] = (RTCHitN)auVar289[0xb];
                      local_430[0xc] = (RTCHitN)auVar289[0xc];
                      local_430[0xd] = (RTCHitN)auVar289[0xd];
                      local_430[0xe] = (RTCHitN)auVar289[0xe];
                      local_430[0xf] = (RTCHitN)auVar289[0xf];
                      local_420 = vshufps_avx(auVar226,auVar226,0x55);
                      auVar251 = ZEXT1664(local_420);
                      local_410 = vshufps_avx(auVar226,auVar226,0xaa);
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      local_3f0._0_4_ = local_3f0._4_4_;
                      local_3f0._8_4_ = local_3f0._4_4_;
                      local_3f0._12_4_ = local_3f0._4_4_;
                      local_3e0 = local_140._0_8_;
                      uStack_3d8 = local_140._8_8_;
                      local_3d0 = local_130._0_8_;
                      uStack_3c8 = local_130._8_8_;
                      vcmpps_avx(auVar425._0_32_,auVar425._0_32_,0xf);
                      uStack_3bc = (local_810.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_810.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_880 = local_6e0._0_8_;
                      uStack_878 = local_6e0._8_8_;
                      local_810.valid = (int *)&local_880;
                      local_810.geometryUserPtr = pGVar160->userPtr;
                      local_810.hit = local_430;
                      local_810.N = 4;
                      local_840 = (uint)uVar154;
                      uStack_83c = (undefined4)(uVar154 >> 0x20);
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar160->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar251 = ZEXT1664(local_420);
                        (*pGVar160->intersectionFilterN)(&local_810);
                        uVar154 = CONCAT44(uStack_83c,local_840);
                        auVar351 = ZEXT3264(local_560);
                        auVar425 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar160 = local_7a0;
                      }
                      auVar289 = auVar251._0_16_;
                      auVar136._8_8_ = uStack_878;
                      auVar136._0_8_ = local_880;
                      if (auVar136 == (undefined1  [16])0x0) {
                        auVar289 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar289 = auVar289 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var37 = context->args->filter;
                        if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar160->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var37)(&local_810);
                          uVar154 = CONCAT44(uStack_83c,local_840);
                          auVar351 = ZEXT3264(local_560);
                          auVar425 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar160 = local_7a0;
                        }
                        auVar137._8_8_ = uStack_878;
                        auVar137._0_8_ = local_880;
                        auVar224 = vpcmpeqd_avx(auVar137,_DAT_01feba10);
                        auVar270 = vpcmpeqd_avx(auVar289,auVar289);
                        auVar251 = ZEXT1664(auVar270);
                        auVar289 = auVar224 ^ auVar270;
                        if (auVar137 != (undefined1  [16])0x0) {
                          auVar224 = auVar224 ^ auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])local_810.hit);
                          *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x10));
                          *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x20));
                          *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x30));
                          *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x40));
                          *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x50));
                          *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x60));
                          *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar270;
                          auVar270 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x70));
                          *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar270;
                          auVar224 = vmaskmovps_avx(auVar224,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x80));
                          *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar224;
                        }
                      }
                      auVar198._8_8_ = 0x100000001;
                      auVar198._0_8_ = 0x100000001;
                      if ((auVar198 & auVar289) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                      }
                      *(undefined4 *)(local_620 + uVar154 * 4) = 0;
                      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar180._4_4_ = uVar12;
                      auVar180._0_4_ = uVar12;
                      auVar180._8_4_ = uVar12;
                      auVar180._12_4_ = uVar12;
                      auVar180._16_4_ = uVar12;
                      auVar180._20_4_ = uVar12;
                      auVar180._24_4_ = uVar12;
                      auVar180._28_4_ = uVar12;
                      auVar210 = vcmpps_avx(auVar351._0_32_,auVar180,2);
                      auVar168 = vandps_avx(auVar210,local_620);
                      auVar182 = ZEXT3264(auVar168);
                      local_620 = local_620 & auVar210;
                      bVar134 = (local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar135 = (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar133 = (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar132 = SUB321(local_620 >> 0x7f,0) != '\0';
                      bVar131 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar130 = SUB321(local_620 >> 0xbf,0) != '\0';
                      bVar129 = (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar128 = local_620[0x1f] < '\0';
                      if (((((((bVar134 || bVar135) || bVar133) || bVar132) || bVar131) || bVar130)
                          || bVar129) || bVar128) {
                        auVar212._8_4_ = 0x7f800000;
                        auVar212._0_8_ = 0x7f8000007f800000;
                        auVar212._12_4_ = 0x7f800000;
                        auVar212._16_4_ = 0x7f800000;
                        auVar212._20_4_ = 0x7f800000;
                        auVar212._24_4_ = 0x7f800000;
                        auVar212._28_4_ = 0x7f800000;
                        auVar210 = vblendvps_avx(auVar212,auVar351._0_32_,auVar168);
                        auVar175 = vshufps_avx(auVar210,auVar210,0xb1);
                        auVar175 = vminps_avx(auVar210,auVar175);
                        auVar40 = vshufpd_avx(auVar175,auVar175,5);
                        auVar175 = vminps_avx(auVar175,auVar40);
                        auVar40 = vperm2f128_avx(auVar175,auVar175,1);
                        auVar251 = ZEXT3264(auVar40);
                        auVar175 = vminps_avx(auVar175,auVar40);
                        auVar210 = vcmpps_avx(auVar210,auVar175,0);
                        auVar175 = auVar168 & auVar210;
                        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar175 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar175 >> 0x7f,0) != '\0')
                              || (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar175 >> 0xbf,0) != '\0') ||
                            (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar175[0x1f] < '\0') {
                          auVar175 = vandps_avx(auVar210,auVar168);
                          auVar182 = ZEXT3264(auVar175);
                        }
                        uVar153 = vmovmskps_avx(auVar182._0_32_);
                        uVar38 = 0;
                        if (uVar153 != 0) {
                          for (; (uVar153 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                          }
                        }
                        uVar154 = (ulong)uVar38;
                      }
                      auVar214 = ZEXT3264(auVar210);
                      local_620 = auVar168;
                    } while (((((((bVar134 || bVar135) || bVar133) || bVar132) || bVar131) ||
                              bVar130) || bVar129) || bVar128);
                  }
                }
              }
            }
          }
          lVar161 = lVar161 + 8;
          fVar266 = (float)local_6c0._0_4_;
          fVar278 = (float)local_6c0._4_4_;
          fVar280 = fStack_6b8;
          fVar282 = fStack_6b4;
          fVar254 = fStack_6b0;
          fVar252 = fStack_6ac;
          fVar235 = fStack_6a8;
        } while ((int)lVar161 < (int)uVar34);
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar174._4_4_ = uVar12;
      auVar174._0_4_ = uVar12;
      auVar174._8_4_ = uVar12;
      auVar174._12_4_ = uVar12;
      auVar174._16_4_ = uVar12;
      auVar174._20_4_ = uVar12;
      auVar174._24_4_ = uVar12;
      auVar174._28_4_ = uVar12;
      auVar168 = vcmpps_avx(local_80,auVar174,2);
      uVar155 = vmovmskps_avx(auVar168);
      uVar152 = uVar152 & uVar152 + 0xff & uVar155;
    } while (uVar152 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }